

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O1

int __thiscall ncnn::Reduction::forward(Reduction *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  ushort uVar6;
  int *piVar7;
  byte bVar8;
  int i_12;
  int iVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  Mat *pMVar13;
  byte bVar14;
  undefined4 uVar15;
  Mat *pMVar16;
  byte bVar17;
  bool *pbVar18;
  long lVar19;
  Mat *pMVar20;
  uint uVar21;
  ulong uVar22;
  byte bVar23;
  uint uVar24;
  Mat *pMVar25;
  undefined1 uVar26;
  bool bVar27;
  int in_R10D;
  void *pvVar28;
  int in_R11D;
  void *pvVar29;
  Mat *pMVar30;
  long lVar31;
  void *pvVar32;
  ulong uVar33;
  Mat *pMVar34;
  bool reduce_c;
  float in_XMM0_Da;
  float extraout_XMM0_Da;
  float fVar35;
  float extraout_XMM0_Da_00;
  float fVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 extraout_XMM0 [16];
  undefined1 auVar53 [16];
  undefined1 extraout_XMM0_00 [16];
  undefined1 auVar54 [16];
  undefined1 extraout_XMM0_01 [16];
  undefined1 extraout_XMM0_02 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 extraout_XMM0_03 [16];
  undefined1 extraout_XMM0_04 [16];
  undefined1 extraout_var [12];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 extraout_XMM0_05 [16];
  undefined1 extraout_XMM0_06 [16];
  undefined1 extraout_var_00 [12];
  undefined1 extraout_XMM0_07 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 extraout_XMM0_08 [16];
  undefined1 auVar70 [16];
  undefined1 extraout_XMM0_09 [16];
  undefined1 extraout_XMM0_10 [16];
  undefined1 extraout_var_01 [12];
  undefined1 extraout_XMM0_11 [16];
  undefined1 extraout_XMM0_12 [16];
  undefined1 extraout_XMM0_13 [16];
  undefined1 extraout_XMM0_14 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 extraout_XMM0_15 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 extraout_XMM0_16 [16];
  undefined1 extraout_XMM0_17 [16];
  undefined1 extraout_XMM0_18 [16];
  undefined1 extraout_var_02 [12];
  undefined1 extraout_XMM0_19 [16];
  undefined1 extraout_XMM0_20 [16];
  undefined1 extraout_XMM0_21 [16];
  undefined1 extraout_XMM0_22 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 extraout_XMM0_23 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 extraout_XMM0_24 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 extraout_XMM0_25 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 extraout_XMM0_26 [16];
  undefined1 extraout_XMM0_27 [16];
  undefined1 extraout_var_03 [12];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 extraout_XMM0_28 [16];
  undefined1 extraout_XMM0_29 [16];
  undefined1 extraout_var_04 [12];
  undefined1 in_XMM1 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  int iVar271;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  Option *in_stack_ffffffffffffff10;
  Mat *local_e0;
  Mat *local_c8;
  void *local_c0;
  void *local_b8;
  Mat sums;
  int axes_flag [3];
  
  iVar10 = bottom_blob->dims;
  axes_flag[2] = 0;
  axes_flag[0] = 0;
  axes_flag[1] = 0;
  pMVar16 = top_blob;
  pMVar25 = bottom_blob;
  if (this->reduce_all == 0) {
    pMVar13 = (Mat *)(long)(this->axes).w;
    if (0 < (long)pMVar13) {
      pvVar29 = (this->axes).data;
      pMVar16 = (Mat *)(ulong)(iVar10 + 1U);
      pMVar25 = (Mat *)0x0;
      do {
        iVar9 = *(int *)((long)pvVar29 + (long)pMVar25 * 4);
        axes_flag[(int)(iVar9 + (iVar9 >> 0x1f & iVar10 + 1U) + -1)] = 1;
        pMVar25 = (Mat *)((long)&pMVar25->data + 1);
      } while (pMVar13 != pMVar25);
    }
    auVar134 = _DAT_00315150;
    if (iVar10 != 1) {
      if (iVar10 == 2) {
        auVar134._0_4_ = -(uint)(axes_flag[0] == 1);
        auVar134._4_4_ = -(uint)(axes_flag[1] == 1);
        auVar134._8_4_ = -(uint)(axes_flag[1] == 1);
        auVar134._12_4_ = 0xffffffff;
        in_XMM0_Da = (float)axes_flag[0];
      }
      else {
        if (iVar10 == 3) {
          reduce_c = axes_flag[0] == 1;
          auVar134._0_4_ = -(uint)(axes_flag[1] == 1);
          auVar134._4_4_ = -(uint)(axes_flag[2] == 1);
          auVar134._8_4_ = -(uint)(axes_flag[2] == 1);
          auVar134._12_4_ = 0xffffffff;
          in_XMM0_Da = (float)axes_flag[1];
          goto LAB_00200879;
        }
        auVar134 = (undefined1  [16])0x0;
      }
    }
    reduce_c = false;
  }
  else {
    reduce_c = true;
    auVar134 = _DAT_00315c30;
  }
LAB_00200879:
  lVar31 = auVar134._8_8_;
  uVar12 = this->operation;
  if (10 < (ulong)uVar12) {
    return 0;
  }
  uVar11 = 0x318990;
  iVar9 = (&switchD_00200897::switchdataD_00318990)[uVar12] + 0x318990;
  lVar19 = auVar134._0_8_;
  bVar17 = auVar134[0];
  bVar8 = auVar134[8];
  uVar6 = auVar134._8_2_;
  switch(uVar12) {
  case 0:
    fVar35 = this->coeff;
    iVar10 = this->keepdims;
    auVar135._0_8_ = lVar19 << 0x3f;
    auVar135._8_8_ = lVar31 << 0x3f;
    uVar15 = movmskpd(0x318990,auVar135);
    bVar8 = (byte)uVar15;
    bVar27 = false;
    goto LAB_00200f38;
  case 1:
    fVar35 = this->coeff;
    uVar26 = (undefined1)this->keepdims;
    auVar139._0_8_ = lVar19 << 0x3f;
    auVar139._8_8_ = lVar31 << 0x3f;
    uVar15 = movmskpd(0x318990,auVar139);
    bVar8 = (byte)uVar15;
    goto LAB_00200a3c;
  case 2:
    fVar35 = this->coeff;
    if (this->keepdims == 0) {
      auVar142._0_8_ = lVar19 << 0x3f;
      auVar142._8_8_ = lVar31 << 0x3f;
      uVar15 = movmskpd(0x318990,auVar142);
      pMVar25 = top_blob;
      iVar10 = reduction_op<ncnn::reduction_op_sumsq<float>,ncnn::reduction_op_add<float>>
                         (bottom_blob,top_blob,fVar35,(bool)((byte)uVar15 >> 1),
                          (bool)((byte)uVar15 & 1),reduce_c,opt);
    }
    else {
      auVar137._0_8_ = lVar19 << 0x3f;
      auVar137._8_8_ = lVar31 << 0x3f;
      uVar15 = movmskpd(0x318990,auVar137);
      pMVar25 = top_blob;
      iVar10 = reduction_op_keepdims<ncnn::reduction_op_sumsq<float>,ncnn::reduction_op_add<float>>
                         (bottom_blob,top_blob,fVar35,(bool)((byte)uVar15 >> 1),
                          (bool)((byte)uVar15 & 1),reduce_c,opt);
    }
    if (iVar10 != 0) {
      return -100;
    }
    if (ABS(fVar35 + -1.0) <= 1.1920929e-07) {
      return 0;
    }
    goto LAB_00207e52;
  case 3:
    if (iVar10 == 3) {
      auVar38._0_8_ = lVar19 << 0x3f;
      auVar38._8_8_ = lVar31 << 0x3f;
      uVar12 = movmskpd((int)pMVar16,auVar38);
      iVar9 = 1;
      uVar11 = 1;
      if ((uVar12 & 2) != 0) {
        uVar11 = bottom_blob->w;
      }
      if ((uVar12 & 1) != 0) {
        iVar9 = bottom_blob->h;
      }
      iVar9 = iVar9 * uVar11;
      if (reduce_c != false) {
        iVar9 = iVar9 * bottom_blob->c;
      }
    }
    else if (iVar10 == 2) {
      auVar37._0_8_ = lVar19 << 0x3f;
      auVar37._8_8_ = lVar31 << 0x3f;
      uVar11 = movmskpd(0x318990,auVar37);
      iVar9 = 1;
      if ((uVar11 & 2) != 0) {
        iVar9 = bottom_blob->w;
      }
      if ((uVar11 & 1) != 0) {
        iVar9 = iVar9 * bottom_blob->h;
      }
    }
    else {
      iVar9 = 1;
      if (iVar10 == 1) {
        iVar9 = bottom_blob->w;
      }
    }
    in_XMM1._0_4_ = (float)iVar9;
    fVar35 = this->coeff / in_XMM1._0_4_;
    iVar10 = this->keepdims;
    auVar144._0_8_ = lVar19 << 0x3f;
    auVar144._8_8_ = lVar31 << 0x3f;
    uVar15 = movmskpd(uVar11,auVar144);
    bVar8 = (byte)uVar15;
    bVar27 = true;
LAB_00200f38:
    iVar10 = reduction<ncnn::reduction_op_add<float>,ncnn::reduction_op_add<float>,ncnn::post_process_identity<float>>
                       (bottom_blob,top_blob,fVar35,(bool)(bVar8 >> 1),(bool)(bVar8 & 1),reduce_c,
                        bVar27,in_XMM1._0_4_,iVar10,opt);
    return iVar10;
  case 4:
    fVar35 = this->coeff;
    sVar2 = bottom_blob->elemsize;
    if (this->keepdims == 0) {
      if (iVar10 == 2) {
        uVar12 = bottom_blob->w;
        pMVar13 = (Mat *)(ulong)uVar12;
        uVar11 = bottom_blob->h;
        pMVar16 = (Mat *)(ulong)uVar11;
        auVar46._8_4_ = 0xffffffff;
        auVar46._0_8_ = 0xffffffffffffffff;
        auVar46._12_4_ = 0xffffffff;
        auVar47._0_8_ = SUB168(auVar46 ^ auVar134,0) << 0x3f;
        auVar47._8_8_ = SUB168(auVar46 ^ auVar134,8) << 0x3f;
        iVar9 = movmskpd(iVar9,auVar47);
        if (iVar9 == 0) {
          Mat::create(top_blob,1,sVar2,opt->blob_allocator);
          sums.cstep = 0;
          sums.data = (void *)0x0;
          sums.refcount._0_4_ = 0;
          sums.refcount._4_4_ = 0;
          sums.elemsize._0_4_ = 0;
          sums.elemsize._4_4_ = 0;
          sums.elempack = 0;
          sums.allocator = (Allocator *)0x0;
          sums.dims = 0;
          sums.w = 0;
          sums.h = 0;
          sums.d = 0;
          sums.c = 0;
          pMVar25 = (Mat *)(ulong)uVar11;
          Mat::create(&sums,uVar11,sVar2,opt->workspace_allocator);
          in_R11D = -100;
          if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
            if ((int)uVar11 < 1) {
              fVar36 = -3.4028235e+38;
            }
            else {
              pvVar29 = bottom_blob->data;
              iVar9 = bottom_blob->w;
              sVar3 = bottom_blob->elemsize;
              pMVar25 = (Mat *)0x0;
              do {
                auVar113 = ZEXT816(0xff7fffff);
                if (0 < (int)uVar12) {
                  pMVar20 = (Mat *)0x0;
                  auVar113 = ZEXT816(0xff7fffff);
                  do {
                    fVar36 = *(float *)((long)pvVar29 + (long)pMVar20 * 4);
                    if (auVar113._0_4_ <= fVar36) {
                      auVar113._0_4_ = fVar36;
                    }
                    pMVar20 = (Mat *)((long)&pMVar20->data + 1);
                  } while (pMVar13 != pMVar20);
                }
                *(int *)((long)sums.data + (long)pMVar25 * 4) = auVar113._0_4_;
                pMVar25 = (Mat *)((long)&pMVar25->data + 1);
                pvVar29 = (void *)((long)pvVar29 + (long)iVar9 * sVar3);
              } while (pMVar25 != pMVar16);
              fVar36 = -3.4028235e+38;
              pMVar13 = (Mat *)0x0;
              do {
                fVar1 = *(float *)((long)sums.data + (long)pMVar13 * 4);
                if (fVar36 <= fVar1) {
                  fVar36 = fVar1;
                }
                pMVar13 = (Mat *)((long)&pMVar13->data + 1);
              } while (pMVar16 != pMVar13);
            }
            *(float *)top_blob->data = fVar36;
            in_R11D = 0;
          }
          piVar7 = (int *)CONCAT44(sums.refcount._4_4_,sums.refcount._0_4_);
          if (piVar7 != (int *)0x0) {
            LOCK();
            *piVar7 = *piVar7 + -1;
            UNLOCK();
            if (*piVar7 == 0) {
              pMVar25 = (Mat *)sums.data;
              if (sums.allocator == (Allocator *)0x0) {
                if (sums.data != (void *)0x0) {
                  free(sums.data);
                }
              }
              else {
                (*(sums.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          iVar9 = 0;
        }
        else if (((bVar17 | (byte)iVar9 >> 1) & 1) == 0) {
          pMVar25 = pMVar16;
          Mat::create(top_blob,uVar11,sVar2,opt->blob_allocator);
          if (0 < (int)uVar11) {
            iVar9 = bottom_blob->w;
            sVar3 = bottom_blob->elemsize;
            pvVar29 = bottom_blob->data;
            pvVar32 = top_blob->data;
            pMVar25 = (Mat *)0x0;
            do {
              auVar119 = ZEXT816(0xff7fffff);
              if (0 < (int)uVar12) {
                pMVar20 = (Mat *)0x0;
                auVar119 = ZEXT816(0xff7fffff);
                do {
                  fVar36 = *(float *)((long)pvVar29 + (long)pMVar20 * 4);
                  if (auVar119._0_4_ <= fVar36) {
                    auVar119._0_4_ = fVar36;
                  }
                  pMVar20 = (Mat *)((long)&pMVar20->data + 1);
                } while (pMVar13 != pMVar20);
              }
              *(int *)((long)pvVar32 + (long)pMVar25 * 4) = auVar119._0_4_;
              pMVar25 = (Mat *)((long)&pMVar25->data + 1);
              pvVar29 = (void *)((long)pvVar29 + (long)iVar9 * sVar3);
            } while (pMVar25 != pMVar16);
            goto LAB_00202849;
          }
          iVar9 = 0;
          in_R11D = 0;
        }
        else if (((bVar8 | (byte)iVar9) & 1) == 0) {
          pMVar25 = pMVar13;
          Mat::create(top_blob,uVar12,sVar2,opt->blob_allocator);
          auVar281 = _DAT_00315150;
          auVar52 = _DAT_00315140;
          auVar54 = _DAT_003150d0;
          uVar21 = top_blob->c * (int)top_blob->cstep;
          if (0 < (int)uVar21) {
            pvVar29 = top_blob->data;
            lVar31 = (ulong)uVar21 - 1;
            auVar58._8_4_ = (int)lVar31;
            auVar58._0_8_ = lVar31;
            auVar58._12_4_ = (int)((ulong)lVar31 >> 0x20);
            uVar22 = 0;
            auVar58 = auVar58 ^ _DAT_003150d0;
            do {
              auVar154._8_4_ = (int)uVar22;
              auVar154._0_8_ = uVar22;
              auVar154._12_4_ = (int)(uVar22 >> 0x20);
              auVar274 = (auVar154 | auVar281) ^ auVar54;
              iVar9 = auVar58._4_4_;
              iVar271 = auVar58._12_4_;
              if ((bool)(~(auVar274._4_4_ == iVar9 && auVar58._0_4_ < auVar274._0_4_ ||
                          iVar9 < auVar274._4_4_) & 1)) {
                *(undefined4 *)((long)pvVar29 + uVar22 * 4) = 0xff7fffff;
              }
              if ((auVar274._12_4_ != iVar271 || auVar274._8_4_ <= auVar58._8_4_) &&
                  auVar274._12_4_ <= iVar271) {
                *(undefined4 *)((long)pvVar29 + uVar22 * 4 + 4) = 0xff7fffff;
              }
              auVar274 = (auVar154 | auVar52) ^ auVar54;
              auVar276._0_4_ = -(uint)(auVar58._0_4_ < auVar274._0_4_);
              auVar276._4_4_ = -(uint)(iVar9 < auVar274._4_4_);
              auVar276._8_4_ = -(uint)(auVar58._8_4_ < auVar274._8_4_);
              auVar276._12_4_ = -(uint)(iVar271 < auVar274._12_4_);
              iVar9 = -(uint)(auVar274._4_4_ == iVar9);
              iVar271 = -(uint)(auVar274._12_4_ == iVar271);
              auVar319._4_4_ = iVar9;
              auVar319._0_4_ = iVar9;
              auVar319._8_4_ = iVar271;
              auVar319._12_4_ = iVar271;
              auVar155._4_4_ = auVar276._4_4_;
              auVar155._0_4_ = auVar276._4_4_;
              auVar155._8_4_ = auVar276._12_4_;
              auVar155._12_4_ = auVar276._12_4_;
              auVar156._8_4_ = 0xffffffff;
              auVar156._0_8_ = 0xffffffffffffffff;
              auVar156._12_4_ = 0xffffffff;
              auVar156 = (auVar155 | auVar319 & auVar276) ^ auVar156;
              if ((auVar156 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined4 *)((long)pvVar29 + uVar22 * 4 + 8) = 0xff7fffff;
              }
              pMVar25 = (Mat *)(ulong)auVar156._8_2_;
              if ((auVar156 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined4 *)((long)pvVar29 + uVar22 * 4 + 0xc) = 0xff7fffff;
              }
              uVar22 = uVar22 + 4;
            } while ((uVar21 + 3 & 0xfffffffc) != uVar22);
          }
          if (0 < (int)uVar11) {
            pvVar29 = bottom_blob->data;
            iVar9 = bottom_blob->w;
            sVar3 = bottom_blob->elemsize;
            pvVar32 = top_blob->data;
            pMVar25 = (Mat *)0x0;
            do {
              if (0 < (int)uVar12) {
                pMVar20 = (Mat *)0x0;
                do {
                  fVar1 = *(float *)((long)pvVar29 + (long)pMVar20 * 4);
                  fVar36 = *(float *)((long)pvVar32 + (long)pMVar20 * 4);
                  if (fVar1 <= fVar36) {
                    fVar1 = fVar36;
                  }
                  *(float *)((long)pvVar32 + (long)pMVar20 * 4) = fVar1;
                  pMVar20 = (Mat *)((long)&pMVar20->data + 1);
                } while (pMVar13 != pMVar20);
              }
              pMVar25 = (Mat *)((long)&pMVar25->data + 1);
              pvVar29 = (void *)((long)pvVar29 + (long)iVar9 * sVar3);
            } while (pMVar25 != pMVar16);
          }
LAB_00202849:
          iVar9 = 0;
          in_R11D = 0;
        }
        else {
          iVar9 = (int)CONCAT71((uint7)(uint3)((uint)iVar9 >> 8),1);
        }
        if ((char)iVar9 == '\0') goto LAB_0020768d;
      }
      else if (iVar10 == 1) {
        iVar10 = bottom_blob->w;
        pMVar25 = (Mat *)0x1;
        Mat::create(top_blob,1,sVar2,opt->blob_allocator);
        if ((long)iVar10 < 1) goto LAB_0020108b;
        fVar36 = -3.4028235e+38;
        lVar31 = 0;
        do {
          fVar1 = *(float *)((long)bottom_blob->data + lVar31 * 4);
          if (fVar36 <= fVar1) {
            fVar36 = fVar1;
          }
          lVar31 = lVar31 + 1;
        } while (iVar10 != lVar31);
        goto LAB_00201093;
      }
      if (iVar10 == 3) {
        uVar12 = bottom_blob->w;
        lVar31 = (long)(int)uVar12;
        uVar11 = bottom_blob->h;
        uVar22 = (ulong)uVar11;
        uVar21 = bottom_blob->c;
        pMVar16 = (Mat *)(ulong)uVar21;
        uVar24 = uVar11 * uVar12;
        auVar77._8_4_ = 0xffffffff;
        auVar77._0_8_ = 0xffffffffffffffff;
        auVar77._12_4_ = 0xffffffff;
        auVar78._0_8_ = SUB168(auVar77 ^ auVar134,0) << 0x3f;
        auVar78._8_8_ = SUB168(auVar77 ^ auVar134,8) << 0x3f;
        iVar10 = movmskpd(iVar9,auVar78);
        bVar14 = reduce_c ^ 1;
        pMVar25 = pMVar16;
        if (iVar10 == 0 && bVar14 == 0) {
          Mat::create(top_blob,1,sVar2,opt->blob_allocator);
          sums.cstep = 0;
          sums.data = (void *)0x0;
          sums.refcount._0_4_ = 0;
          sums.refcount._4_4_ = 0;
          sums.elemsize._0_4_ = 0;
          sums.elemsize._4_4_ = 0;
          sums.elempack = 0;
          sums.allocator = (Allocator *)0x0;
          sums.dims = 0;
          sums.w = 0;
          sums.h = 0;
          sums.d = 0;
          sums.c = 0;
          Mat::create(&sums,uVar21,sVar2,opt->workspace_allocator);
          in_R11D = -100;
          if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
            if ((int)uVar21 < 1) {
              fVar36 = -3.4028235e+38;
            }
            else {
              sVar2 = bottom_blob->elemsize;
              sVar3 = bottom_blob->cstep;
              pvVar29 = bottom_blob->data;
              pMVar25 = (Mat *)(ulong)uVar24;
              pMVar13 = (Mat *)0x0;
              do {
                fVar36 = -3.4028235e+38;
                if (0 < (int)uVar24) {
                  pMVar20 = (Mat *)0x0;
                  fVar36 = -3.4028235e+38;
                  do {
                    fVar1 = *(float *)((long)pvVar29 + (long)pMVar20 * 4);
                    if (fVar36 <= fVar1) {
                      fVar36 = fVar1;
                    }
                    pMVar20 = (Mat *)((long)&pMVar20->data + 1);
                  } while (pMVar25 != pMVar20);
                }
                *(float *)((long)sums.data + (long)pMVar13 * 4) = fVar36;
                pMVar13 = (Mat *)((long)&pMVar13->data + 1);
                pvVar29 = (void *)((long)pvVar29 + sVar2 * sVar3);
              } while (pMVar13 != pMVar16);
              fVar36 = -3.4028235e+38;
              pMVar13 = (Mat *)0x0;
              do {
                fVar1 = *(float *)((long)sums.data + (long)pMVar13 * 4);
                if (fVar36 <= fVar1) {
                  fVar36 = fVar1;
                }
                pMVar13 = (Mat *)((long)&pMVar13->data + 1);
              } while (pMVar16 != pMVar13);
            }
            *(float *)top_blob->data = fVar36;
            in_R11D = 0;
          }
          piVar7 = (int *)CONCAT44(sums.refcount._4_4_,sums.refcount._0_4_);
          if (piVar7 != (int *)0x0) {
            LOCK();
            *piVar7 = *piVar7 + -1;
            UNLOCK();
            if (*piVar7 == 0) {
              pMVar25 = (Mat *)sums.data;
              if (sums.allocator == (Allocator *)0x0) {
                if (sums.data != (void *)0x0) {
                  free(sums.data);
                }
              }
              else {
                (*(sums.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          bVar27 = false;
          goto LAB_00209396;
        }
        if (iVar10 == 0 && reduce_c == false) {
          Mat::create(top_blob,uVar21,sVar2,opt->blob_allocator);
          if ((int)uVar21 < 1) goto LAB_0020938a;
          pvVar29 = bottom_blob->data;
          sVar2 = bottom_blob->elemsize;
          sVar3 = bottom_blob->cstep;
          pvVar32 = top_blob->data;
          pMVar25 = (Mat *)(ulong)uVar24;
          pMVar13 = (Mat *)0x0;
          do {
            fVar36 = -3.4028235e+38;
            if (0 < (int)uVar24) {
              pMVar20 = (Mat *)0x0;
              fVar36 = -3.4028235e+38;
              do {
                fVar1 = *(float *)((long)pvVar29 + (long)pMVar20 * 4);
                if (fVar36 <= fVar1) {
                  fVar36 = fVar1;
                }
                pMVar20 = (Mat *)((long)&pMVar20->data + 1);
              } while (pMVar25 != pMVar20);
            }
            *(float *)((long)pvVar32 + (long)pMVar13 * 4) = fVar36;
            pMVar13 = (Mat *)((long)&pMVar13->data + 1);
            pvVar29 = (void *)((long)pvVar29 + sVar2 * sVar3);
          } while (pMVar13 != pMVar16);
LAB_0020564b:
          bVar27 = false;
          in_R11D = 0;
        }
        else {
          pMVar13 = (Mat *)(ulong)uVar12;
          bVar23 = (byte)iVar10 >> 1 | bVar17;
          if (reduce_c == false && (bVar23 & 1) == 0) {
            pMVar25 = (Mat *)(ulong)uVar11;
            Mat::create(top_blob,uVar11,uVar21,sVar2,opt->blob_allocator);
            if (0 < (int)uVar21) {
              pvVar29 = bottom_blob->data;
              sVar2 = bottom_blob->elemsize;
              pvVar32 = top_blob->data;
              pMVar25 = (Mat *)((long)top_blob->w * top_blob->elemsize);
              sVar3 = bottom_blob->cstep;
              pMVar20 = (Mat *)0x0;
              do {
                if (0 < (int)uVar11) {
                  uVar33 = 0;
                  pvVar28 = pvVar29;
                  do {
                    auVar128 = ZEXT816(0xff7fffff);
                    if (0 < (int)uVar12) {
                      pMVar30 = (Mat *)0x0;
                      auVar128 = ZEXT816(0xff7fffff);
                      do {
                        fVar36 = *(float *)((long)pvVar28 + (long)pMVar30 * 4);
                        if (auVar128._0_4_ <= fVar36) {
                          auVar128._0_4_ = fVar36;
                        }
                        pMVar30 = (Mat *)((long)&pMVar30->data + 1);
                      } while (pMVar13 != pMVar30);
                    }
                    *(int *)((long)pvVar32 + uVar33 * 4 + (long)pMVar25 * (long)pMVar20) =
                         auVar128._0_4_;
                    uVar33 = uVar33 + 1;
                    pvVar28 = (void *)((long)pvVar28 + lVar31 * 4);
                  } while (uVar33 != uVar22);
                }
                pMVar20 = (Mat *)((long)&pMVar20->data + 1);
                pvVar29 = (void *)((long)pvVar29 + sVar2 * sVar3);
              } while (pMVar20 != pMVar16);
              goto LAB_0020564b;
            }
LAB_0020938a:
            in_R11D = 0;
          }
          else {
            if ((bVar23 & 1) != 0 || bVar14 != 0) {
              pMVar25 = (Mat *)(ulong)uVar6;
              bVar23 = (byte)iVar10 | bVar8;
              if ((bVar23 & 1) == 0 && bVar14 == 0) {
                Mat::create(top_blob,uVar12,sVar2,opt->blob_allocator);
                sums.cstep = 0;
                sums.data = (void *)0x0;
                sums.refcount._0_4_ = 0;
                sums.refcount._4_4_ = 0;
                sums.elemsize._0_4_ = 0;
                sums.elemsize._4_4_ = 0;
                sums.elempack = 0;
                sums.allocator = (Allocator *)0x0;
                sums.dims = 0;
                sums.w = 0;
                sums.h = 0;
                sums.d = 0;
                sums.c = 0;
                pMVar25 = (Mat *)(ulong)uVar12;
                Mat::create(&sums,uVar12,1,uVar21,sVar2,opt->workspace_allocator);
                auVar52 = _DAT_00315150;
                auVar54 = _DAT_00315140;
                auVar134 = _DAT_003150d0;
                in_R11D = -100;
                if ((sums.data != (void *)0x0) &&
                   (pMVar25 = (Mat *)(sums.cstep * (long)sums.c), pMVar25 != (Mat *)0x0)) {
                  uVar24 = (int)sums.cstep * sums.c;
                  if (0 < (int)uVar24) {
                    lVar19 = (ulong)uVar24 - 1;
                    auVar98._8_4_ = (int)lVar19;
                    auVar98._0_8_ = lVar19;
                    auVar98._12_4_ = (int)((ulong)lVar19 >> 0x20);
                    uVar22 = 0;
                    auVar98 = auVar98 ^ _DAT_003150d0;
                    do {
                      auVar235._8_4_ = (int)uVar22;
                      auVar235._0_8_ = uVar22;
                      auVar235._12_4_ = (int)(uVar22 >> 0x20);
                      auVar281 = (auVar235 | auVar52) ^ auVar134;
                      iVar10 = auVar98._4_4_;
                      iVar9 = auVar98._12_4_;
                      if ((bool)(~(auVar281._4_4_ == iVar10 && auVar98._0_4_ < auVar281._0_4_ ||
                                  iVar10 < auVar281._4_4_) & 1)) {
                        *(undefined4 *)((long)sums.data + uVar22 * 4) = 0xff7fffff;
                      }
                      if ((auVar281._12_4_ != iVar9 || auVar281._8_4_ <= auVar98._8_4_) &&
                          auVar281._12_4_ <= iVar9) {
                        *(undefined4 *)((long)sums.data + uVar22 * 4 + 4) = 0xff7fffff;
                      }
                      auVar281 = (auVar235 | auVar54) ^ auVar134;
                      auVar304._0_4_ = -(uint)(auVar98._0_4_ < auVar281._0_4_);
                      auVar304._4_4_ = -(uint)(iVar10 < auVar281._4_4_);
                      auVar304._8_4_ = -(uint)(auVar98._8_4_ < auVar281._8_4_);
                      auVar304._12_4_ = -(uint)(iVar9 < auVar281._12_4_);
                      iVar10 = -(uint)(auVar281._4_4_ == iVar10);
                      iVar9 = -(uint)(auVar281._12_4_ == iVar9);
                      auVar346._4_4_ = iVar10;
                      auVar346._0_4_ = iVar10;
                      auVar346._8_4_ = iVar9;
                      auVar346._12_4_ = iVar9;
                      auVar236._4_4_ = auVar304._4_4_;
                      auVar236._0_4_ = auVar304._4_4_;
                      auVar236._8_4_ = auVar304._12_4_;
                      auVar236._12_4_ = auVar304._12_4_;
                      auVar237._8_4_ = 0xffffffff;
                      auVar237._0_8_ = 0xffffffffffffffff;
                      auVar237._12_4_ = 0xffffffff;
                      auVar237 = (auVar236 | auVar346 & auVar304) ^ auVar237;
                      if ((auVar237 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        *(undefined4 *)((long)sums.data + uVar22 * 4 + 8) = 0xff7fffff;
                      }
                      pMVar25 = (Mat *)(ulong)auVar237._8_2_;
                      if ((auVar237 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        *(undefined4 *)((long)sums.data + uVar22 * 4 + 0xc) = 0xff7fffff;
                      }
                      uVar22 = uVar22 + 4;
                    } while ((uVar24 + 3 & 0xfffffffc) != uVar22);
                  }
                  if (0 < (int)uVar21) {
                    pvVar29 = bottom_blob->data;
                    sVar2 = bottom_blob->elemsize;
                    pMVar25 = (Mat *)(CONCAT44(sums.elemsize._4_4_,(undefined4)sums.elemsize) *
                                     sums.cstep);
                    sVar3 = bottom_blob->cstep;
                    pMVar20 = (Mat *)0x0;
                    pvVar32 = sums.data;
                    do {
                      if (0 < (int)uVar11) {
                        uVar24 = 0;
                        pvVar28 = pvVar29;
                        do {
                          if (0 < (int)uVar12) {
                            pMVar30 = (Mat *)0x0;
                            do {
                              fVar1 = *(float *)((long)pvVar28 + (long)pMVar30 * 4);
                              fVar36 = *(float *)((long)pvVar32 + (long)pMVar30 * 4);
                              if (fVar1 <= fVar36) {
                                fVar1 = fVar36;
                              }
                              *(float *)((long)pvVar32 + (long)pMVar30 * 4) = fVar1;
                              pMVar30 = (Mat *)((long)&pMVar30->data + 1);
                            } while (pMVar13 != pMVar30);
                          }
                          uVar24 = uVar24 + 1;
                          pvVar28 = (void *)((long)pvVar28 + lVar31 * 4);
                        } while (uVar24 != uVar11);
                      }
                      pMVar20 = (Mat *)((long)&pMVar20->data + 1);
                      pvVar29 = (void *)((long)pvVar29 + sVar2 * sVar3);
                      pvVar32 = (void *)((long)pvVar32 + (long)pMVar25);
                    } while (pMVar20 != pMVar16);
                  }
                  auVar52 = _DAT_00315150;
                  auVar54 = _DAT_00315140;
                  auVar134 = _DAT_003150d0;
                  uVar11 = top_blob->c * (int)top_blob->cstep;
                  if (0 < (int)uVar11) {
                    pvVar29 = top_blob->data;
                    lVar31 = (ulong)uVar11 - 1;
                    auVar99._8_4_ = (int)lVar31;
                    auVar99._0_8_ = lVar31;
                    auVar99._12_4_ = (int)((ulong)lVar31 >> 0x20);
                    uVar22 = 0;
                    auVar99 = auVar99 ^ _DAT_003150d0;
                    do {
                      auVar238._8_4_ = (int)uVar22;
                      auVar238._0_8_ = uVar22;
                      auVar238._12_4_ = (int)(uVar22 >> 0x20);
                      auVar281 = (auVar238 | auVar52) ^ auVar134;
                      iVar10 = auVar99._4_4_;
                      iVar9 = auVar99._12_4_;
                      if ((bool)(~(auVar281._4_4_ == iVar10 && auVar99._0_4_ < auVar281._0_4_ ||
                                  iVar10 < auVar281._4_4_) & 1)) {
                        *(undefined4 *)((long)pvVar29 + uVar22 * 4) = 0xff7fffff;
                      }
                      if ((auVar281._12_4_ != iVar9 || auVar281._8_4_ <= auVar99._8_4_) &&
                          auVar281._12_4_ <= iVar9) {
                        *(undefined4 *)((long)pvVar29 + uVar22 * 4 + 4) = 0xff7fffff;
                      }
                      auVar281 = (auVar238 | auVar54) ^ auVar134;
                      auVar305._0_4_ = -(uint)(auVar99._0_4_ < auVar281._0_4_);
                      auVar305._4_4_ = -(uint)(iVar10 < auVar281._4_4_);
                      auVar305._8_4_ = -(uint)(auVar99._8_4_ < auVar281._8_4_);
                      auVar305._12_4_ = -(uint)(iVar9 < auVar281._12_4_);
                      iVar10 = -(uint)(auVar281._4_4_ == iVar10);
                      iVar9 = -(uint)(auVar281._12_4_ == iVar9);
                      auVar347._4_4_ = iVar10;
                      auVar347._0_4_ = iVar10;
                      auVar347._8_4_ = iVar9;
                      auVar347._12_4_ = iVar9;
                      auVar239._4_4_ = auVar305._4_4_;
                      auVar239._0_4_ = auVar305._4_4_;
                      auVar239._8_4_ = auVar305._12_4_;
                      auVar239._12_4_ = auVar305._12_4_;
                      auVar240._8_4_ = 0xffffffff;
                      auVar240._0_8_ = 0xffffffffffffffff;
                      auVar240._12_4_ = 0xffffffff;
                      auVar240 = (auVar239 | auVar347 & auVar305) ^ auVar240;
                      if ((auVar240 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        *(undefined4 *)((long)pvVar29 + uVar22 * 4 + 8) = 0xff7fffff;
                      }
                      pMVar25 = (Mat *)(ulong)auVar240._8_2_;
                      if ((auVar240 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        *(undefined4 *)((long)pvVar29 + uVar22 * 4 + 0xc) = 0xff7fffff;
                      }
                      uVar22 = uVar22 + 4;
                    } while ((uVar11 + 3 & 0xfffffffc) != uVar22);
                  }
                  if (0 < (int)uVar21) {
                    pvVar29 = top_blob->data;
                    pMVar25 = (Mat *)0x0;
                    pvVar32 = sums.data;
                    do {
                      if (0 < (int)uVar12) {
                        pMVar20 = (Mat *)0x0;
                        do {
                          fVar1 = *(float *)((long)pvVar32 + (long)pMVar20 * 4);
                          fVar36 = *(float *)((long)pvVar29 + (long)pMVar20 * 4);
                          if (fVar1 <= fVar36) {
                            fVar1 = fVar36;
                          }
                          *(float *)((long)pvVar29 + (long)pMVar20 * 4) = fVar1;
                          pMVar20 = (Mat *)((long)&pMVar20->data + 1);
                        } while (pMVar13 != pMVar20);
                      }
                      pMVar25 = (Mat *)((long)&pMVar25->data + 1);
                      pvVar32 = (void *)((long)pvVar32 +
                                        CONCAT44(sums.elemsize._4_4_,(undefined4)sums.elemsize) *
                                        sums.cstep);
                    } while (pMVar25 != pMVar16);
                  }
                  in_R11D = 0;
                }
                Mat::~Mat(&sums);
                bVar27 = false;
              }
              else if (((bVar17 | bVar8) & 1) == 0 && bVar14 == 0) {
                Mat::create(top_blob,uVar12,uVar11,sVar2,opt->blob_allocator);
                auVar52 = _DAT_00315150;
                auVar54 = _DAT_00315140;
                auVar134 = _DAT_003150d0;
                uVar12 = top_blob->c * (int)top_blob->cstep;
                if (0 < (int)uVar12) {
                  pvVar29 = top_blob->data;
                  lVar31 = (ulong)uVar12 - 1;
                  auVar107._8_4_ = (int)lVar31;
                  auVar107._0_8_ = lVar31;
                  auVar107._12_4_ = (int)((ulong)lVar31 >> 0x20);
                  uVar22 = 0;
                  auVar107 = auVar107 ^ _DAT_003150d0;
                  do {
                    auVar262._8_4_ = (int)uVar22;
                    auVar262._0_8_ = uVar22;
                    auVar262._12_4_ = (int)(uVar22 >> 0x20);
                    auVar281 = (auVar262 | auVar52) ^ auVar134;
                    iVar10 = auVar107._4_4_;
                    iVar9 = auVar107._12_4_;
                    if ((bool)(~(auVar281._4_4_ == iVar10 && auVar107._0_4_ < auVar281._0_4_ ||
                                iVar10 < auVar281._4_4_) & 1)) {
                      *(undefined4 *)((long)pvVar29 + uVar22 * 4) = 0xff7fffff;
                    }
                    if ((auVar281._12_4_ != iVar9 || auVar281._8_4_ <= auVar107._8_4_) &&
                        auVar281._12_4_ <= iVar9) {
                      *(undefined4 *)((long)pvVar29 + uVar22 * 4 + 4) = 0xff7fffff;
                    }
                    auVar281 = (auVar262 | auVar54) ^ auVar134;
                    auVar313._0_4_ = -(uint)(auVar107._0_4_ < auVar281._0_4_);
                    auVar313._4_4_ = -(uint)(iVar10 < auVar281._4_4_);
                    auVar313._8_4_ = -(uint)(auVar107._8_4_ < auVar281._8_4_);
                    auVar313._12_4_ = -(uint)(iVar9 < auVar281._12_4_);
                    iVar10 = -(uint)(auVar281._4_4_ == iVar10);
                    iVar9 = -(uint)(auVar281._12_4_ == iVar9);
                    auVar355._4_4_ = iVar10;
                    auVar355._0_4_ = iVar10;
                    auVar355._8_4_ = iVar9;
                    auVar355._12_4_ = iVar9;
                    auVar263._4_4_ = auVar313._4_4_;
                    auVar263._0_4_ = auVar313._4_4_;
                    auVar263._8_4_ = auVar313._12_4_;
                    auVar263._12_4_ = auVar313._12_4_;
                    auVar264._8_4_ = 0xffffffff;
                    auVar264._0_8_ = 0xffffffffffffffff;
                    auVar264._12_4_ = 0xffffffff;
                    auVar264 = (auVar263 | auVar355 & auVar313) ^ auVar264;
                    if ((auVar264 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      *(undefined4 *)((long)pvVar29 + uVar22 * 4 + 8) = 0xff7fffff;
                    }
                    pMVar13 = (Mat *)(ulong)auVar264._8_2_;
                    if ((auVar264 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      *(undefined4 *)((long)pvVar29 + uVar22 * 4 + 0xc) = 0xff7fffff;
                    }
                    uVar22 = uVar22 + 4;
                  } while ((uVar12 + 3 & 0xfffffffc) != uVar22);
                }
                pMVar25 = pMVar13;
                if ((int)uVar21 < 1) goto LAB_0020938a;
                pvVar29 = bottom_blob->data;
                sVar2 = bottom_blob->elemsize;
                pvVar32 = top_blob->data;
                sVar3 = bottom_blob->cstep;
                pMVar25 = (Mat *)(ulong)uVar24;
                pMVar13 = (Mat *)0x0;
                in_R11D = 0;
                do {
                  if (0 < (int)uVar24) {
                    pMVar20 = (Mat *)0x0;
                    do {
                      fVar1 = *(float *)((long)pvVar29 + (long)pMVar20 * 4);
                      fVar36 = *(float *)((long)pvVar32 + (long)pMVar20 * 4);
                      if (fVar1 <= fVar36) {
                        fVar1 = fVar36;
                      }
                      *(float *)((long)pvVar32 + (long)pMVar20 * 4) = fVar1;
                      pMVar20 = (Mat *)((long)&pMVar20->data + 1);
                    } while (pMVar25 != pMVar20);
                  }
                  pMVar13 = (Mat *)((long)&pMVar13->data + 1);
                  pvVar29 = (void *)((long)pvVar29 + sVar2 * sVar3);
                  bVar27 = false;
                } while (pMVar13 != pMVar16);
              }
              else {
                bVar27 = true;
                if (reduce_c == false && (bVar23 & 1) == 0) {
                  pMVar25 = pMVar13;
                  Mat::create(top_blob,uVar12,uVar21,sVar2,opt->blob_allocator);
                  auVar52 = _DAT_00315150;
                  auVar54 = _DAT_00315140;
                  auVar134 = _DAT_003150d0;
                  uVar24 = top_blob->c * (int)top_blob->cstep;
                  if (0 < (int)uVar24) {
                    pvVar29 = top_blob->data;
                    lVar31 = (ulong)uVar24 - 1;
                    auVar79._8_4_ = (int)lVar31;
                    auVar79._0_8_ = lVar31;
                    auVar79._12_4_ = (int)((ulong)lVar31 >> 0x20);
                    uVar22 = 0;
                    auVar79 = auVar79 ^ _DAT_003150d0;
                    do {
                      auVar190._8_4_ = (int)uVar22;
                      auVar190._0_8_ = uVar22;
                      auVar190._12_4_ = (int)(uVar22 >> 0x20);
                      auVar281 = (auVar190 | auVar52) ^ auVar134;
                      iVar10 = auVar79._4_4_;
                      iVar9 = auVar79._12_4_;
                      if ((bool)(~(auVar281._4_4_ == iVar10 && auVar79._0_4_ < auVar281._0_4_ ||
                                  iVar10 < auVar281._4_4_) & 1)) {
                        *(undefined4 *)((long)pvVar29 + uVar22 * 4) = 0xff7fffff;
                      }
                      if ((auVar281._12_4_ != iVar9 || auVar281._8_4_ <= auVar79._8_4_) &&
                          auVar281._12_4_ <= iVar9) {
                        *(undefined4 *)((long)pvVar29 + uVar22 * 4 + 4) = 0xff7fffff;
                      }
                      auVar281 = (auVar190 | auVar54) ^ auVar134;
                      auVar289._0_4_ = -(uint)(auVar79._0_4_ < auVar281._0_4_);
                      auVar289._4_4_ = -(uint)(iVar10 < auVar281._4_4_);
                      auVar289._8_4_ = -(uint)(auVar79._8_4_ < auVar281._8_4_);
                      auVar289._12_4_ = -(uint)(iVar9 < auVar281._12_4_);
                      iVar10 = -(uint)(auVar281._4_4_ == iVar10);
                      iVar9 = -(uint)(auVar281._12_4_ == iVar9);
                      auVar331._4_4_ = iVar10;
                      auVar331._0_4_ = iVar10;
                      auVar331._8_4_ = iVar9;
                      auVar331._12_4_ = iVar9;
                      auVar191._4_4_ = auVar289._4_4_;
                      auVar191._0_4_ = auVar289._4_4_;
                      auVar191._8_4_ = auVar289._12_4_;
                      auVar191._12_4_ = auVar289._12_4_;
                      auVar192._8_4_ = 0xffffffff;
                      auVar192._0_8_ = 0xffffffffffffffff;
                      auVar192._12_4_ = 0xffffffff;
                      auVar192 = (auVar191 | auVar331 & auVar289) ^ auVar192;
                      if ((auVar192 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        *(undefined4 *)((long)pvVar29 + uVar22 * 4 + 8) = 0xff7fffff;
                      }
                      pMVar25 = (Mat *)(ulong)auVar192._8_2_;
                      if ((auVar192 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        *(undefined4 *)((long)pvVar29 + uVar22 * 4 + 0xc) = 0xff7fffff;
                      }
                      uVar22 = uVar22 + 4;
                    } while ((uVar24 + 3 & 0xfffffffc) != uVar22);
                  }
                  if ((int)uVar21 < 1) goto LAB_0020938a;
                  pvVar29 = bottom_blob->data;
                  sVar2 = bottom_blob->elemsize;
                  pbVar18 = (bool *)top_blob->data;
                  sVar3 = bottom_blob->cstep;
                  pMVar25 = (Mat *)((long)top_blob->w * top_blob->elemsize);
                  pMVar20 = (Mat *)0x0;
                  do {
                    if (0 < (int)uVar11) {
                      uVar21 = 0;
                      pvVar32 = pvVar29;
                      do {
                        if (0 < (int)uVar12) {
                          pMVar30 = (Mat *)0x0;
                          do {
                            fVar36 = *(float *)((long)pvVar32 + (long)pMVar30 * 4);
                            if (fVar36 <= *(float *)(pbVar18 + (long)pMVar30 * 4)) {
                              fVar36 = *(float *)(pbVar18 + (long)pMVar30 * 4);
                            }
                            *(float *)(pbVar18 + (long)pMVar30 * 4) = fVar36;
                            pMVar30 = (Mat *)((long)&pMVar30->data + 1);
                          } while (pMVar13 != pMVar30);
                        }
                        uVar21 = uVar21 + 1;
                        pvVar32 = (void *)((long)pvVar32 + (long)(int)uVar12 * 4);
                      } while (uVar21 != uVar11);
                    }
                    pMVar20 = (Mat *)((long)&pMVar20->data + 1);
                    pvVar29 = (void *)((long)pvVar29 + sVar2 * sVar3);
                    pbVar18 = (bool *)((long)&pMVar25->data + (long)pbVar18);
                    bVar27 = false;
                    in_R11D = 0;
                  } while (pMVar20 != pMVar16);
                }
              }
              goto LAB_00209396;
            }
            Mat::create(top_blob,uVar11,sVar2,opt->blob_allocator);
            sums.cstep = 0;
            sums.data = (void *)0x0;
            sums.refcount._0_4_ = 0;
            sums.refcount._4_4_ = 0;
            sums.elemsize._0_4_ = 0;
            sums.elemsize._4_4_ = 0;
            sums.elempack = 0;
            sums.allocator = (Allocator *)0x0;
            sums.dims = 0;
            sums.w = 0;
            sums.h = 0;
            sums.d = 0;
            sums.c = 0;
            pMVar25 = (Mat *)0x1;
            Mat::create(&sums,1,uVar11,uVar21,sVar2,opt->workspace_allocator);
            auVar52 = _DAT_00315150;
            auVar54 = _DAT_00315140;
            auVar134 = _DAT_003150d0;
            in_R11D = -100;
            if ((sums.data != (void *)0x0) &&
               (pMVar25 = (Mat *)(sums.cstep * (long)sums.c), pMVar25 != (Mat *)0x0)) {
              uVar24 = (int)sums.cstep * sums.c;
              if (0 < (int)uVar24) {
                lVar19 = (ulong)uVar24 - 1;
                auVar86._8_4_ = (int)lVar19;
                auVar86._0_8_ = lVar19;
                auVar86._12_4_ = (int)((ulong)lVar19 >> 0x20);
                uVar33 = 0;
                auVar86 = auVar86 ^ _DAT_003150d0;
                do {
                  auVar199._8_4_ = (int)uVar33;
                  auVar199._0_8_ = uVar33;
                  auVar199._12_4_ = (int)(uVar33 >> 0x20);
                  auVar281 = (auVar199 | auVar52) ^ auVar134;
                  iVar10 = auVar86._4_4_;
                  iVar9 = auVar86._12_4_;
                  if ((bool)(~(auVar281._4_4_ == iVar10 && auVar86._0_4_ < auVar281._0_4_ ||
                              iVar10 < auVar281._4_4_) & 1)) {
                    *(undefined4 *)((long)sums.data + uVar33 * 4) = 0xff7fffff;
                  }
                  if ((auVar281._12_4_ != iVar9 || auVar281._8_4_ <= auVar86._8_4_) &&
                      auVar281._12_4_ <= iVar9) {
                    *(undefined4 *)((long)sums.data + uVar33 * 4 + 4) = 0xff7fffff;
                  }
                  auVar281 = (auVar199 | auVar54) ^ auVar134;
                  auVar292._0_4_ = -(uint)(auVar86._0_4_ < auVar281._0_4_);
                  auVar292._4_4_ = -(uint)(iVar10 < auVar281._4_4_);
                  auVar292._8_4_ = -(uint)(auVar86._8_4_ < auVar281._8_4_);
                  auVar292._12_4_ = -(uint)(iVar9 < auVar281._12_4_);
                  iVar10 = -(uint)(auVar281._4_4_ == iVar10);
                  iVar9 = -(uint)(auVar281._12_4_ == iVar9);
                  auVar334._4_4_ = iVar10;
                  auVar334._0_4_ = iVar10;
                  auVar334._8_4_ = iVar9;
                  auVar334._12_4_ = iVar9;
                  auVar200._4_4_ = auVar292._4_4_;
                  auVar200._0_4_ = auVar292._4_4_;
                  auVar200._8_4_ = auVar292._12_4_;
                  auVar200._12_4_ = auVar292._12_4_;
                  auVar201._8_4_ = 0xffffffff;
                  auVar201._0_8_ = 0xffffffffffffffff;
                  auVar201._12_4_ = 0xffffffff;
                  auVar201 = (auVar200 | auVar334 & auVar292) ^ auVar201;
                  if ((auVar201 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    *(undefined4 *)((long)sums.data + uVar33 * 4 + 8) = 0xff7fffff;
                  }
                  pMVar25 = (Mat *)(ulong)auVar201._8_2_;
                  if ((auVar201 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    *(undefined4 *)((long)sums.data + uVar33 * 4 + 0xc) = 0xff7fffff;
                  }
                  uVar33 = uVar33 + 4;
                } while ((uVar24 + 3 & 0xfffffffc) != uVar33);
              }
              if (0 < (int)uVar21) {
                pvVar29 = bottom_blob->data;
                sVar2 = bottom_blob->elemsize;
                pMVar25 = (Mat *)(CONCAT44(sums.elemsize._4_4_,(undefined4)sums.elemsize) *
                                 sums.cstep);
                sVar3 = bottom_blob->cstep;
                pMVar20 = (Mat *)0x0;
                do {
                  if (0 < (int)uVar11) {
                    uVar33 = 0;
                    pvVar32 = pvVar29;
                    do {
                      auVar131 = ZEXT816(0xff7fffff);
                      if (0 < (int)uVar12) {
                        pMVar30 = (Mat *)0x0;
                        auVar131 = ZEXT816(0xff7fffff);
                        do {
                          fVar36 = *(float *)((long)pvVar32 + (long)pMVar30 * 4);
                          if (auVar131._0_4_ <= fVar36) {
                            auVar131._0_4_ = fVar36;
                          }
                          pMVar30 = (Mat *)((long)&pMVar30->data + 1);
                        } while (pMVar13 != pMVar30);
                      }
                      *(int *)((long)sums.data + uVar33 * 4 + (long)pMVar25 * (long)pMVar20) =
                           auVar131._0_4_;
                      uVar33 = uVar33 + 1;
                      pvVar32 = (void *)((long)pvVar32 + lVar31 * 4);
                    } while (uVar33 != uVar22);
                  }
                  pMVar20 = (Mat *)((long)&pMVar20->data + 1);
                  pvVar29 = (void *)((long)pvVar29 + sVar2 * sVar3);
                } while (pMVar20 != pMVar16);
              }
              auVar52 = _DAT_00315150;
              auVar54 = _DAT_00315140;
              auVar134 = _DAT_003150d0;
              uVar12 = top_blob->c * (int)top_blob->cstep;
              if (0 < (int)uVar12) {
                pvVar29 = top_blob->data;
                lVar31 = (ulong)uVar12 - 1;
                auVar87._8_4_ = (int)lVar31;
                auVar87._0_8_ = lVar31;
                auVar87._12_4_ = (int)((ulong)lVar31 >> 0x20);
                uVar33 = 0;
                auVar87 = auVar87 ^ _DAT_003150d0;
                do {
                  auVar202._8_4_ = (int)uVar33;
                  auVar202._0_8_ = uVar33;
                  auVar202._12_4_ = (int)(uVar33 >> 0x20);
                  auVar281 = (auVar202 | auVar52) ^ auVar134;
                  iVar10 = auVar87._4_4_;
                  iVar9 = auVar87._12_4_;
                  if ((bool)(~(auVar281._4_4_ == iVar10 && auVar87._0_4_ < auVar281._0_4_ ||
                              iVar10 < auVar281._4_4_) & 1)) {
                    *(undefined4 *)((long)pvVar29 + uVar33 * 4) = 0xff7fffff;
                  }
                  if ((auVar281._12_4_ != iVar9 || auVar281._8_4_ <= auVar87._8_4_) &&
                      auVar281._12_4_ <= iVar9) {
                    *(undefined4 *)((long)pvVar29 + uVar33 * 4 + 4) = 0xff7fffff;
                  }
                  auVar281 = (auVar202 | auVar54) ^ auVar134;
                  auVar293._0_4_ = -(uint)(auVar87._0_4_ < auVar281._0_4_);
                  auVar293._4_4_ = -(uint)(iVar10 < auVar281._4_4_);
                  auVar293._8_4_ = -(uint)(auVar87._8_4_ < auVar281._8_4_);
                  auVar293._12_4_ = -(uint)(iVar9 < auVar281._12_4_);
                  iVar10 = -(uint)(auVar281._4_4_ == iVar10);
                  iVar9 = -(uint)(auVar281._12_4_ == iVar9);
                  auVar335._4_4_ = iVar10;
                  auVar335._0_4_ = iVar10;
                  auVar335._8_4_ = iVar9;
                  auVar335._12_4_ = iVar9;
                  auVar203._4_4_ = auVar293._4_4_;
                  auVar203._0_4_ = auVar293._4_4_;
                  auVar203._8_4_ = auVar293._12_4_;
                  auVar203._12_4_ = auVar293._12_4_;
                  auVar204._8_4_ = 0xffffffff;
                  auVar204._0_8_ = 0xffffffffffffffff;
                  auVar204._12_4_ = 0xffffffff;
                  auVar204 = (auVar203 | auVar335 & auVar293) ^ auVar204;
                  if ((auVar204 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    *(undefined4 *)((long)pvVar29 + uVar33 * 4 + 8) = 0xff7fffff;
                  }
                  pMVar25 = (Mat *)(ulong)auVar204._8_2_;
                  if ((auVar204 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    *(undefined4 *)((long)pvVar29 + uVar33 * 4 + 0xc) = 0xff7fffff;
                  }
                  uVar33 = uVar33 + 4;
                } while ((uVar12 + 3 & 0xfffffffc) != uVar33);
              }
              if (0 < (int)uVar21) {
                pvVar29 = top_blob->data;
                pMVar25 = (Mat *)0x0;
                pvVar32 = sums.data;
                do {
                  if (0 < (int)uVar11) {
                    uVar33 = 0;
                    do {
                      fVar1 = *(float *)((long)pvVar32 + uVar33 * 4);
                      fVar36 = *(float *)((long)pvVar29 + uVar33 * 4);
                      if (fVar1 <= fVar36) {
                        fVar1 = fVar36;
                      }
                      *(float *)((long)pvVar29 + uVar33 * 4) = fVar1;
                      uVar33 = uVar33 + 1;
                    } while (uVar22 != uVar33);
                  }
                  pMVar25 = (Mat *)((long)&pMVar25->data + 1);
                  pvVar32 = (void *)((long)pvVar32 +
                                    CONCAT44(sums.elemsize._4_4_,(undefined4)sums.elemsize) *
                                    sums.cstep);
                } while (pMVar25 != pMVar16);
              }
              in_R11D = 0;
            }
            Mat::~Mat(&sums);
          }
          bVar27 = false;
        }
LAB_00209396:
        if (!bVar27) goto LAB_0020768d;
      }
LAB_0020768a:
      in_R11D = 0;
    }
    else if (iVar10 == 2) {
      uVar12 = bottom_blob->w;
      pMVar13 = (Mat *)(ulong)uVar12;
      uVar11 = bottom_blob->h;
      pMVar16 = (Mat *)(ulong)uVar11;
      auVar39._8_4_ = 0xffffffff;
      auVar39._0_8_ = 0xffffffffffffffff;
      auVar39._12_4_ = 0xffffffff;
      auVar40._0_8_ = SUB168(auVar39 ^ auVar134,0) << 0x3f;
      auVar40._8_8_ = SUB168(auVar39 ^ auVar134,8) << 0x3f;
      iVar9 = movmskpd(iVar9,auVar40);
      if (iVar9 == 0) {
        Mat::create(top_blob,1,1,sVar2,opt->blob_allocator);
        sums.cstep = 0;
        sums.data = (void *)0x0;
        sums.refcount._0_4_ = 0;
        sums.refcount._4_4_ = 0;
        sums.elemsize._0_4_ = 0;
        sums.elemsize._4_4_ = 0;
        sums.elempack = 0;
        sums.allocator = (Allocator *)0x0;
        sums.dims = 0;
        sums.w = 0;
        sums.h = 0;
        sums.d = 0;
        sums.c = 0;
        pMVar25 = (Mat *)(ulong)uVar11;
        Mat::create(&sums,uVar11,sVar2,opt->workspace_allocator);
        in_R11D = -100;
        if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
          if ((int)uVar11 < 1) {
            fVar36 = -3.4028235e+38;
          }
          else {
            pvVar29 = bottom_blob->data;
            iVar9 = bottom_blob->w;
            sVar3 = bottom_blob->elemsize;
            pMVar25 = (Mat *)0x0;
            do {
              auVar110 = ZEXT816(0xff7fffff);
              if (0 < (int)uVar12) {
                pMVar20 = (Mat *)0x0;
                auVar110 = ZEXT816(0xff7fffff);
                do {
                  fVar36 = *(float *)((long)pvVar29 + (long)pMVar20 * 4);
                  if (auVar110._0_4_ <= fVar36) {
                    auVar110._0_4_ = fVar36;
                  }
                  pMVar20 = (Mat *)((long)&pMVar20->data + 1);
                } while (pMVar13 != pMVar20);
              }
              *(int *)((long)sums.data + (long)pMVar25 * 4) = auVar110._0_4_;
              pMVar25 = (Mat *)((long)&pMVar25->data + 1);
              pvVar29 = (void *)((long)pvVar29 + (long)iVar9 * sVar3);
            } while (pMVar25 != pMVar16);
            fVar36 = -3.4028235e+38;
            pMVar13 = (Mat *)0x0;
            do {
              fVar1 = *(float *)((long)sums.data + (long)pMVar13 * 4);
              if (fVar36 <= fVar1) {
                fVar36 = fVar1;
              }
              pMVar13 = (Mat *)((long)&pMVar13->data + 1);
            } while (pMVar16 != pMVar13);
          }
          *(float *)top_blob->data = fVar36;
          in_R11D = 0;
        }
        piVar7 = (int *)CONCAT44(sums.refcount._4_4_,sums.refcount._0_4_);
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + -1;
          UNLOCK();
          if (*piVar7 == 0) {
            pMVar25 = (Mat *)sums.data;
            if (sums.allocator == (Allocator *)0x0) {
              if (sums.data != (void *)0x0) {
                free(sums.data);
              }
            }
            else {
              (*(sums.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        iVar9 = 0;
      }
      else if (((bVar17 | (byte)iVar9 >> 1) & 1) == 0) {
        pMVar25 = (Mat *)0x1;
        Mat::create(top_blob,1,uVar11,sVar2,opt->blob_allocator);
        if (0 < (int)uVar11) {
          iVar9 = bottom_blob->w;
          sVar3 = bottom_blob->elemsize;
          pvVar29 = bottom_blob->data;
          pvVar32 = top_blob->data;
          pMVar25 = (Mat *)0x0;
          do {
            auVar116 = ZEXT816(0xff7fffff);
            if (0 < (int)uVar12) {
              pMVar20 = (Mat *)0x0;
              auVar116 = ZEXT816(0xff7fffff);
              do {
                fVar36 = *(float *)((long)pvVar29 + (long)pMVar20 * 4);
                if (auVar116._0_4_ <= fVar36) {
                  auVar116._0_4_ = fVar36;
                }
                pMVar20 = (Mat *)((long)&pMVar20->data + 1);
              } while (pMVar13 != pMVar20);
            }
            *(int *)((long)pvVar32 + (long)pMVar25 * 4) = auVar116._0_4_;
            pMVar25 = (Mat *)((long)&pMVar25->data + 1);
            pvVar29 = (void *)((long)pvVar29 + (long)iVar9 * sVar3);
          } while (pMVar25 != pMVar16);
          goto LAB_002021f6;
        }
        iVar9 = 0;
        in_R11D = 0;
      }
      else if (((bVar8 | (byte)iVar9) & 1) == 0) {
        pMVar25 = pMVar13;
        Mat::create(top_blob,uVar12,1,sVar2,opt->blob_allocator);
        auVar281 = _DAT_00315150;
        auVar52 = _DAT_00315140;
        auVar54 = _DAT_003150d0;
        uVar21 = top_blob->c * (int)top_blob->cstep;
        if (0 < (int)uVar21) {
          pvVar29 = top_blob->data;
          lVar31 = (ulong)uVar21 - 1;
          auVar55._8_4_ = (int)lVar31;
          auVar55._0_8_ = lVar31;
          auVar55._12_4_ = (int)((ulong)lVar31 >> 0x20);
          uVar22 = 0;
          auVar55 = auVar55 ^ _DAT_003150d0;
          do {
            auVar145._8_4_ = (int)uVar22;
            auVar145._0_8_ = uVar22;
            auVar145._12_4_ = (int)(uVar22 >> 0x20);
            auVar274 = (auVar145 | auVar281) ^ auVar54;
            iVar9 = auVar55._4_4_;
            iVar271 = auVar55._12_4_;
            if ((bool)(~(auVar274._4_4_ == iVar9 && auVar55._0_4_ < auVar274._0_4_ ||
                        iVar9 < auVar274._4_4_) & 1)) {
              *(undefined4 *)((long)pvVar29 + uVar22 * 4) = 0xff7fffff;
            }
            if ((auVar274._12_4_ != iVar271 || auVar274._8_4_ <= auVar55._8_4_) &&
                auVar274._12_4_ <= iVar271) {
              *(undefined4 *)((long)pvVar29 + uVar22 * 4 + 4) = 0xff7fffff;
            }
            auVar274 = (auVar145 | auVar52) ^ auVar54;
            auVar272._0_4_ = -(uint)(auVar55._0_4_ < auVar274._0_4_);
            auVar272._4_4_ = -(uint)(iVar9 < auVar274._4_4_);
            auVar272._8_4_ = -(uint)(auVar55._8_4_ < auVar274._8_4_);
            auVar272._12_4_ = -(uint)(iVar271 < auVar274._12_4_);
            iVar9 = -(uint)(auVar274._4_4_ == iVar9);
            iVar271 = -(uint)(auVar274._12_4_ == iVar271);
            auVar316._4_4_ = iVar9;
            auVar316._0_4_ = iVar9;
            auVar316._8_4_ = iVar271;
            auVar316._12_4_ = iVar271;
            auVar146._4_4_ = auVar272._4_4_;
            auVar146._0_4_ = auVar272._4_4_;
            auVar146._8_4_ = auVar272._12_4_;
            auVar146._12_4_ = auVar272._12_4_;
            auVar147._8_4_ = 0xffffffff;
            auVar147._0_8_ = 0xffffffffffffffff;
            auVar147._12_4_ = 0xffffffff;
            auVar147 = (auVar146 | auVar316 & auVar272) ^ auVar147;
            if ((auVar147 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(undefined4 *)((long)pvVar29 + uVar22 * 4 + 8) = 0xff7fffff;
            }
            pMVar25 = (Mat *)(ulong)auVar147._8_2_;
            if ((auVar147 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(undefined4 *)((long)pvVar29 + uVar22 * 4 + 0xc) = 0xff7fffff;
            }
            uVar22 = uVar22 + 4;
          } while ((uVar21 + 3 & 0xfffffffc) != uVar22);
        }
        if (0 < (int)uVar11) {
          pvVar29 = bottom_blob->data;
          iVar9 = bottom_blob->w;
          sVar3 = bottom_blob->elemsize;
          pvVar32 = top_blob->data;
          pMVar25 = (Mat *)0x0;
          do {
            if (0 < (int)uVar12) {
              pMVar20 = (Mat *)0x0;
              do {
                fVar1 = *(float *)((long)pvVar29 + (long)pMVar20 * 4);
                fVar36 = *(float *)((long)pvVar32 + (long)pMVar20 * 4);
                if (fVar1 <= fVar36) {
                  fVar1 = fVar36;
                }
                *(float *)((long)pvVar32 + (long)pMVar20 * 4) = fVar1;
                pMVar20 = (Mat *)((long)&pMVar20->data + 1);
              } while (pMVar13 != pMVar20);
            }
            pMVar25 = (Mat *)((long)&pMVar25->data + 1);
            pvVar29 = (void *)((long)pvVar29 + (long)iVar9 * sVar3);
          } while (pMVar25 != pMVar16);
        }
LAB_002021f6:
        iVar9 = 0;
        in_R11D = 0;
      }
      else {
        iVar9 = (int)CONCAT71((uint7)(uint3)((uint)iVar9 >> 8),1);
      }
      if ((char)iVar9 != '\0') goto LAB_00202e04;
    }
    else if (iVar10 == 1) {
      iVar10 = bottom_blob->w;
      pMVar25 = (Mat *)0x1;
      Mat::create(top_blob,1,sVar2,opt->blob_allocator);
      if ((long)iVar10 < 1) {
LAB_0020108b:
        fVar36 = -3.4028235e+38;
      }
      else {
        fVar36 = -3.4028235e+38;
        lVar31 = 0;
        do {
          fVar1 = *(float *)((long)bottom_blob->data + lVar31 * 4);
          if (fVar36 <= fVar1) {
            fVar36 = fVar1;
          }
          lVar31 = lVar31 + 1;
        } while (iVar10 != lVar31);
      }
LAB_00201093:
      *(float *)top_blob->data = fVar36;
      in_R11D = 0;
    }
    else {
LAB_00202e04:
      if (iVar10 != 3) goto LAB_0020768a;
      uVar12 = bottom_blob->w;
      lVar31 = (long)(int)uVar12;
      uVar11 = bottom_blob->h;
      uVar22 = (ulong)uVar11;
      uVar21 = bottom_blob->c;
      pMVar16 = (Mat *)(ulong)uVar21;
      uVar24 = uVar11 * uVar12;
      auVar61._8_4_ = 0xffffffff;
      auVar61._0_8_ = 0xffffffffffffffff;
      auVar61._12_4_ = 0xffffffff;
      auVar62._0_8_ = SUB168(auVar61 ^ auVar134,0) << 0x3f;
      auVar62._8_8_ = SUB168(auVar61 ^ auVar134,8) << 0x3f;
      iVar10 = movmskpd(iVar9,auVar62);
      bVar14 = reduce_c ^ 1;
      if (iVar10 == 0 && bVar14 == 0) {
        Mat::create(top_blob,1,1,1,sVar2,opt->blob_allocator);
        sums.cstep = 0;
        sums.data = (void *)0x0;
        sums.refcount._0_4_ = 0;
        sums.refcount._4_4_ = 0;
        sums.elemsize._0_4_ = 0;
        sums.elemsize._4_4_ = 0;
        sums.elempack = 0;
        sums.allocator = (Allocator *)0x0;
        sums.dims = 0;
        sums.w = 0;
        sums.h = 0;
        sums.d = 0;
        sums.c = 0;
        pMVar25 = pMVar16;
        Mat::create(&sums,uVar21,sVar2,opt->workspace_allocator);
        in_R11D = -100;
        if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
          if ((int)uVar21 < 1) {
            fVar36 = -3.4028235e+38;
          }
          else {
            sVar2 = bottom_blob->elemsize;
            sVar3 = bottom_blob->cstep;
            pvVar29 = bottom_blob->data;
            pMVar25 = (Mat *)(ulong)uVar24;
            pMVar13 = (Mat *)0x0;
            do {
              fVar36 = -3.4028235e+38;
              if (0 < (int)uVar24) {
                pMVar20 = (Mat *)0x0;
                fVar36 = -3.4028235e+38;
                do {
                  fVar1 = *(float *)((long)pvVar29 + (long)pMVar20 * 4);
                  if (fVar36 <= fVar1) {
                    fVar36 = fVar1;
                  }
                  pMVar20 = (Mat *)((long)&pMVar20->data + 1);
                } while (pMVar25 != pMVar20);
              }
              *(float *)((long)sums.data + (long)pMVar13 * 4) = fVar36;
              pMVar13 = (Mat *)((long)&pMVar13->data + 1);
              pvVar29 = (void *)((long)pvVar29 + sVar2 * sVar3);
            } while (pMVar13 != pMVar16);
            fVar36 = -3.4028235e+38;
            pMVar13 = (Mat *)0x0;
            do {
              fVar1 = *(float *)((long)sums.data + (long)pMVar13 * 4);
              if (fVar36 <= fVar1) {
                fVar36 = fVar1;
              }
              pMVar13 = (Mat *)((long)&pMVar13->data + 1);
            } while (pMVar16 != pMVar13);
          }
          *(float *)top_blob->data = fVar36;
          in_R11D = 0;
        }
        piVar7 = (int *)CONCAT44(sums.refcount._4_4_,sums.refcount._0_4_);
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + -1;
          UNLOCK();
          if (*piVar7 == 0) {
            pMVar25 = (Mat *)sums.data;
            if (sums.allocator == (Allocator *)0x0) {
              if (sums.data != (void *)0x0) {
                free(sums.data);
              }
            }
            else {
              (*(sums.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        bVar27 = false;
      }
      else if (iVar10 == 0 && reduce_c == false) {
        pMVar25 = (Mat *)0x1;
        Mat::create(top_blob,1,1,uVar21,sVar2,opt->blob_allocator);
        if ((int)uVar21 < 1) goto LAB_002032be;
        pvVar29 = bottom_blob->data;
        sVar2 = bottom_blob->elemsize;
        sVar3 = top_blob->elemsize;
        sVar4 = bottom_blob->cstep;
        sVar5 = top_blob->cstep;
        pMVar25 = (Mat *)top_blob->data;
        pMVar13 = (Mat *)0x0;
        do {
          fVar36 = -3.4028235e+38;
          if (0 < (int)uVar24) {
            uVar22 = 0;
            fVar36 = -3.4028235e+38;
            do {
              fVar1 = *(float *)((long)pvVar29 + uVar22 * 4);
              if (fVar36 <= fVar1) {
                fVar36 = fVar1;
              }
              uVar22 = uVar22 + 1;
            } while (uVar24 != uVar22);
          }
          *(float *)((long)&pMVar25->data + sVar3 * sVar5 * (long)pMVar13) = fVar36;
          pMVar13 = (Mat *)((long)&pMVar13->data + 1);
          pvVar29 = (void *)((long)pvVar29 + sVar2 * sVar4);
        } while (pMVar13 != pMVar16);
LAB_002032b3:
        bVar27 = false;
        in_R11D = 0;
      }
      else {
        pMVar13 = (Mat *)(ulong)uVar12;
        bVar23 = (byte)iVar10 >> 1 | bVar17;
        if (reduce_c == false && (bVar23 & 1) == 0) {
          pMVar25 = (Mat *)0x1;
          Mat::create(top_blob,1,uVar11,uVar21,sVar2,opt->blob_allocator);
          if (0 < (int)uVar21) {
            pvVar29 = bottom_blob->data;
            sVar2 = bottom_blob->elemsize;
            pvVar32 = top_blob->data;
            pMVar25 = (Mat *)(top_blob->elemsize * top_blob->cstep);
            sVar3 = bottom_blob->cstep;
            pMVar20 = (Mat *)0x0;
            do {
              if (0 < (int)uVar11) {
                uVar33 = 0;
                pvVar28 = pvVar29;
                do {
                  auVar122 = ZEXT816(0xff7fffff);
                  if (0 < (int)uVar12) {
                    pMVar30 = (Mat *)0x0;
                    auVar122 = ZEXT816(0xff7fffff);
                    do {
                      fVar36 = *(float *)((long)pvVar28 + (long)pMVar30 * 4);
                      if (auVar122._0_4_ <= fVar36) {
                        auVar122._0_4_ = fVar36;
                      }
                      pMVar30 = (Mat *)((long)&pMVar30->data + 1);
                    } while (pMVar13 != pMVar30);
                  }
                  *(int *)((long)pvVar32 + uVar33 * 4 + (long)pMVar25 * (long)pMVar20) =
                       auVar122._0_4_;
                  uVar33 = uVar33 + 1;
                  pvVar28 = (void *)((long)pvVar28 + lVar31 * 4);
                } while (uVar33 != uVar22);
              }
              pMVar20 = (Mat *)((long)&pMVar20->data + 1);
              pvVar29 = (void *)((long)pvVar29 + sVar2 * sVar3);
            } while (pMVar20 != pMVar16);
            goto LAB_002032b3;
          }
LAB_002032be:
          in_R11D = 0;
        }
        else {
          if ((bVar23 & 1) == 0 && bVar14 == 0) {
            Mat::create(top_blob,1,uVar11,1,sVar2,opt->blob_allocator);
            sums.cstep = 0;
            sums.data = (void *)0x0;
            sums.refcount._0_4_ = 0;
            sums.refcount._4_4_ = 0;
            sums.elemsize._0_4_ = 0;
            sums.elemsize._4_4_ = 0;
            sums.elempack = 0;
            sums.allocator = (Allocator *)0x0;
            sums.dims = 0;
            sums.w = 0;
            sums.h = 0;
            sums.d = 0;
            sums.c = 0;
            pMVar25 = (Mat *)0x1;
            Mat::create(&sums,1,uVar11,uVar21,sVar2,opt->workspace_allocator);
            auVar52 = _DAT_00315150;
            auVar54 = _DAT_00315140;
            auVar134 = _DAT_003150d0;
            in_R11D = -100;
            if ((sums.data != (void *)0x0) &&
               (pMVar25 = (Mat *)(sums.cstep * (long)sums.c), pMVar25 != (Mat *)0x0)) {
              uVar24 = (int)sums.cstep * sums.c;
              if (0 < (int)uVar24) {
                lVar19 = (ulong)uVar24 - 1;
                auVar71._8_4_ = (int)lVar19;
                auVar71._0_8_ = lVar19;
                auVar71._12_4_ = (int)((ulong)lVar19 >> 0x20);
                uVar33 = 0;
                auVar71 = auVar71 ^ _DAT_003150d0;
                do {
                  auVar172._8_4_ = (int)uVar33;
                  auVar172._0_8_ = uVar33;
                  auVar172._12_4_ = (int)(uVar33 >> 0x20);
                  auVar281 = (auVar172 | auVar52) ^ auVar134;
                  iVar10 = auVar71._4_4_;
                  iVar9 = auVar71._12_4_;
                  if ((bool)(~(auVar281._4_4_ == iVar10 && auVar71._0_4_ < auVar281._0_4_ ||
                              iVar10 < auVar281._4_4_) & 1)) {
                    *(undefined4 *)((long)sums.data + uVar33 * 4) = 0xff7fffff;
                  }
                  if ((auVar281._12_4_ != iVar9 || auVar281._8_4_ <= auVar71._8_4_) &&
                      auVar281._12_4_ <= iVar9) {
                    *(undefined4 *)((long)sums.data + uVar33 * 4 + 4) = 0xff7fffff;
                  }
                  auVar281 = (auVar172 | auVar54) ^ auVar134;
                  auVar283._0_4_ = -(uint)(auVar71._0_4_ < auVar281._0_4_);
                  auVar283._4_4_ = -(uint)(iVar10 < auVar281._4_4_);
                  auVar283._8_4_ = -(uint)(auVar71._8_4_ < auVar281._8_4_);
                  auVar283._12_4_ = -(uint)(iVar9 < auVar281._12_4_);
                  iVar10 = -(uint)(auVar281._4_4_ == iVar10);
                  iVar9 = -(uint)(auVar281._12_4_ == iVar9);
                  auVar325._4_4_ = iVar10;
                  auVar325._0_4_ = iVar10;
                  auVar325._8_4_ = iVar9;
                  auVar325._12_4_ = iVar9;
                  auVar173._4_4_ = auVar283._4_4_;
                  auVar173._0_4_ = auVar283._4_4_;
                  auVar173._8_4_ = auVar283._12_4_;
                  auVar173._12_4_ = auVar283._12_4_;
                  auVar174._8_4_ = 0xffffffff;
                  auVar174._0_8_ = 0xffffffffffffffff;
                  auVar174._12_4_ = 0xffffffff;
                  auVar174 = (auVar173 | auVar325 & auVar283) ^ auVar174;
                  if ((auVar174 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    *(undefined4 *)((long)sums.data + uVar33 * 4 + 8) = 0xff7fffff;
                  }
                  pMVar25 = (Mat *)(ulong)auVar174._8_2_;
                  if ((auVar174 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    *(undefined4 *)((long)sums.data + uVar33 * 4 + 0xc) = 0xff7fffff;
                  }
                  uVar33 = uVar33 + 4;
                } while ((uVar24 + 3 & 0xfffffffc) != uVar33);
              }
              if (0 < (int)uVar21) {
                pvVar29 = bottom_blob->data;
                sVar2 = bottom_blob->elemsize;
                pMVar25 = (Mat *)(CONCAT44(sums.elemsize._4_4_,(undefined4)sums.elemsize) *
                                 sums.cstep);
                sVar3 = bottom_blob->cstep;
                pMVar20 = (Mat *)0x0;
                do {
                  if (0 < (int)uVar11) {
                    uVar33 = 0;
                    pvVar32 = pvVar29;
                    do {
                      auVar125 = ZEXT816(0xff7fffff);
                      if (0 < (int)uVar12) {
                        pMVar30 = (Mat *)0x0;
                        auVar125 = ZEXT816(0xff7fffff);
                        do {
                          fVar36 = *(float *)((long)pvVar32 + (long)pMVar30 * 4);
                          if (auVar125._0_4_ <= fVar36) {
                            auVar125._0_4_ = fVar36;
                          }
                          pMVar30 = (Mat *)((long)&pMVar30->data + 1);
                        } while (pMVar13 != pMVar30);
                      }
                      *(int *)((long)sums.data + uVar33 * 4 + (long)pMVar25 * (long)pMVar20) =
                           auVar125._0_4_;
                      uVar33 = uVar33 + 1;
                      pvVar32 = (void *)((long)pvVar32 + lVar31 * 4);
                    } while (uVar33 != uVar22);
                  }
                  pMVar20 = (Mat *)((long)&pMVar20->data + 1);
                  pvVar29 = (void *)((long)pvVar29 + sVar2 * sVar3);
                } while (pMVar20 != pMVar16);
              }
              auVar52 = _DAT_00315150;
              auVar54 = _DAT_00315140;
              auVar134 = _DAT_003150d0;
              uVar12 = top_blob->c * (int)top_blob->cstep;
              if (0 < (int)uVar12) {
                pvVar29 = top_blob->data;
                lVar31 = (ulong)uVar12 - 1;
                auVar72._8_4_ = (int)lVar31;
                auVar72._0_8_ = lVar31;
                auVar72._12_4_ = (int)((ulong)lVar31 >> 0x20);
                uVar33 = 0;
                auVar72 = auVar72 ^ _DAT_003150d0;
                do {
                  auVar175._8_4_ = (int)uVar33;
                  auVar175._0_8_ = uVar33;
                  auVar175._12_4_ = (int)(uVar33 >> 0x20);
                  auVar281 = (auVar175 | auVar52) ^ auVar134;
                  iVar10 = auVar72._4_4_;
                  iVar9 = auVar72._12_4_;
                  if ((bool)(~(auVar281._4_4_ == iVar10 && auVar72._0_4_ < auVar281._0_4_ ||
                              iVar10 < auVar281._4_4_) & 1)) {
                    *(undefined4 *)((long)pvVar29 + uVar33 * 4) = 0xff7fffff;
                  }
                  if ((auVar281._12_4_ != iVar9 || auVar281._8_4_ <= auVar72._8_4_) &&
                      auVar281._12_4_ <= iVar9) {
                    *(undefined4 *)((long)pvVar29 + uVar33 * 4 + 4) = 0xff7fffff;
                  }
                  auVar281 = (auVar175 | auVar54) ^ auVar134;
                  auVar284._0_4_ = -(uint)(auVar72._0_4_ < auVar281._0_4_);
                  auVar284._4_4_ = -(uint)(iVar10 < auVar281._4_4_);
                  auVar284._8_4_ = -(uint)(auVar72._8_4_ < auVar281._8_4_);
                  auVar284._12_4_ = -(uint)(iVar9 < auVar281._12_4_);
                  iVar10 = -(uint)(auVar281._4_4_ == iVar10);
                  iVar9 = -(uint)(auVar281._12_4_ == iVar9);
                  auVar326._4_4_ = iVar10;
                  auVar326._0_4_ = iVar10;
                  auVar326._8_4_ = iVar9;
                  auVar326._12_4_ = iVar9;
                  auVar176._4_4_ = auVar284._4_4_;
                  auVar176._0_4_ = auVar284._4_4_;
                  auVar176._8_4_ = auVar284._12_4_;
                  auVar176._12_4_ = auVar284._12_4_;
                  auVar177._8_4_ = 0xffffffff;
                  auVar177._0_8_ = 0xffffffffffffffff;
                  auVar177._12_4_ = 0xffffffff;
                  auVar177 = (auVar176 | auVar326 & auVar284) ^ auVar177;
                  if ((auVar177 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    *(undefined4 *)((long)pvVar29 + uVar33 * 4 + 8) = 0xff7fffff;
                  }
                  pMVar25 = (Mat *)(ulong)auVar177._8_2_;
                  if ((auVar177 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    *(undefined4 *)((long)pvVar29 + uVar33 * 4 + 0xc) = 0xff7fffff;
                  }
                  uVar33 = uVar33 + 4;
                } while ((uVar12 + 3 & 0xfffffffc) != uVar33);
              }
              if (0 < (int)uVar21) {
                pvVar29 = top_blob->data;
                pMVar25 = (Mat *)0x0;
                pvVar32 = sums.data;
                do {
                  if (0 < (int)uVar11) {
                    uVar33 = 0;
                    do {
                      fVar1 = *(float *)((long)pvVar32 + uVar33 * 4);
                      fVar36 = *(float *)((long)pvVar29 + uVar33 * 4);
                      if (fVar1 <= fVar36) {
                        fVar1 = fVar36;
                      }
                      *(float *)((long)pvVar29 + uVar33 * 4) = fVar1;
                      uVar33 = uVar33 + 1;
                    } while (uVar22 != uVar33);
                  }
                  pMVar25 = (Mat *)((long)&pMVar25->data + 1);
                  pvVar32 = (void *)((long)pvVar32 +
                                    CONCAT44(sums.elemsize._4_4_,(undefined4)sums.elemsize) *
                                    sums.cstep);
                } while (pMVar25 != pMVar16);
              }
              in_R11D = 0;
            }
          }
          else {
            pMVar25 = (Mat *)(ulong)uVar6;
            bVar23 = (byte)iVar10 | bVar8;
            if ((bVar23 & 1) != 0 || bVar14 != 0) {
              if (((bVar17 | bVar8) & 1) == 0 && bVar14 == 0) {
                Mat::create(top_blob,uVar12,uVar11,1,sVar2,opt->blob_allocator);
                auVar52 = _DAT_00315150;
                auVar54 = _DAT_00315140;
                auVar134 = _DAT_003150d0;
                uVar12 = top_blob->c * (int)top_blob->cstep;
                if (0 < (int)uVar12) {
                  pvVar29 = top_blob->data;
                  lVar31 = (ulong)uVar12 - 1;
                  auVar104._8_4_ = (int)lVar31;
                  auVar104._0_8_ = lVar31;
                  auVar104._12_4_ = (int)((ulong)lVar31 >> 0x20);
                  uVar22 = 0;
                  auVar104 = auVar104 ^ _DAT_003150d0;
                  do {
                    auVar253._8_4_ = (int)uVar22;
                    auVar253._0_8_ = uVar22;
                    auVar253._12_4_ = (int)(uVar22 >> 0x20);
                    auVar281 = (auVar253 | auVar52) ^ auVar134;
                    iVar10 = auVar104._4_4_;
                    iVar9 = auVar104._12_4_;
                    if ((bool)(~(auVar281._4_4_ == iVar10 && auVar104._0_4_ < auVar281._0_4_ ||
                                iVar10 < auVar281._4_4_) & 1)) {
                      *(undefined4 *)((long)pvVar29 + uVar22 * 4) = 0xff7fffff;
                    }
                    if ((auVar281._12_4_ != iVar9 || auVar281._8_4_ <= auVar104._8_4_) &&
                        auVar281._12_4_ <= iVar9) {
                      *(undefined4 *)((long)pvVar29 + uVar22 * 4 + 4) = 0xff7fffff;
                    }
                    auVar281 = (auVar253 | auVar54) ^ auVar134;
                    auVar310._0_4_ = -(uint)(auVar104._0_4_ < auVar281._0_4_);
                    auVar310._4_4_ = -(uint)(iVar10 < auVar281._4_4_);
                    auVar310._8_4_ = -(uint)(auVar104._8_4_ < auVar281._8_4_);
                    auVar310._12_4_ = -(uint)(iVar9 < auVar281._12_4_);
                    iVar10 = -(uint)(auVar281._4_4_ == iVar10);
                    iVar9 = -(uint)(auVar281._12_4_ == iVar9);
                    auVar352._4_4_ = iVar10;
                    auVar352._0_4_ = iVar10;
                    auVar352._8_4_ = iVar9;
                    auVar352._12_4_ = iVar9;
                    auVar254._4_4_ = auVar310._4_4_;
                    auVar254._0_4_ = auVar310._4_4_;
                    auVar254._8_4_ = auVar310._12_4_;
                    auVar254._12_4_ = auVar310._12_4_;
                    auVar255._8_4_ = 0xffffffff;
                    auVar255._0_8_ = 0xffffffffffffffff;
                    auVar255._12_4_ = 0xffffffff;
                    auVar255 = (auVar254 | auVar352 & auVar310) ^ auVar255;
                    if ((auVar255 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      *(undefined4 *)((long)pvVar29 + uVar22 * 4 + 8) = 0xff7fffff;
                    }
                    pMVar13 = (Mat *)(ulong)auVar255._8_2_;
                    if ((auVar255 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      *(undefined4 *)((long)pvVar29 + uVar22 * 4 + 0xc) = 0xff7fffff;
                    }
                    uVar22 = uVar22 + 4;
                  } while ((uVar12 + 3 & 0xfffffffc) != uVar22);
                }
                pMVar25 = pMVar13;
                if ((int)uVar21 < 1) goto LAB_002032b3;
                pvVar29 = bottom_blob->data;
                sVar2 = bottom_blob->elemsize;
                pvVar32 = top_blob->data;
                sVar3 = bottom_blob->cstep;
                pMVar25 = (Mat *)(ulong)uVar24;
                pMVar13 = (Mat *)0x0;
                bVar27 = false;
                in_R11D = 0;
                do {
                  if (0 < (int)uVar24) {
                    pMVar20 = (Mat *)0x0;
                    do {
                      fVar1 = *(float *)((long)pvVar29 + (long)pMVar20 * 4);
                      fVar36 = *(float *)((long)pvVar32 + (long)pMVar20 * 4);
                      if (fVar1 <= fVar36) {
                        fVar1 = fVar36;
                      }
                      *(float *)((long)pvVar32 + (long)pMVar20 * 4) = fVar1;
                      pMVar20 = (Mat *)((long)&pMVar20->data + 1);
                    } while (pMVar25 != pMVar20);
                  }
                  pMVar13 = (Mat *)((long)&pMVar13->data + 1);
                  pvVar29 = (void *)((long)pvVar29 + sVar2 * sVar3);
                } while (pMVar13 != pMVar16);
              }
              else {
                bVar27 = true;
                if (reduce_c == false && (bVar23 & 1) == 0) {
                  pMVar25 = pMVar13;
                  Mat::create(top_blob,uVar12,1,uVar21,sVar2,opt->blob_allocator);
                  auVar52 = _DAT_00315150;
                  auVar54 = _DAT_00315140;
                  auVar134 = _DAT_003150d0;
                  uVar24 = top_blob->c * (int)top_blob->cstep;
                  if (0 < (int)uVar24) {
                    pvVar29 = top_blob->data;
                    lVar31 = (ulong)uVar24 - 1;
                    auVar63._8_4_ = (int)lVar31;
                    auVar63._0_8_ = lVar31;
                    auVar63._12_4_ = (int)((ulong)lVar31 >> 0x20);
                    uVar22 = 0;
                    auVar63 = auVar63 ^ _DAT_003150d0;
                    do {
                      auVar163._8_4_ = (int)uVar22;
                      auVar163._0_8_ = uVar22;
                      auVar163._12_4_ = (int)(uVar22 >> 0x20);
                      auVar281 = (auVar163 | auVar52) ^ auVar134;
                      iVar10 = auVar63._4_4_;
                      iVar9 = auVar63._12_4_;
                      if ((bool)(~(auVar281._4_4_ == iVar10 && auVar63._0_4_ < auVar281._0_4_ ||
                                  iVar10 < auVar281._4_4_) & 1)) {
                        *(undefined4 *)((long)pvVar29 + uVar22 * 4) = 0xff7fffff;
                      }
                      if ((auVar281._12_4_ != iVar9 || auVar281._8_4_ <= auVar63._8_4_) &&
                          auVar281._12_4_ <= iVar9) {
                        *(undefined4 *)((long)pvVar29 + uVar22 * 4 + 4) = 0xff7fffff;
                      }
                      auVar281 = (auVar163 | auVar54) ^ auVar134;
                      auVar279._0_4_ = -(uint)(auVar63._0_4_ < auVar281._0_4_);
                      auVar279._4_4_ = -(uint)(iVar10 < auVar281._4_4_);
                      auVar279._8_4_ = -(uint)(auVar63._8_4_ < auVar281._8_4_);
                      auVar279._12_4_ = -(uint)(iVar9 < auVar281._12_4_);
                      iVar10 = -(uint)(auVar281._4_4_ == iVar10);
                      iVar9 = -(uint)(auVar281._12_4_ == iVar9);
                      auVar322._4_4_ = iVar10;
                      auVar322._0_4_ = iVar10;
                      auVar322._8_4_ = iVar9;
                      auVar322._12_4_ = iVar9;
                      auVar164._4_4_ = auVar279._4_4_;
                      auVar164._0_4_ = auVar279._4_4_;
                      auVar164._8_4_ = auVar279._12_4_;
                      auVar164._12_4_ = auVar279._12_4_;
                      auVar165._8_4_ = 0xffffffff;
                      auVar165._0_8_ = 0xffffffffffffffff;
                      auVar165._12_4_ = 0xffffffff;
                      auVar165 = (auVar164 | auVar322 & auVar279) ^ auVar165;
                      if ((auVar165 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        *(undefined4 *)((long)pvVar29 + uVar22 * 4 + 8) = 0xff7fffff;
                      }
                      pMVar25 = (Mat *)(ulong)auVar165._8_2_;
                      if ((auVar165 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        *(undefined4 *)((long)pvVar29 + uVar22 * 4 + 0xc) = 0xff7fffff;
                      }
                      uVar22 = uVar22 + 4;
                    } while ((uVar24 + 3 & 0xfffffffc) != uVar22);
                  }
                  if ((int)uVar21 < 1) goto LAB_002032be;
                  pvVar29 = bottom_blob->data;
                  sVar2 = bottom_blob->elemsize;
                  pbVar18 = (bool *)top_blob->data;
                  pMVar25 = (Mat *)(top_blob->elemsize * top_blob->cstep);
                  sVar3 = bottom_blob->cstep;
                  pMVar20 = (Mat *)0x0;
                  do {
                    if (0 < (int)uVar11) {
                      uVar21 = 0;
                      pvVar32 = pvVar29;
                      do {
                        if (0 < (int)uVar12) {
                          pMVar30 = (Mat *)0x0;
                          do {
                            fVar36 = *(float *)((long)pvVar32 + (long)pMVar30 * 4);
                            if (fVar36 <= *(float *)(pbVar18 + (long)pMVar30 * 4)) {
                              fVar36 = *(float *)(pbVar18 + (long)pMVar30 * 4);
                            }
                            *(float *)(pbVar18 + (long)pMVar30 * 4) = fVar36;
                            pMVar30 = (Mat *)((long)&pMVar30->data + 1);
                          } while (pMVar13 != pMVar30);
                        }
                        uVar21 = uVar21 + 1;
                        pvVar32 = (void *)((long)pvVar32 + (long)(int)uVar12 * 4);
                      } while (uVar21 != uVar11);
                    }
                    pMVar20 = (Mat *)((long)&pMVar20->data + 1);
                    pvVar29 = (void *)((long)pvVar29 + sVar2 * sVar3);
                    pbVar18 = (bool *)((long)&pMVar25->data + (long)pbVar18);
                    bVar27 = false;
                    in_R11D = 0;
                  } while (pMVar20 != pMVar16);
                }
              }
              goto LAB_00207685;
            }
            Mat::create(top_blob,uVar12,1,1,sVar2,opt->blob_allocator);
            sums.cstep = 0;
            sums.data = (void *)0x0;
            sums.refcount._0_4_ = 0;
            sums.refcount._4_4_ = 0;
            sums.elemsize._0_4_ = 0;
            sums.elemsize._4_4_ = 0;
            sums.elempack = 0;
            sums.allocator = (Allocator *)0x0;
            sums.dims = 0;
            sums.w = 0;
            sums.h = 0;
            sums.d = 0;
            sums.c = 0;
            pMVar25 = (Mat *)(ulong)uVar12;
            Mat::create(&sums,uVar12,1,uVar21,sVar2,opt->workspace_allocator);
            auVar52 = _DAT_00315150;
            auVar54 = _DAT_00315140;
            auVar134 = _DAT_003150d0;
            in_R11D = -100;
            if ((sums.data != (void *)0x0) &&
               (pMVar25 = (Mat *)(sums.cstep * (long)sums.c), pMVar25 != (Mat *)0x0)) {
              uVar24 = (int)sums.cstep * sums.c;
              if (0 < (int)uVar24) {
                lVar19 = (ulong)uVar24 - 1;
                auVar92._8_4_ = (int)lVar19;
                auVar92._0_8_ = lVar19;
                auVar92._12_4_ = (int)((ulong)lVar19 >> 0x20);
                uVar22 = 0;
                auVar92 = auVar92 ^ _DAT_003150d0;
                do {
                  auVar217._8_4_ = (int)uVar22;
                  auVar217._0_8_ = uVar22;
                  auVar217._12_4_ = (int)(uVar22 >> 0x20);
                  auVar281 = (auVar217 | auVar52) ^ auVar134;
                  iVar10 = auVar92._4_4_;
                  iVar9 = auVar92._12_4_;
                  if ((bool)(~(auVar281._4_4_ == iVar10 && auVar92._0_4_ < auVar281._0_4_ ||
                              iVar10 < auVar281._4_4_) & 1)) {
                    *(undefined4 *)((long)sums.data + uVar22 * 4) = 0xff7fffff;
                  }
                  if ((auVar281._12_4_ != iVar9 || auVar281._8_4_ <= auVar92._8_4_) &&
                      auVar281._12_4_ <= iVar9) {
                    *(undefined4 *)((long)sums.data + uVar22 * 4 + 4) = 0xff7fffff;
                  }
                  auVar281 = (auVar217 | auVar54) ^ auVar134;
                  auVar298._0_4_ = -(uint)(auVar92._0_4_ < auVar281._0_4_);
                  auVar298._4_4_ = -(uint)(iVar10 < auVar281._4_4_);
                  auVar298._8_4_ = -(uint)(auVar92._8_4_ < auVar281._8_4_);
                  auVar298._12_4_ = -(uint)(iVar9 < auVar281._12_4_);
                  iVar10 = -(uint)(auVar281._4_4_ == iVar10);
                  iVar9 = -(uint)(auVar281._12_4_ == iVar9);
                  auVar340._4_4_ = iVar10;
                  auVar340._0_4_ = iVar10;
                  auVar340._8_4_ = iVar9;
                  auVar340._12_4_ = iVar9;
                  auVar218._4_4_ = auVar298._4_4_;
                  auVar218._0_4_ = auVar298._4_4_;
                  auVar218._8_4_ = auVar298._12_4_;
                  auVar218._12_4_ = auVar298._12_4_;
                  auVar219._8_4_ = 0xffffffff;
                  auVar219._0_8_ = 0xffffffffffffffff;
                  auVar219._12_4_ = 0xffffffff;
                  auVar219 = (auVar218 | auVar340 & auVar298) ^ auVar219;
                  if ((auVar219 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    *(undefined4 *)((long)sums.data + uVar22 * 4 + 8) = 0xff7fffff;
                  }
                  pMVar25 = (Mat *)(ulong)auVar219._8_2_;
                  if ((auVar219 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    *(undefined4 *)((long)sums.data + uVar22 * 4 + 0xc) = 0xff7fffff;
                  }
                  uVar22 = uVar22 + 4;
                } while ((uVar24 + 3 & 0xfffffffc) != uVar22);
              }
              if (0 < (int)uVar21) {
                pvVar29 = bottom_blob->data;
                sVar2 = bottom_blob->elemsize;
                pMVar25 = (Mat *)(CONCAT44(sums.elemsize._4_4_,(undefined4)sums.elemsize) *
                                 sums.cstep);
                sVar3 = bottom_blob->cstep;
                pMVar20 = (Mat *)0x0;
                pvVar32 = sums.data;
                do {
                  if (0 < (int)uVar11) {
                    uVar24 = 0;
                    pvVar28 = pvVar29;
                    do {
                      if (0 < (int)uVar12) {
                        pMVar30 = (Mat *)0x0;
                        do {
                          fVar1 = *(float *)((long)pvVar28 + (long)pMVar30 * 4);
                          fVar36 = *(float *)((long)pvVar32 + (long)pMVar30 * 4);
                          if (fVar1 <= fVar36) {
                            fVar1 = fVar36;
                          }
                          *(float *)((long)pvVar32 + (long)pMVar30 * 4) = fVar1;
                          pMVar30 = (Mat *)((long)&pMVar30->data + 1);
                        } while (pMVar13 != pMVar30);
                      }
                      uVar24 = uVar24 + 1;
                      pvVar28 = (void *)((long)pvVar28 + lVar31 * 4);
                    } while (uVar24 != uVar11);
                  }
                  pMVar20 = (Mat *)((long)&pMVar20->data + 1);
                  pvVar29 = (void *)((long)pvVar29 + sVar2 * sVar3);
                  pvVar32 = (void *)((long)pvVar32 + (long)pMVar25);
                } while (pMVar20 != pMVar16);
              }
              auVar52 = _DAT_00315150;
              auVar54 = _DAT_00315140;
              auVar134 = _DAT_003150d0;
              uVar11 = top_blob->c * (int)top_blob->cstep;
              if (0 < (int)uVar11) {
                pvVar29 = top_blob->data;
                lVar31 = (ulong)uVar11 - 1;
                auVar93._8_4_ = (int)lVar31;
                auVar93._0_8_ = lVar31;
                auVar93._12_4_ = (int)((ulong)lVar31 >> 0x20);
                uVar22 = 0;
                auVar93 = auVar93 ^ _DAT_003150d0;
                do {
                  auVar220._8_4_ = (int)uVar22;
                  auVar220._0_8_ = uVar22;
                  auVar220._12_4_ = (int)(uVar22 >> 0x20);
                  auVar281 = (auVar220 | auVar52) ^ auVar134;
                  iVar10 = auVar93._4_4_;
                  iVar9 = auVar93._12_4_;
                  if ((bool)(~(auVar281._4_4_ == iVar10 && auVar93._0_4_ < auVar281._0_4_ ||
                              iVar10 < auVar281._4_4_) & 1)) {
                    *(undefined4 *)((long)pvVar29 + uVar22 * 4) = 0xff7fffff;
                  }
                  if ((auVar281._12_4_ != iVar9 || auVar281._8_4_ <= auVar93._8_4_) &&
                      auVar281._12_4_ <= iVar9) {
                    *(undefined4 *)((long)pvVar29 + uVar22 * 4 + 4) = 0xff7fffff;
                  }
                  auVar281 = (auVar220 | auVar54) ^ auVar134;
                  auVar299._0_4_ = -(uint)(auVar93._0_4_ < auVar281._0_4_);
                  auVar299._4_4_ = -(uint)(iVar10 < auVar281._4_4_);
                  auVar299._8_4_ = -(uint)(auVar93._8_4_ < auVar281._8_4_);
                  auVar299._12_4_ = -(uint)(iVar9 < auVar281._12_4_);
                  iVar10 = -(uint)(auVar281._4_4_ == iVar10);
                  iVar9 = -(uint)(auVar281._12_4_ == iVar9);
                  auVar341._4_4_ = iVar10;
                  auVar341._0_4_ = iVar10;
                  auVar341._8_4_ = iVar9;
                  auVar341._12_4_ = iVar9;
                  auVar221._4_4_ = auVar299._4_4_;
                  auVar221._0_4_ = auVar299._4_4_;
                  auVar221._8_4_ = auVar299._12_4_;
                  auVar221._12_4_ = auVar299._12_4_;
                  auVar222._8_4_ = 0xffffffff;
                  auVar222._0_8_ = 0xffffffffffffffff;
                  auVar222._12_4_ = 0xffffffff;
                  auVar222 = (auVar221 | auVar341 & auVar299) ^ auVar222;
                  if ((auVar222 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    *(undefined4 *)((long)pvVar29 + uVar22 * 4 + 8) = 0xff7fffff;
                  }
                  pMVar25 = (Mat *)(ulong)auVar222._8_2_;
                  if ((auVar222 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    *(undefined4 *)((long)pvVar29 + uVar22 * 4 + 0xc) = 0xff7fffff;
                  }
                  uVar22 = uVar22 + 4;
                } while ((uVar11 + 3 & 0xfffffffc) != uVar22);
              }
              if (0 < (int)uVar21) {
                pvVar29 = top_blob->data;
                pMVar25 = (Mat *)0x0;
                pvVar32 = sums.data;
                do {
                  if (0 < (int)uVar12) {
                    pMVar20 = (Mat *)0x0;
                    do {
                      fVar1 = *(float *)((long)pvVar32 + (long)pMVar20 * 4);
                      fVar36 = *(float *)((long)pvVar29 + (long)pMVar20 * 4);
                      if (fVar1 <= fVar36) {
                        fVar1 = fVar36;
                      }
                      *(float *)((long)pvVar29 + (long)pMVar20 * 4) = fVar1;
                      pMVar20 = (Mat *)((long)&pMVar20->data + 1);
                    } while (pMVar13 != pMVar20);
                  }
                  pMVar25 = (Mat *)((long)&pMVar25->data + 1);
                  pvVar32 = (void *)((long)pvVar32 +
                                    CONCAT44(sums.elemsize._4_4_,(undefined4)sums.elemsize) *
                                    sums.cstep);
                } while (pMVar25 != pMVar16);
              }
              in_R11D = 0;
            }
          }
          Mat::~Mat(&sums);
        }
        bVar27 = false;
      }
LAB_00207685:
      if (bVar27) goto LAB_0020768a;
    }
LAB_0020768d:
    if (in_R11D != 0) {
      return -100;
    }
    goto joined_r0x00207e45;
  case 5:
    fVar35 = this->coeff;
    sVar2 = bottom_blob->elemsize;
    if (this->keepdims == 0) {
      if (iVar10 == 2) {
        uVar12 = bottom_blob->w;
        pMVar13 = (Mat *)(ulong)uVar12;
        uVar11 = bottom_blob->h;
        pMVar16 = (Mat *)(ulong)uVar11;
        auVar48._8_4_ = 0xffffffff;
        auVar48._0_8_ = 0xffffffffffffffff;
        auVar48._12_4_ = 0xffffffff;
        auVar49._0_8_ = SUB168(auVar48 ^ auVar134,0) << 0x3f;
        auVar49._8_8_ = SUB168(auVar48 ^ auVar134,8) << 0x3f;
        iVar9 = movmskpd(iVar9,auVar49);
        if (iVar9 == 0) {
          Mat::create(top_blob,1,sVar2,opt->blob_allocator);
          sums.cstep = 0;
          sums.data = (void *)0x0;
          sums.refcount._0_4_ = 0;
          sums.refcount._4_4_ = 0;
          sums.elemsize._0_4_ = 0;
          sums.elemsize._4_4_ = 0;
          sums.elempack = 0;
          sums.allocator = (Allocator *)0x0;
          sums.dims = 0;
          sums.w = 0;
          sums.h = 0;
          sums.d = 0;
          sums.c = 0;
          pMVar25 = (Mat *)(ulong)uVar11;
          Mat::create(&sums,uVar11,sVar2,opt->workspace_allocator);
          in_R11D = -100;
          if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
            if ((int)uVar11 < 1) {
              fVar36 = 3.4028235e+38;
            }
            else {
              pvVar29 = bottom_blob->data;
              iVar9 = bottom_blob->w;
              sVar3 = bottom_blob->elemsize;
              pMVar25 = (Mat *)0x0;
              do {
                auVar114 = ZEXT816(0x7f7fffff);
                if (0 < (int)uVar12) {
                  pMVar20 = (Mat *)0x0;
                  auVar114 = ZEXT816(0x7f7fffff);
                  do {
                    fVar36 = *(float *)((long)pvVar29 + (long)pMVar20 * 4);
                    if (fVar36 <= auVar114._0_4_) {
                      auVar114._0_4_ = fVar36;
                    }
                    pMVar20 = (Mat *)((long)&pMVar20->data + 1);
                  } while (pMVar13 != pMVar20);
                }
                *(int *)((long)sums.data + (long)pMVar25 * 4) = auVar114._0_4_;
                pMVar25 = (Mat *)((long)&pMVar25->data + 1);
                pvVar29 = (void *)((long)pvVar29 + (long)iVar9 * sVar3);
              } while (pMVar25 != pMVar16);
              fVar36 = 3.4028235e+38;
              pMVar13 = (Mat *)0x0;
              do {
                fVar1 = *(float *)((long)sums.data + (long)pMVar13 * 4);
                if (fVar1 <= fVar36) {
                  fVar36 = fVar1;
                }
                pMVar13 = (Mat *)((long)&pMVar13->data + 1);
              } while (pMVar16 != pMVar13);
            }
            *(float *)top_blob->data = fVar36;
            in_R11D = 0;
          }
          piVar7 = (int *)CONCAT44(sums.refcount._4_4_,sums.refcount._0_4_);
          if (piVar7 != (int *)0x0) {
            LOCK();
            *piVar7 = *piVar7 + -1;
            UNLOCK();
            if (*piVar7 == 0) {
              pMVar25 = (Mat *)sums.data;
              if (sums.allocator == (Allocator *)0x0) {
                if (sums.data != (void *)0x0) {
                  free(sums.data);
                }
              }
              else {
                (*(sums.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          iVar9 = 0;
        }
        else if (((bVar17 | (byte)iVar9 >> 1) & 1) == 0) {
          pMVar25 = pMVar16;
          Mat::create(top_blob,uVar11,sVar2,opt->blob_allocator);
          if (0 < (int)uVar11) {
            iVar9 = bottom_blob->w;
            sVar3 = bottom_blob->elemsize;
            pvVar29 = bottom_blob->data;
            pvVar32 = top_blob->data;
            pMVar25 = (Mat *)0x0;
            do {
              auVar120 = ZEXT816(0x7f7fffff);
              if (0 < (int)uVar12) {
                pMVar20 = (Mat *)0x0;
                auVar120 = ZEXT816(0x7f7fffff);
                do {
                  fVar36 = *(float *)((long)pvVar29 + (long)pMVar20 * 4);
                  if (fVar36 <= auVar120._0_4_) {
                    auVar120._0_4_ = fVar36;
                  }
                  pMVar20 = (Mat *)((long)&pMVar20->data + 1);
                } while (pMVar13 != pMVar20);
              }
              *(int *)((long)pvVar32 + (long)pMVar25 * 4) = auVar120._0_4_;
              pMVar25 = (Mat *)((long)&pMVar25->data + 1);
              pvVar29 = (void *)((long)pvVar29 + (long)iVar9 * sVar3);
            } while (pMVar25 != pMVar16);
            goto LAB_002029da;
          }
          iVar9 = 0;
          in_R11D = 0;
        }
        else if (((bVar8 | (byte)iVar9) & 1) == 0) {
          pMVar25 = pMVar13;
          Mat::create(top_blob,uVar12,sVar2,opt->blob_allocator);
          auVar281 = _DAT_00315150;
          auVar52 = _DAT_00315140;
          auVar54 = _DAT_003150d0;
          uVar21 = top_blob->c * (int)top_blob->cstep;
          if (0 < (int)uVar21) {
            pvVar29 = top_blob->data;
            lVar31 = (ulong)uVar21 - 1;
            auVar59._8_4_ = (int)lVar31;
            auVar59._0_8_ = lVar31;
            auVar59._12_4_ = (int)((ulong)lVar31 >> 0x20);
            uVar22 = 0;
            auVar59 = auVar59 ^ _DAT_003150d0;
            do {
              auVar157._8_4_ = (int)uVar22;
              auVar157._0_8_ = uVar22;
              auVar157._12_4_ = (int)(uVar22 >> 0x20);
              auVar274 = (auVar157 | auVar281) ^ auVar54;
              iVar9 = auVar59._4_4_;
              iVar271 = auVar59._12_4_;
              if ((bool)(~(auVar274._4_4_ == iVar9 && auVar59._0_4_ < auVar274._0_4_ ||
                          iVar9 < auVar274._4_4_) & 1)) {
                *(undefined4 *)((long)pvVar29 + uVar22 * 4) = 0x7f7fffff;
              }
              if ((auVar274._12_4_ != iVar271 || auVar274._8_4_ <= auVar59._8_4_) &&
                  auVar274._12_4_ <= iVar271) {
                *(undefined4 *)((long)pvVar29 + uVar22 * 4 + 4) = 0x7f7fffff;
              }
              auVar274 = (auVar157 | auVar52) ^ auVar54;
              auVar277._0_4_ = -(uint)(auVar59._0_4_ < auVar274._0_4_);
              auVar277._4_4_ = -(uint)(iVar9 < auVar274._4_4_);
              auVar277._8_4_ = -(uint)(auVar59._8_4_ < auVar274._8_4_);
              auVar277._12_4_ = -(uint)(iVar271 < auVar274._12_4_);
              iVar9 = -(uint)(auVar274._4_4_ == iVar9);
              iVar271 = -(uint)(auVar274._12_4_ == iVar271);
              auVar320._4_4_ = iVar9;
              auVar320._0_4_ = iVar9;
              auVar320._8_4_ = iVar271;
              auVar320._12_4_ = iVar271;
              auVar158._4_4_ = auVar277._4_4_;
              auVar158._0_4_ = auVar277._4_4_;
              auVar158._8_4_ = auVar277._12_4_;
              auVar158._12_4_ = auVar277._12_4_;
              auVar159._8_4_ = 0xffffffff;
              auVar159._0_8_ = 0xffffffffffffffff;
              auVar159._12_4_ = 0xffffffff;
              auVar159 = (auVar158 | auVar320 & auVar277) ^ auVar159;
              if ((auVar159 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined4 *)((long)pvVar29 + uVar22 * 4 + 8) = 0x7f7fffff;
              }
              pMVar25 = (Mat *)(ulong)auVar159._8_2_;
              if ((auVar159 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined4 *)((long)pvVar29 + uVar22 * 4 + 0xc) = 0x7f7fffff;
              }
              uVar22 = uVar22 + 4;
            } while ((uVar21 + 3 & 0xfffffffc) != uVar22);
          }
          if (0 < (int)uVar11) {
            pvVar29 = bottom_blob->data;
            iVar9 = bottom_blob->w;
            sVar3 = bottom_blob->elemsize;
            pvVar32 = top_blob->data;
            pMVar25 = (Mat *)0x0;
            do {
              if (0 < (int)uVar12) {
                pMVar20 = (Mat *)0x0;
                do {
                  fVar1 = *(float *)((long)pvVar29 + (long)pMVar20 * 4);
                  fVar36 = *(float *)((long)pvVar32 + (long)pMVar20 * 4);
                  if (fVar36 <= fVar1) {
                    fVar1 = fVar36;
                  }
                  *(float *)((long)pvVar32 + (long)pMVar20 * 4) = fVar1;
                  pMVar20 = (Mat *)((long)&pMVar20->data + 1);
                } while (pMVar13 != pMVar20);
              }
              pMVar25 = (Mat *)((long)&pMVar25->data + 1);
              pvVar29 = (void *)((long)pvVar29 + (long)iVar9 * sVar3);
            } while (pMVar25 != pMVar16);
          }
LAB_002029da:
          iVar9 = 0;
          in_R11D = 0;
        }
        else {
          iVar9 = (int)CONCAT71((uint7)(uint3)((uint)iVar9 >> 8),1);
        }
        if ((char)iVar9 == '\0') break;
      }
      else if (iVar10 == 1) {
        iVar10 = bottom_blob->w;
        pMVar25 = (Mat *)0x1;
        Mat::create(top_blob,1,sVar2,opt->blob_allocator);
        if ((long)iVar10 < 1) goto LAB_002010fc;
        fVar36 = 3.4028235e+38;
        lVar31 = 0;
        do {
          fVar1 = *(float *)((long)bottom_blob->data + lVar31 * 4);
          if (fVar1 <= fVar36) {
            fVar36 = fVar1;
          }
          lVar31 = lVar31 + 1;
        } while (iVar10 != lVar31);
        goto LAB_00201104;
      }
      if (iVar10 == 3) {
        uVar12 = bottom_blob->w;
        lVar31 = (long)(int)uVar12;
        uVar11 = bottom_blob->h;
        uVar22 = (ulong)uVar11;
        uVar21 = bottom_blob->c;
        pMVar16 = (Mat *)(ulong)uVar21;
        uVar24 = uVar11 * uVar12;
        auVar80._8_4_ = 0xffffffff;
        auVar80._0_8_ = 0xffffffffffffffff;
        auVar80._12_4_ = 0xffffffff;
        auVar81._0_8_ = SUB168(auVar80 ^ auVar134,0) << 0x3f;
        auVar81._8_8_ = SUB168(auVar80 ^ auVar134,8) << 0x3f;
        iVar10 = movmskpd(iVar9,auVar81);
        bVar14 = reduce_c ^ 1;
        pMVar25 = pMVar16;
        if (iVar10 == 0 && bVar14 == 0) {
          Mat::create(top_blob,1,sVar2,opt->blob_allocator);
          sums.cstep = 0;
          sums.data = (void *)0x0;
          sums.refcount._0_4_ = 0;
          sums.refcount._4_4_ = 0;
          sums.elemsize._0_4_ = 0;
          sums.elemsize._4_4_ = 0;
          sums.elempack = 0;
          sums.allocator = (Allocator *)0x0;
          sums.dims = 0;
          sums.w = 0;
          sums.h = 0;
          sums.d = 0;
          sums.c = 0;
          Mat::create(&sums,uVar21,sVar2,opt->workspace_allocator);
          in_R11D = -100;
          if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
            if ((int)uVar21 < 1) {
              fVar36 = 3.4028235e+38;
            }
            else {
              sVar2 = bottom_blob->elemsize;
              sVar3 = bottom_blob->cstep;
              pvVar29 = bottom_blob->data;
              pMVar25 = (Mat *)(ulong)uVar24;
              pMVar13 = (Mat *)0x0;
              do {
                fVar36 = 3.4028235e+38;
                if (0 < (int)uVar24) {
                  pMVar20 = (Mat *)0x0;
                  fVar36 = 3.4028235e+38;
                  do {
                    fVar1 = *(float *)((long)pvVar29 + (long)pMVar20 * 4);
                    if (fVar1 <= fVar36) {
                      fVar36 = fVar1;
                    }
                    pMVar20 = (Mat *)((long)&pMVar20->data + 1);
                  } while (pMVar25 != pMVar20);
                }
                *(float *)((long)sums.data + (long)pMVar13 * 4) = fVar36;
                pMVar13 = (Mat *)((long)&pMVar13->data + 1);
                pvVar29 = (void *)((long)pvVar29 + sVar2 * sVar3);
              } while (pMVar13 != pMVar16);
              fVar36 = 3.4028235e+38;
              pMVar13 = (Mat *)0x0;
              do {
                fVar1 = *(float *)((long)sums.data + (long)pMVar13 * 4);
                if (fVar1 <= fVar36) {
                  fVar36 = fVar1;
                }
                pMVar13 = (Mat *)((long)&pMVar13->data + 1);
              } while (pMVar16 != pMVar13);
            }
            *(float *)top_blob->data = fVar36;
            in_R11D = 0;
          }
          piVar7 = (int *)CONCAT44(sums.refcount._4_4_,sums.refcount._0_4_);
          if (piVar7 != (int *)0x0) {
            LOCK();
            *piVar7 = *piVar7 + -1;
            UNLOCK();
            if (*piVar7 == 0) {
              pMVar25 = (Mat *)sums.data;
              if (sums.allocator == (Allocator *)0x0) {
                if (sums.data != (void *)0x0) {
                  free(sums.data);
                }
              }
              else {
                (*(sums.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          uVar26 = false;
          goto joined_r0x00209531;
        }
        if (iVar10 == 0 && reduce_c == false) {
          Mat::create(top_blob,uVar21,sVar2,opt->blob_allocator);
          if ((int)uVar21 < 1) goto LAB_00209522;
          pvVar29 = bottom_blob->data;
          sVar2 = bottom_blob->elemsize;
          sVar3 = bottom_blob->cstep;
          pvVar32 = top_blob->data;
          pMVar25 = (Mat *)(ulong)uVar24;
          pMVar13 = (Mat *)0x0;
          do {
            fVar36 = 3.4028235e+38;
            if (0 < (int)uVar24) {
              pMVar20 = (Mat *)0x0;
              fVar36 = 3.4028235e+38;
              do {
                fVar1 = *(float *)((long)pvVar29 + (long)pMVar20 * 4);
                if (fVar1 <= fVar36) {
                  fVar36 = fVar1;
                }
                pMVar20 = (Mat *)((long)&pMVar20->data + 1);
              } while (pMVar25 != pMVar20);
            }
            *(float *)((long)pvVar32 + (long)pMVar13 * 4) = fVar36;
            pMVar13 = (Mat *)((long)&pMVar13->data + 1);
            pvVar29 = (void *)((long)pvVar29 + sVar2 * sVar3);
          } while (pMVar13 != pMVar16);
LAB_00205af3:
          uVar26 = false;
          in_R11D = 0;
        }
        else {
          pMVar13 = (Mat *)(ulong)uVar12;
          bVar23 = (byte)iVar10 >> 1 | bVar17;
          if (reduce_c == false && (bVar23 & 1) == 0) {
            pMVar25 = (Mat *)(ulong)uVar11;
            Mat::create(top_blob,uVar11,uVar21,sVar2,opt->blob_allocator);
            if (0 < (int)uVar21) {
              pvVar29 = bottom_blob->data;
              sVar2 = bottom_blob->elemsize;
              pvVar32 = top_blob->data;
              pMVar25 = (Mat *)((long)top_blob->w * top_blob->elemsize);
              sVar3 = bottom_blob->cstep;
              pMVar20 = (Mat *)0x0;
              do {
                if (0 < (int)uVar11) {
                  uVar33 = 0;
                  pvVar28 = pvVar29;
                  do {
                    auVar129 = ZEXT816(0x7f7fffff);
                    if (0 < (int)uVar12) {
                      pMVar30 = (Mat *)0x0;
                      auVar129 = ZEXT816(0x7f7fffff);
                      do {
                        fVar36 = *(float *)((long)pvVar28 + (long)pMVar30 * 4);
                        if (fVar36 <= auVar129._0_4_) {
                          auVar129._0_4_ = fVar36;
                        }
                        pMVar30 = (Mat *)((long)&pMVar30->data + 1);
                      } while (pMVar13 != pMVar30);
                    }
                    *(int *)((long)pvVar32 + uVar33 * 4 + (long)pMVar25 * (long)pMVar20) =
                         auVar129._0_4_;
                    uVar33 = uVar33 + 1;
                    pvVar28 = (void *)((long)pvVar28 + lVar31 * 4);
                  } while (uVar33 != uVar22);
                }
                pMVar20 = (Mat *)((long)&pMVar20->data + 1);
                pvVar29 = (void *)((long)pvVar29 + sVar2 * sVar3);
              } while (pMVar20 != pMVar16);
              goto LAB_00205af3;
            }
LAB_00209522:
            in_R11D = 0;
          }
          else {
            if ((bVar23 & 1) != 0 || bVar14 != 0) {
              pMVar25 = (Mat *)(ulong)uVar6;
              bVar23 = (byte)iVar10 | bVar8;
              if ((bVar23 & 1) == 0 && bVar14 == 0) {
                Mat::create(top_blob,uVar12,sVar2,opt->blob_allocator);
                sums.cstep = 0;
                sums.data = (void *)0x0;
                sums.refcount._0_4_ = 0;
                sums.refcount._4_4_ = 0;
                sums.elemsize._0_4_ = 0;
                sums.elemsize._4_4_ = 0;
                sums.elempack = 0;
                sums.allocator = (Allocator *)0x0;
                sums.dims = 0;
                sums.w = 0;
                sums.h = 0;
                sums.d = 0;
                sums.c = 0;
                pMVar25 = (Mat *)(ulong)uVar12;
                Mat::create(&sums,uVar12,1,uVar21,sVar2,opt->workspace_allocator);
                auVar52 = _DAT_00315150;
                auVar54 = _DAT_00315140;
                auVar134 = _DAT_003150d0;
                in_R11D = -100;
                if ((sums.data != (void *)0x0) &&
                   (pMVar25 = (Mat *)(sums.cstep * (long)sums.c), pMVar25 != (Mat *)0x0)) {
                  uVar24 = (int)sums.cstep * sums.c;
                  if (0 < (int)uVar24) {
                    lVar19 = (ulong)uVar24 - 1;
                    auVar100._8_4_ = (int)lVar19;
                    auVar100._0_8_ = lVar19;
                    auVar100._12_4_ = (int)((ulong)lVar19 >> 0x20);
                    uVar22 = 0;
                    auVar100 = auVar100 ^ _DAT_003150d0;
                    do {
                      auVar241._8_4_ = (int)uVar22;
                      auVar241._0_8_ = uVar22;
                      auVar241._12_4_ = (int)(uVar22 >> 0x20);
                      auVar281 = (auVar241 | auVar52) ^ auVar134;
                      iVar10 = auVar100._4_4_;
                      iVar9 = auVar100._12_4_;
                      if ((bool)(~(auVar281._4_4_ == iVar10 && auVar100._0_4_ < auVar281._0_4_ ||
                                  iVar10 < auVar281._4_4_) & 1)) {
                        *(undefined4 *)((long)sums.data + uVar22 * 4) = 0x7f7fffff;
                      }
                      if ((auVar281._12_4_ != iVar9 || auVar281._8_4_ <= auVar100._8_4_) &&
                          auVar281._12_4_ <= iVar9) {
                        *(undefined4 *)((long)sums.data + uVar22 * 4 + 4) = 0x7f7fffff;
                      }
                      auVar281 = (auVar241 | auVar54) ^ auVar134;
                      auVar306._0_4_ = -(uint)(auVar100._0_4_ < auVar281._0_4_);
                      auVar306._4_4_ = -(uint)(iVar10 < auVar281._4_4_);
                      auVar306._8_4_ = -(uint)(auVar100._8_4_ < auVar281._8_4_);
                      auVar306._12_4_ = -(uint)(iVar9 < auVar281._12_4_);
                      iVar10 = -(uint)(auVar281._4_4_ == iVar10);
                      iVar9 = -(uint)(auVar281._12_4_ == iVar9);
                      auVar348._4_4_ = iVar10;
                      auVar348._0_4_ = iVar10;
                      auVar348._8_4_ = iVar9;
                      auVar348._12_4_ = iVar9;
                      auVar242._4_4_ = auVar306._4_4_;
                      auVar242._0_4_ = auVar306._4_4_;
                      auVar242._8_4_ = auVar306._12_4_;
                      auVar242._12_4_ = auVar306._12_4_;
                      auVar243._8_4_ = 0xffffffff;
                      auVar243._0_8_ = 0xffffffffffffffff;
                      auVar243._12_4_ = 0xffffffff;
                      auVar243 = (auVar242 | auVar348 & auVar306) ^ auVar243;
                      if ((auVar243 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        *(undefined4 *)((long)sums.data + uVar22 * 4 + 8) = 0x7f7fffff;
                      }
                      pMVar25 = (Mat *)(ulong)auVar243._8_2_;
                      if ((auVar243 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        *(undefined4 *)((long)sums.data + uVar22 * 4 + 0xc) = 0x7f7fffff;
                      }
                      uVar22 = uVar22 + 4;
                    } while ((uVar24 + 3 & 0xfffffffc) != uVar22);
                  }
                  if (0 < (int)uVar21) {
                    pvVar29 = bottom_blob->data;
                    sVar2 = bottom_blob->elemsize;
                    pMVar25 = (Mat *)(CONCAT44(sums.elemsize._4_4_,(undefined4)sums.elemsize) *
                                     sums.cstep);
                    sVar3 = bottom_blob->cstep;
                    pMVar20 = (Mat *)0x0;
                    pvVar32 = sums.data;
                    do {
                      if (0 < (int)uVar11) {
                        uVar24 = 0;
                        pvVar28 = pvVar29;
                        do {
                          if (0 < (int)uVar12) {
                            pMVar30 = (Mat *)0x0;
                            do {
                              fVar1 = *(float *)((long)pvVar28 + (long)pMVar30 * 4);
                              fVar36 = *(float *)((long)pvVar32 + (long)pMVar30 * 4);
                              if (fVar36 <= fVar1) {
                                fVar1 = fVar36;
                              }
                              *(float *)((long)pvVar32 + (long)pMVar30 * 4) = fVar1;
                              pMVar30 = (Mat *)((long)&pMVar30->data + 1);
                            } while (pMVar13 != pMVar30);
                          }
                          uVar24 = uVar24 + 1;
                          pvVar28 = (void *)((long)pvVar28 + lVar31 * 4);
                        } while (uVar24 != uVar11);
                      }
                      pMVar20 = (Mat *)((long)&pMVar20->data + 1);
                      pvVar29 = (void *)((long)pvVar29 + sVar2 * sVar3);
                      pvVar32 = (void *)((long)pvVar32 + (long)pMVar25);
                    } while (pMVar20 != pMVar16);
                  }
                  auVar52 = _DAT_00315150;
                  auVar54 = _DAT_00315140;
                  auVar134 = _DAT_003150d0;
                  uVar11 = top_blob->c * (int)top_blob->cstep;
                  if (0 < (int)uVar11) {
                    pvVar29 = top_blob->data;
                    lVar31 = (ulong)uVar11 - 1;
                    auVar101._8_4_ = (int)lVar31;
                    auVar101._0_8_ = lVar31;
                    auVar101._12_4_ = (int)((ulong)lVar31 >> 0x20);
                    uVar22 = 0;
                    auVar101 = auVar101 ^ _DAT_003150d0;
                    do {
                      auVar244._8_4_ = (int)uVar22;
                      auVar244._0_8_ = uVar22;
                      auVar244._12_4_ = (int)(uVar22 >> 0x20);
                      auVar281 = (auVar244 | auVar52) ^ auVar134;
                      iVar10 = auVar101._4_4_;
                      iVar9 = auVar101._12_4_;
                      if ((bool)(~(auVar281._4_4_ == iVar10 && auVar101._0_4_ < auVar281._0_4_ ||
                                  iVar10 < auVar281._4_4_) & 1)) {
                        *(undefined4 *)((long)pvVar29 + uVar22 * 4) = 0x7f7fffff;
                      }
                      if ((auVar281._12_4_ != iVar9 || auVar281._8_4_ <= auVar101._8_4_) &&
                          auVar281._12_4_ <= iVar9) {
                        *(undefined4 *)((long)pvVar29 + uVar22 * 4 + 4) = 0x7f7fffff;
                      }
                      auVar281 = (auVar244 | auVar54) ^ auVar134;
                      auVar307._0_4_ = -(uint)(auVar101._0_4_ < auVar281._0_4_);
                      auVar307._4_4_ = -(uint)(iVar10 < auVar281._4_4_);
                      auVar307._8_4_ = -(uint)(auVar101._8_4_ < auVar281._8_4_);
                      auVar307._12_4_ = -(uint)(iVar9 < auVar281._12_4_);
                      iVar10 = -(uint)(auVar281._4_4_ == iVar10);
                      iVar9 = -(uint)(auVar281._12_4_ == iVar9);
                      auVar349._4_4_ = iVar10;
                      auVar349._0_4_ = iVar10;
                      auVar349._8_4_ = iVar9;
                      auVar349._12_4_ = iVar9;
                      auVar245._4_4_ = auVar307._4_4_;
                      auVar245._0_4_ = auVar307._4_4_;
                      auVar245._8_4_ = auVar307._12_4_;
                      auVar245._12_4_ = auVar307._12_4_;
                      auVar246._8_4_ = 0xffffffff;
                      auVar246._0_8_ = 0xffffffffffffffff;
                      auVar246._12_4_ = 0xffffffff;
                      auVar246 = (auVar245 | auVar349 & auVar307) ^ auVar246;
                      if ((auVar246 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        *(undefined4 *)((long)pvVar29 + uVar22 * 4 + 8) = 0x7f7fffff;
                      }
                      pMVar25 = (Mat *)(ulong)auVar246._8_2_;
                      if ((auVar246 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        *(undefined4 *)((long)pvVar29 + uVar22 * 4 + 0xc) = 0x7f7fffff;
                      }
                      uVar22 = uVar22 + 4;
                    } while ((uVar11 + 3 & 0xfffffffc) != uVar22);
                  }
                  if (0 < (int)uVar21) {
                    pvVar29 = top_blob->data;
                    pMVar25 = (Mat *)0x0;
                    pvVar32 = sums.data;
                    do {
                      if (0 < (int)uVar12) {
                        pMVar20 = (Mat *)0x0;
                        do {
                          fVar1 = *(float *)((long)pvVar32 + (long)pMVar20 * 4);
                          fVar36 = *(float *)((long)pvVar29 + (long)pMVar20 * 4);
                          if (fVar36 <= fVar1) {
                            fVar1 = fVar36;
                          }
                          *(float *)((long)pvVar29 + (long)pMVar20 * 4) = fVar1;
                          pMVar20 = (Mat *)((long)&pMVar20->data + 1);
                        } while (pMVar13 != pMVar20);
                      }
                      pMVar25 = (Mat *)((long)&pMVar25->data + 1);
                      pvVar32 = (void *)((long)pvVar32 +
                                        CONCAT44(sums.elemsize._4_4_,(undefined4)sums.elemsize) *
                                        sums.cstep);
                    } while (pMVar25 != pMVar16);
                  }
                  in_R11D = 0;
                }
                Mat::~Mat(&sums);
                uVar26 = false;
              }
              else if (((bVar17 | bVar8) & 1) == 0 && bVar14 == 0) {
                Mat::create(top_blob,uVar12,uVar11,sVar2,opt->blob_allocator);
                auVar52 = _DAT_00315150;
                auVar54 = _DAT_00315140;
                auVar134 = _DAT_003150d0;
                uVar12 = top_blob->c * (int)top_blob->cstep;
                if (0 < (int)uVar12) {
                  pvVar29 = top_blob->data;
                  lVar31 = (ulong)uVar12 - 1;
                  auVar108._8_4_ = (int)lVar31;
                  auVar108._0_8_ = lVar31;
                  auVar108._12_4_ = (int)((ulong)lVar31 >> 0x20);
                  uVar22 = 0;
                  auVar108 = auVar108 ^ _DAT_003150d0;
                  do {
                    auVar265._8_4_ = (int)uVar22;
                    auVar265._0_8_ = uVar22;
                    auVar265._12_4_ = (int)(uVar22 >> 0x20);
                    auVar281 = (auVar265 | auVar52) ^ auVar134;
                    iVar10 = auVar108._4_4_;
                    iVar9 = auVar108._12_4_;
                    if ((bool)(~(auVar281._4_4_ == iVar10 && auVar108._0_4_ < auVar281._0_4_ ||
                                iVar10 < auVar281._4_4_) & 1)) {
                      *(undefined4 *)((long)pvVar29 + uVar22 * 4) = 0x7f7fffff;
                    }
                    if ((auVar281._12_4_ != iVar9 || auVar281._8_4_ <= auVar108._8_4_) &&
                        auVar281._12_4_ <= iVar9) {
                      *(undefined4 *)((long)pvVar29 + uVar22 * 4 + 4) = 0x7f7fffff;
                    }
                    auVar281 = (auVar265 | auVar54) ^ auVar134;
                    auVar314._0_4_ = -(uint)(auVar108._0_4_ < auVar281._0_4_);
                    auVar314._4_4_ = -(uint)(iVar10 < auVar281._4_4_);
                    auVar314._8_4_ = -(uint)(auVar108._8_4_ < auVar281._8_4_);
                    auVar314._12_4_ = -(uint)(iVar9 < auVar281._12_4_);
                    iVar10 = -(uint)(auVar281._4_4_ == iVar10);
                    iVar9 = -(uint)(auVar281._12_4_ == iVar9);
                    auVar356._4_4_ = iVar10;
                    auVar356._0_4_ = iVar10;
                    auVar356._8_4_ = iVar9;
                    auVar356._12_4_ = iVar9;
                    auVar266._4_4_ = auVar314._4_4_;
                    auVar266._0_4_ = auVar314._4_4_;
                    auVar266._8_4_ = auVar314._12_4_;
                    auVar266._12_4_ = auVar314._12_4_;
                    auVar267._8_4_ = 0xffffffff;
                    auVar267._0_8_ = 0xffffffffffffffff;
                    auVar267._12_4_ = 0xffffffff;
                    auVar267 = (auVar266 | auVar356 & auVar314) ^ auVar267;
                    if ((auVar267 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      *(undefined4 *)((long)pvVar29 + uVar22 * 4 + 8) = 0x7f7fffff;
                    }
                    pMVar13 = (Mat *)(ulong)auVar267._8_2_;
                    if ((auVar267 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      *(undefined4 *)((long)pvVar29 + uVar22 * 4 + 0xc) = 0x7f7fffff;
                    }
                    uVar22 = uVar22 + 4;
                  } while ((uVar12 + 3 & 0xfffffffc) != uVar22);
                }
                pMVar25 = pMVar13;
                if ((int)uVar21 < 1) goto LAB_00209522;
                pvVar29 = bottom_blob->data;
                sVar2 = bottom_blob->elemsize;
                pvVar32 = top_blob->data;
                sVar3 = bottom_blob->cstep;
                pMVar25 = (Mat *)(ulong)uVar24;
                pMVar13 = (Mat *)0x0;
                in_R11D = 0;
                do {
                  if (0 < (int)uVar24) {
                    pMVar20 = (Mat *)0x0;
                    do {
                      fVar1 = *(float *)((long)pvVar29 + (long)pMVar20 * 4);
                      fVar36 = *(float *)((long)pvVar32 + (long)pMVar20 * 4);
                      if (fVar36 <= fVar1) {
                        fVar1 = fVar36;
                      }
                      *(float *)((long)pvVar32 + (long)pMVar20 * 4) = fVar1;
                      pMVar20 = (Mat *)((long)&pMVar20->data + 1);
                    } while (pMVar25 != pMVar20);
                  }
                  pMVar13 = (Mat *)((long)&pMVar13->data + 1);
                  pvVar29 = (void *)((long)pvVar29 + sVar2 * sVar3);
                  uVar26 = false;
                } while (pMVar13 != pMVar16);
              }
              else {
                uVar26 = true;
                if (reduce_c == false && (bVar23 & 1) == 0) {
                  pMVar25 = pMVar13;
                  Mat::create(top_blob,uVar12,uVar21,sVar2,opt->blob_allocator);
                  auVar52 = _DAT_00315150;
                  auVar54 = _DAT_00315140;
                  auVar134 = _DAT_003150d0;
                  uVar24 = top_blob->c * (int)top_blob->cstep;
                  if (0 < (int)uVar24) {
                    pvVar29 = top_blob->data;
                    lVar31 = (ulong)uVar24 - 1;
                    auVar82._8_4_ = (int)lVar31;
                    auVar82._0_8_ = lVar31;
                    auVar82._12_4_ = (int)((ulong)lVar31 >> 0x20);
                    uVar22 = 0;
                    auVar82 = auVar82 ^ _DAT_003150d0;
                    do {
                      auVar193._8_4_ = (int)uVar22;
                      auVar193._0_8_ = uVar22;
                      auVar193._12_4_ = (int)(uVar22 >> 0x20);
                      auVar281 = (auVar193 | auVar52) ^ auVar134;
                      iVar10 = auVar82._4_4_;
                      iVar9 = auVar82._12_4_;
                      if ((bool)(~(auVar281._4_4_ == iVar10 && auVar82._0_4_ < auVar281._0_4_ ||
                                  iVar10 < auVar281._4_4_) & 1)) {
                        *(undefined4 *)((long)pvVar29 + uVar22 * 4) = 0x7f7fffff;
                      }
                      if ((auVar281._12_4_ != iVar9 || auVar281._8_4_ <= auVar82._8_4_) &&
                          auVar281._12_4_ <= iVar9) {
                        *(undefined4 *)((long)pvVar29 + uVar22 * 4 + 4) = 0x7f7fffff;
                      }
                      auVar281 = (auVar193 | auVar54) ^ auVar134;
                      auVar290._0_4_ = -(uint)(auVar82._0_4_ < auVar281._0_4_);
                      auVar290._4_4_ = -(uint)(iVar10 < auVar281._4_4_);
                      auVar290._8_4_ = -(uint)(auVar82._8_4_ < auVar281._8_4_);
                      auVar290._12_4_ = -(uint)(iVar9 < auVar281._12_4_);
                      iVar10 = -(uint)(auVar281._4_4_ == iVar10);
                      iVar9 = -(uint)(auVar281._12_4_ == iVar9);
                      auVar332._4_4_ = iVar10;
                      auVar332._0_4_ = iVar10;
                      auVar332._8_4_ = iVar9;
                      auVar332._12_4_ = iVar9;
                      auVar194._4_4_ = auVar290._4_4_;
                      auVar194._0_4_ = auVar290._4_4_;
                      auVar194._8_4_ = auVar290._12_4_;
                      auVar194._12_4_ = auVar290._12_4_;
                      auVar195._8_4_ = 0xffffffff;
                      auVar195._0_8_ = 0xffffffffffffffff;
                      auVar195._12_4_ = 0xffffffff;
                      auVar195 = (auVar194 | auVar332 & auVar290) ^ auVar195;
                      if ((auVar195 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        *(undefined4 *)((long)pvVar29 + uVar22 * 4 + 8) = 0x7f7fffff;
                      }
                      pMVar25 = (Mat *)(ulong)auVar195._8_2_;
                      if ((auVar195 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        *(undefined4 *)((long)pvVar29 + uVar22 * 4 + 0xc) = 0x7f7fffff;
                      }
                      uVar22 = uVar22 + 4;
                    } while ((uVar24 + 3 & 0xfffffffc) != uVar22);
                  }
                  if ((int)uVar21 < 1) goto LAB_00209522;
                  pvVar29 = bottom_blob->data;
                  sVar2 = bottom_blob->elemsize;
                  pbVar18 = (bool *)top_blob->data;
                  sVar3 = bottom_blob->cstep;
                  pMVar25 = (Mat *)((long)top_blob->w * top_blob->elemsize);
                  pMVar20 = (Mat *)0x0;
                  do {
                    if (0 < (int)uVar11) {
                      uVar21 = 0;
                      pvVar32 = pvVar29;
                      do {
                        if (0 < (int)uVar12) {
                          pMVar30 = (Mat *)0x0;
                          do {
                            fVar36 = *(float *)((long)pvVar32 + (long)pMVar30 * 4);
                            if (*(float *)(pbVar18 + (long)pMVar30 * 4) <= fVar36) {
                              fVar36 = *(float *)(pbVar18 + (long)pMVar30 * 4);
                            }
                            *(float *)(pbVar18 + (long)pMVar30 * 4) = fVar36;
                            pMVar30 = (Mat *)((long)&pMVar30->data + 1);
                          } while (pMVar13 != pMVar30);
                        }
                        uVar21 = uVar21 + 1;
                        pvVar32 = (void *)((long)pvVar32 + (long)(int)uVar12 * 4);
                      } while (uVar21 != uVar11);
                    }
                    pMVar20 = (Mat *)((long)&pMVar20->data + 1);
                    pvVar29 = (void *)((long)pvVar29 + sVar2 * sVar3);
                    pbVar18 = (bool *)((long)&pMVar25->data + (long)pbVar18);
                    uVar26 = false;
                    in_R11D = 0;
                  } while (pMVar20 != pMVar16);
                }
              }
              goto joined_r0x00209531;
            }
            Mat::create(top_blob,uVar11,sVar2,opt->blob_allocator);
            sums.cstep = 0;
            sums.data = (void *)0x0;
            sums.refcount._0_4_ = 0;
            sums.refcount._4_4_ = 0;
            sums.elemsize._0_4_ = 0;
            sums.elemsize._4_4_ = 0;
            sums.elempack = 0;
            sums.allocator = (Allocator *)0x0;
            sums.dims = 0;
            sums.w = 0;
            sums.h = 0;
            sums.d = 0;
            sums.c = 0;
            pMVar25 = (Mat *)0x1;
            Mat::create(&sums,1,uVar11,uVar21,sVar2,opt->workspace_allocator);
            auVar52 = _DAT_00315150;
            auVar54 = _DAT_00315140;
            auVar134 = _DAT_003150d0;
            in_R11D = -100;
            if ((sums.data != (void *)0x0) &&
               (pMVar25 = (Mat *)(sums.cstep * (long)sums.c), pMVar25 != (Mat *)0x0)) {
              uVar24 = (int)sums.cstep * sums.c;
              if (0 < (int)uVar24) {
                lVar19 = (ulong)uVar24 - 1;
                auVar88._8_4_ = (int)lVar19;
                auVar88._0_8_ = lVar19;
                auVar88._12_4_ = (int)((ulong)lVar19 >> 0x20);
                uVar33 = 0;
                auVar88 = auVar88 ^ _DAT_003150d0;
                do {
                  auVar205._8_4_ = (int)uVar33;
                  auVar205._0_8_ = uVar33;
                  auVar205._12_4_ = (int)(uVar33 >> 0x20);
                  auVar281 = (auVar205 | auVar52) ^ auVar134;
                  iVar10 = auVar88._4_4_;
                  iVar9 = auVar88._12_4_;
                  if ((bool)(~(auVar281._4_4_ == iVar10 && auVar88._0_4_ < auVar281._0_4_ ||
                              iVar10 < auVar281._4_4_) & 1)) {
                    *(undefined4 *)((long)sums.data + uVar33 * 4) = 0x7f7fffff;
                  }
                  if ((auVar281._12_4_ != iVar9 || auVar281._8_4_ <= auVar88._8_4_) &&
                      auVar281._12_4_ <= iVar9) {
                    *(undefined4 *)((long)sums.data + uVar33 * 4 + 4) = 0x7f7fffff;
                  }
                  auVar281 = (auVar205 | auVar54) ^ auVar134;
                  auVar294._0_4_ = -(uint)(auVar88._0_4_ < auVar281._0_4_);
                  auVar294._4_4_ = -(uint)(iVar10 < auVar281._4_4_);
                  auVar294._8_4_ = -(uint)(auVar88._8_4_ < auVar281._8_4_);
                  auVar294._12_4_ = -(uint)(iVar9 < auVar281._12_4_);
                  iVar10 = -(uint)(auVar281._4_4_ == iVar10);
                  iVar9 = -(uint)(auVar281._12_4_ == iVar9);
                  auVar336._4_4_ = iVar10;
                  auVar336._0_4_ = iVar10;
                  auVar336._8_4_ = iVar9;
                  auVar336._12_4_ = iVar9;
                  auVar206._4_4_ = auVar294._4_4_;
                  auVar206._0_4_ = auVar294._4_4_;
                  auVar206._8_4_ = auVar294._12_4_;
                  auVar206._12_4_ = auVar294._12_4_;
                  auVar207._8_4_ = 0xffffffff;
                  auVar207._0_8_ = 0xffffffffffffffff;
                  auVar207._12_4_ = 0xffffffff;
                  auVar207 = (auVar206 | auVar336 & auVar294) ^ auVar207;
                  if ((auVar207 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    *(undefined4 *)((long)sums.data + uVar33 * 4 + 8) = 0x7f7fffff;
                  }
                  pMVar25 = (Mat *)(ulong)auVar207._8_2_;
                  if ((auVar207 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    *(undefined4 *)((long)sums.data + uVar33 * 4 + 0xc) = 0x7f7fffff;
                  }
                  uVar33 = uVar33 + 4;
                } while ((uVar24 + 3 & 0xfffffffc) != uVar33);
              }
              if (0 < (int)uVar21) {
                pvVar29 = bottom_blob->data;
                sVar2 = bottom_blob->elemsize;
                pMVar25 = (Mat *)(CONCAT44(sums.elemsize._4_4_,(undefined4)sums.elemsize) *
                                 sums.cstep);
                sVar3 = bottom_blob->cstep;
                pMVar20 = (Mat *)0x0;
                do {
                  if (0 < (int)uVar11) {
                    uVar33 = 0;
                    pvVar32 = pvVar29;
                    do {
                      auVar132 = ZEXT816(0x7f7fffff);
                      if (0 < (int)uVar12) {
                        pMVar30 = (Mat *)0x0;
                        auVar132 = ZEXT816(0x7f7fffff);
                        do {
                          fVar36 = *(float *)((long)pvVar32 + (long)pMVar30 * 4);
                          if (fVar36 <= auVar132._0_4_) {
                            auVar132._0_4_ = fVar36;
                          }
                          pMVar30 = (Mat *)((long)&pMVar30->data + 1);
                        } while (pMVar13 != pMVar30);
                      }
                      *(int *)((long)sums.data + uVar33 * 4 + (long)pMVar25 * (long)pMVar20) =
                           auVar132._0_4_;
                      uVar33 = uVar33 + 1;
                      pvVar32 = (void *)((long)pvVar32 + lVar31 * 4);
                    } while (uVar33 != uVar22);
                  }
                  pMVar20 = (Mat *)((long)&pMVar20->data + 1);
                  pvVar29 = (void *)((long)pvVar29 + sVar2 * sVar3);
                } while (pMVar20 != pMVar16);
              }
              auVar52 = _DAT_00315150;
              auVar54 = _DAT_00315140;
              auVar134 = _DAT_003150d0;
              uVar12 = top_blob->c * (int)top_blob->cstep;
              if (0 < (int)uVar12) {
                pvVar29 = top_blob->data;
                lVar31 = (ulong)uVar12 - 1;
                auVar89._8_4_ = (int)lVar31;
                auVar89._0_8_ = lVar31;
                auVar89._12_4_ = (int)((ulong)lVar31 >> 0x20);
                uVar33 = 0;
                auVar89 = auVar89 ^ _DAT_003150d0;
                do {
                  auVar208._8_4_ = (int)uVar33;
                  auVar208._0_8_ = uVar33;
                  auVar208._12_4_ = (int)(uVar33 >> 0x20);
                  auVar281 = (auVar208 | auVar52) ^ auVar134;
                  iVar10 = auVar89._4_4_;
                  iVar9 = auVar89._12_4_;
                  if ((bool)(~(auVar281._4_4_ == iVar10 && auVar89._0_4_ < auVar281._0_4_ ||
                              iVar10 < auVar281._4_4_) & 1)) {
                    *(undefined4 *)((long)pvVar29 + uVar33 * 4) = 0x7f7fffff;
                  }
                  if ((auVar281._12_4_ != iVar9 || auVar281._8_4_ <= auVar89._8_4_) &&
                      auVar281._12_4_ <= iVar9) {
                    *(undefined4 *)((long)pvVar29 + uVar33 * 4 + 4) = 0x7f7fffff;
                  }
                  auVar281 = (auVar208 | auVar54) ^ auVar134;
                  auVar295._0_4_ = -(uint)(auVar89._0_4_ < auVar281._0_4_);
                  auVar295._4_4_ = -(uint)(iVar10 < auVar281._4_4_);
                  auVar295._8_4_ = -(uint)(auVar89._8_4_ < auVar281._8_4_);
                  auVar295._12_4_ = -(uint)(iVar9 < auVar281._12_4_);
                  iVar10 = -(uint)(auVar281._4_4_ == iVar10);
                  iVar9 = -(uint)(auVar281._12_4_ == iVar9);
                  auVar337._4_4_ = iVar10;
                  auVar337._0_4_ = iVar10;
                  auVar337._8_4_ = iVar9;
                  auVar337._12_4_ = iVar9;
                  auVar209._4_4_ = auVar295._4_4_;
                  auVar209._0_4_ = auVar295._4_4_;
                  auVar209._8_4_ = auVar295._12_4_;
                  auVar209._12_4_ = auVar295._12_4_;
                  auVar210._8_4_ = 0xffffffff;
                  auVar210._0_8_ = 0xffffffffffffffff;
                  auVar210._12_4_ = 0xffffffff;
                  auVar210 = (auVar209 | auVar337 & auVar295) ^ auVar210;
                  if ((auVar210 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    *(undefined4 *)((long)pvVar29 + uVar33 * 4 + 8) = 0x7f7fffff;
                  }
                  pMVar25 = (Mat *)(ulong)auVar210._8_2_;
                  if ((auVar210 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    *(undefined4 *)((long)pvVar29 + uVar33 * 4 + 0xc) = 0x7f7fffff;
                  }
                  uVar33 = uVar33 + 4;
                } while ((uVar12 + 3 & 0xfffffffc) != uVar33);
              }
              if (0 < (int)uVar21) {
                pvVar29 = top_blob->data;
                pMVar25 = (Mat *)0x0;
                pvVar32 = sums.data;
                do {
                  if (0 < (int)uVar11) {
                    uVar33 = 0;
                    do {
                      fVar1 = *(float *)((long)pvVar32 + uVar33 * 4);
                      fVar36 = *(float *)((long)pvVar29 + uVar33 * 4);
                      if (fVar36 <= fVar1) {
                        fVar1 = fVar36;
                      }
                      *(float *)((long)pvVar29 + uVar33 * 4) = fVar1;
                      uVar33 = uVar33 + 1;
                    } while (uVar22 != uVar33);
                  }
                  pMVar25 = (Mat *)((long)&pMVar25->data + 1);
                  pvVar32 = (void *)((long)pvVar32 +
                                    CONCAT44(sums.elemsize._4_4_,(undefined4)sums.elemsize) *
                                    sums.cstep);
                } while (pMVar25 != pMVar16);
              }
              in_R11D = 0;
            }
            Mat::~Mat(&sums);
          }
          uVar26 = false;
        }
        goto joined_r0x00209531;
      }
    }
    else {
      if (iVar10 == 2) {
        uVar12 = bottom_blob->w;
        pMVar13 = (Mat *)(ulong)uVar12;
        uVar11 = bottom_blob->h;
        pMVar16 = (Mat *)(ulong)uVar11;
        auVar41._8_4_ = 0xffffffff;
        auVar41._0_8_ = 0xffffffffffffffff;
        auVar41._12_4_ = 0xffffffff;
        auVar42._0_8_ = SUB168(auVar41 ^ auVar134,0) << 0x3f;
        auVar42._8_8_ = SUB168(auVar41 ^ auVar134,8) << 0x3f;
        iVar9 = movmskpd(iVar9,auVar42);
        if (iVar9 == 0) {
          Mat::create(top_blob,1,1,sVar2,opt->blob_allocator);
          sums.cstep = 0;
          sums.data = (void *)0x0;
          sums.refcount._0_4_ = 0;
          sums.refcount._4_4_ = 0;
          sums.elemsize._0_4_ = 0;
          sums.elemsize._4_4_ = 0;
          sums.elempack = 0;
          sums.allocator = (Allocator *)0x0;
          sums.dims = 0;
          sums.w = 0;
          sums.h = 0;
          sums.d = 0;
          sums.c = 0;
          pMVar25 = (Mat *)(ulong)uVar11;
          Mat::create(&sums,uVar11,sVar2,opt->workspace_allocator);
          in_R11D = -100;
          if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
            if ((int)uVar11 < 1) {
              fVar36 = 3.4028235e+38;
            }
            else {
              pvVar29 = bottom_blob->data;
              iVar9 = bottom_blob->w;
              sVar3 = bottom_blob->elemsize;
              pMVar25 = (Mat *)0x0;
              do {
                auVar111 = ZEXT816(0x7f7fffff);
                if (0 < (int)uVar12) {
                  pMVar20 = (Mat *)0x0;
                  auVar111 = ZEXT816(0x7f7fffff);
                  do {
                    fVar36 = *(float *)((long)pvVar29 + (long)pMVar20 * 4);
                    if (fVar36 <= auVar111._0_4_) {
                      auVar111._0_4_ = fVar36;
                    }
                    pMVar20 = (Mat *)((long)&pMVar20->data + 1);
                  } while (pMVar13 != pMVar20);
                }
                *(int *)((long)sums.data + (long)pMVar25 * 4) = auVar111._0_4_;
                pMVar25 = (Mat *)((long)&pMVar25->data + 1);
                pvVar29 = (void *)((long)pvVar29 + (long)iVar9 * sVar3);
              } while (pMVar25 != pMVar16);
              fVar36 = 3.4028235e+38;
              pMVar13 = (Mat *)0x0;
              do {
                fVar1 = *(float *)((long)sums.data + (long)pMVar13 * 4);
                if (fVar1 <= fVar36) {
                  fVar36 = fVar1;
                }
                pMVar13 = (Mat *)((long)&pMVar13->data + 1);
              } while (pMVar16 != pMVar13);
            }
            *(float *)top_blob->data = fVar36;
            in_R11D = 0;
          }
          piVar7 = (int *)CONCAT44(sums.refcount._4_4_,sums.refcount._0_4_);
          if (piVar7 != (int *)0x0) {
            LOCK();
            *piVar7 = *piVar7 + -1;
            UNLOCK();
            if (*piVar7 == 0) {
              pMVar25 = (Mat *)sums.data;
              if (sums.allocator == (Allocator *)0x0) {
                if (sums.data != (void *)0x0) {
                  free(sums.data);
                }
              }
              else {
                (*(sums.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          iVar9 = 0;
        }
        else if (((bVar17 | (byte)iVar9 >> 1) & 1) == 0) {
          pMVar25 = (Mat *)0x1;
          Mat::create(top_blob,1,uVar11,sVar2,opt->blob_allocator);
          if (0 < (int)uVar11) {
            iVar9 = bottom_blob->w;
            sVar3 = bottom_blob->elemsize;
            pvVar29 = bottom_blob->data;
            pvVar32 = top_blob->data;
            pMVar25 = (Mat *)0x0;
            do {
              auVar117 = ZEXT816(0x7f7fffff);
              if (0 < (int)uVar12) {
                pMVar20 = (Mat *)0x0;
                auVar117 = ZEXT816(0x7f7fffff);
                do {
                  fVar36 = *(float *)((long)pvVar29 + (long)pMVar20 * 4);
                  if (fVar36 <= auVar117._0_4_) {
                    auVar117._0_4_ = fVar36;
                  }
                  pMVar20 = (Mat *)((long)&pMVar20->data + 1);
                } while (pMVar13 != pMVar20);
              }
              *(int *)((long)pvVar32 + (long)pMVar25 * 4) = auVar117._0_4_;
              pMVar25 = (Mat *)((long)&pMVar25->data + 1);
              pvVar29 = (void *)((long)pvVar29 + (long)iVar9 * sVar3);
            } while (pMVar25 != pMVar16);
            goto LAB_0020238c;
          }
          iVar9 = 0;
          in_R11D = 0;
        }
        else if (((bVar8 | (byte)iVar9) & 1) == 0) {
          pMVar25 = pMVar13;
          Mat::create(top_blob,uVar12,1,sVar2,opt->blob_allocator);
          auVar281 = _DAT_00315150;
          auVar52 = _DAT_00315140;
          auVar54 = _DAT_003150d0;
          uVar21 = top_blob->c * (int)top_blob->cstep;
          if (0 < (int)uVar21) {
            pvVar29 = top_blob->data;
            lVar31 = (ulong)uVar21 - 1;
            auVar56._8_4_ = (int)lVar31;
            auVar56._0_8_ = lVar31;
            auVar56._12_4_ = (int)((ulong)lVar31 >> 0x20);
            uVar22 = 0;
            auVar56 = auVar56 ^ _DAT_003150d0;
            do {
              auVar148._8_4_ = (int)uVar22;
              auVar148._0_8_ = uVar22;
              auVar148._12_4_ = (int)(uVar22 >> 0x20);
              auVar274 = (auVar148 | auVar281) ^ auVar54;
              iVar9 = auVar56._4_4_;
              iVar271 = auVar56._12_4_;
              if ((bool)(~(auVar274._4_4_ == iVar9 && auVar56._0_4_ < auVar274._0_4_ ||
                          iVar9 < auVar274._4_4_) & 1)) {
                *(undefined4 *)((long)pvVar29 + uVar22 * 4) = 0x7f7fffff;
              }
              if ((auVar274._12_4_ != iVar271 || auVar274._8_4_ <= auVar56._8_4_) &&
                  auVar274._12_4_ <= iVar271) {
                *(undefined4 *)((long)pvVar29 + uVar22 * 4 + 4) = 0x7f7fffff;
              }
              auVar274 = (auVar148 | auVar52) ^ auVar54;
              auVar273._0_4_ = -(uint)(auVar56._0_4_ < auVar274._0_4_);
              auVar273._4_4_ = -(uint)(iVar9 < auVar274._4_4_);
              auVar273._8_4_ = -(uint)(auVar56._8_4_ < auVar274._8_4_);
              auVar273._12_4_ = -(uint)(iVar271 < auVar274._12_4_);
              iVar9 = -(uint)(auVar274._4_4_ == iVar9);
              iVar271 = -(uint)(auVar274._12_4_ == iVar271);
              auVar317._4_4_ = iVar9;
              auVar317._0_4_ = iVar9;
              auVar317._8_4_ = iVar271;
              auVar317._12_4_ = iVar271;
              auVar149._4_4_ = auVar273._4_4_;
              auVar149._0_4_ = auVar273._4_4_;
              auVar149._8_4_ = auVar273._12_4_;
              auVar149._12_4_ = auVar273._12_4_;
              auVar150._8_4_ = 0xffffffff;
              auVar150._0_8_ = 0xffffffffffffffff;
              auVar150._12_4_ = 0xffffffff;
              auVar150 = (auVar149 | auVar317 & auVar273) ^ auVar150;
              if ((auVar150 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined4 *)((long)pvVar29 + uVar22 * 4 + 8) = 0x7f7fffff;
              }
              pMVar25 = (Mat *)(ulong)auVar150._8_2_;
              if ((auVar150 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined4 *)((long)pvVar29 + uVar22 * 4 + 0xc) = 0x7f7fffff;
              }
              uVar22 = uVar22 + 4;
            } while ((uVar21 + 3 & 0xfffffffc) != uVar22);
          }
          if (0 < (int)uVar11) {
            pvVar29 = bottom_blob->data;
            iVar9 = bottom_blob->w;
            sVar3 = bottom_blob->elemsize;
            pvVar32 = top_blob->data;
            pMVar25 = (Mat *)0x0;
            do {
              if (0 < (int)uVar12) {
                pMVar20 = (Mat *)0x0;
                do {
                  fVar1 = *(float *)((long)pvVar29 + (long)pMVar20 * 4);
                  fVar36 = *(float *)((long)pvVar32 + (long)pMVar20 * 4);
                  if (fVar36 <= fVar1) {
                    fVar1 = fVar36;
                  }
                  *(float *)((long)pvVar32 + (long)pMVar20 * 4) = fVar1;
                  pMVar20 = (Mat *)((long)&pMVar20->data + 1);
                } while (pMVar13 != pMVar20);
              }
              pMVar25 = (Mat *)((long)&pMVar25->data + 1);
              pvVar29 = (void *)((long)pvVar29 + (long)iVar9 * sVar3);
            } while (pMVar25 != pMVar16);
          }
LAB_0020238c:
          iVar9 = 0;
          in_R11D = 0;
        }
        else {
          iVar9 = (int)CONCAT71((uint7)(uint3)((uint)iVar9 >> 8),1);
        }
        if ((char)iVar9 == '\0') break;
      }
      else if (iVar10 == 1) {
        iVar10 = bottom_blob->w;
        pMVar25 = (Mat *)0x1;
        Mat::create(top_blob,1,sVar2,opt->blob_allocator);
        if ((long)iVar10 < 1) {
LAB_002010fc:
          fVar36 = 3.4028235e+38;
        }
        else {
          fVar36 = 3.4028235e+38;
          lVar31 = 0;
          do {
            fVar1 = *(float *)((long)bottom_blob->data + lVar31 * 4);
            if (fVar1 <= fVar36) {
              fVar36 = fVar1;
            }
            lVar31 = lVar31 + 1;
          } while (iVar10 != lVar31);
        }
LAB_00201104:
        *(float *)top_blob->data = fVar36;
        in_R11D = 0;
        break;
      }
      if (iVar10 == 3) {
        uVar12 = bottom_blob->w;
        lVar31 = (long)(int)uVar12;
        uVar11 = bottom_blob->h;
        uVar22 = (ulong)uVar11;
        uVar21 = bottom_blob->c;
        pMVar16 = (Mat *)(ulong)uVar21;
        uVar24 = uVar11 * uVar12;
        auVar64._8_4_ = 0xffffffff;
        auVar64._0_8_ = 0xffffffffffffffff;
        auVar64._12_4_ = 0xffffffff;
        auVar65._0_8_ = SUB168(auVar64 ^ auVar134,0) << 0x3f;
        auVar65._8_8_ = SUB168(auVar64 ^ auVar134,8) << 0x3f;
        iVar10 = movmskpd(iVar9,auVar65);
        bVar14 = reduce_c ^ 1;
        if (iVar10 == 0 && bVar14 == 0) {
          Mat::create(top_blob,1,1,1,sVar2,opt->blob_allocator);
          sums.cstep = 0;
          sums.data = (void *)0x0;
          sums.refcount._0_4_ = 0;
          sums.refcount._4_4_ = 0;
          sums.elemsize._0_4_ = 0;
          sums.elemsize._4_4_ = 0;
          sums.elempack = 0;
          sums.allocator = (Allocator *)0x0;
          sums.dims = 0;
          sums.w = 0;
          sums.h = 0;
          sums.d = 0;
          sums.c = 0;
          pMVar25 = pMVar16;
          Mat::create(&sums,uVar21,sVar2,opt->workspace_allocator);
          in_R11D = -100;
          if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
            if ((int)uVar21 < 1) {
              fVar36 = 3.4028235e+38;
            }
            else {
              sVar2 = bottom_blob->elemsize;
              sVar3 = bottom_blob->cstep;
              pvVar29 = bottom_blob->data;
              pMVar25 = (Mat *)(ulong)uVar24;
              pMVar13 = (Mat *)0x0;
              do {
                fVar36 = 3.4028235e+38;
                if (0 < (int)uVar24) {
                  pMVar20 = (Mat *)0x0;
                  fVar36 = 3.4028235e+38;
                  do {
                    fVar1 = *(float *)((long)pvVar29 + (long)pMVar20 * 4);
                    if (fVar1 <= fVar36) {
                      fVar36 = fVar1;
                    }
                    pMVar20 = (Mat *)((long)&pMVar20->data + 1);
                  } while (pMVar25 != pMVar20);
                }
                *(float *)((long)sums.data + (long)pMVar13 * 4) = fVar36;
                pMVar13 = (Mat *)((long)&pMVar13->data + 1);
                pvVar29 = (void *)((long)pvVar29 + sVar2 * sVar3);
              } while (pMVar13 != pMVar16);
              fVar36 = 3.4028235e+38;
              pMVar13 = (Mat *)0x0;
              do {
                fVar1 = *(float *)((long)sums.data + (long)pMVar13 * 4);
                if (fVar1 <= fVar36) {
                  fVar36 = fVar1;
                }
                pMVar13 = (Mat *)((long)&pMVar13->data + 1);
              } while (pMVar16 != pMVar13);
            }
            *(float *)top_blob->data = fVar36;
            in_R11D = 0;
          }
          piVar7 = (int *)CONCAT44(sums.refcount._4_4_,sums.refcount._0_4_);
          if (piVar7 != (int *)0x0) {
            LOCK();
            *piVar7 = *piVar7 + -1;
            UNLOCK();
            if (*piVar7 == 0) {
              pMVar25 = (Mat *)sums.data;
              if (sums.allocator == (Allocator *)0x0) {
                if (sums.data != (void *)0x0) {
                  free(sums.data);
                }
              }
              else {
                (*(sums.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          uVar26 = false;
        }
        else if (iVar10 == 0 && reduce_c == false) {
          pMVar25 = (Mat *)0x1;
          Mat::create(top_blob,1,1,uVar21,sVar2,opt->blob_allocator);
          if ((int)uVar21 < 1) goto LAB_0020379c;
          pvVar29 = bottom_blob->data;
          sVar2 = bottom_blob->elemsize;
          sVar3 = top_blob->elemsize;
          sVar4 = bottom_blob->cstep;
          sVar5 = top_blob->cstep;
          pMVar25 = (Mat *)top_blob->data;
          pMVar13 = (Mat *)0x0;
          do {
            fVar36 = 3.4028235e+38;
            if (0 < (int)uVar24) {
              uVar22 = 0;
              fVar36 = 3.4028235e+38;
              do {
                fVar1 = *(float *)((long)pvVar29 + uVar22 * 4);
                if (fVar1 <= fVar36) {
                  fVar36 = fVar1;
                }
                uVar22 = uVar22 + 1;
              } while (uVar24 != uVar22);
            }
            *(float *)((long)&pMVar25->data + sVar3 * sVar5 * (long)pMVar13) = fVar36;
            pMVar13 = (Mat *)((long)&pMVar13->data + 1);
            pvVar29 = (void *)((long)pvVar29 + sVar2 * sVar4);
          } while (pMVar13 != pMVar16);
LAB_00203791:
          uVar26 = false;
          in_R11D = 0;
        }
        else {
          pMVar13 = (Mat *)(ulong)uVar12;
          bVar23 = (byte)iVar10 >> 1 | bVar17;
          if (reduce_c == false && (bVar23 & 1) == 0) {
            pMVar25 = (Mat *)0x1;
            Mat::create(top_blob,1,uVar11,uVar21,sVar2,opt->blob_allocator);
            if (0 < (int)uVar21) {
              pvVar29 = bottom_blob->data;
              sVar2 = bottom_blob->elemsize;
              pvVar32 = top_blob->data;
              pMVar25 = (Mat *)(top_blob->elemsize * top_blob->cstep);
              sVar3 = bottom_blob->cstep;
              pMVar20 = (Mat *)0x0;
              do {
                if (0 < (int)uVar11) {
                  uVar33 = 0;
                  pvVar28 = pvVar29;
                  do {
                    auVar123 = ZEXT816(0x7f7fffff);
                    if (0 < (int)uVar12) {
                      pMVar30 = (Mat *)0x0;
                      auVar123 = ZEXT816(0x7f7fffff);
                      do {
                        fVar36 = *(float *)((long)pvVar28 + (long)pMVar30 * 4);
                        if (fVar36 <= auVar123._0_4_) {
                          auVar123._0_4_ = fVar36;
                        }
                        pMVar30 = (Mat *)((long)&pMVar30->data + 1);
                      } while (pMVar13 != pMVar30);
                    }
                    *(int *)((long)pvVar32 + uVar33 * 4 + (long)pMVar25 * (long)pMVar20) =
                         auVar123._0_4_;
                    uVar33 = uVar33 + 1;
                    pvVar28 = (void *)((long)pvVar28 + lVar31 * 4);
                  } while (uVar33 != uVar22);
                }
                pMVar20 = (Mat *)((long)&pMVar20->data + 1);
                pvVar29 = (void *)((long)pvVar29 + sVar2 * sVar3);
              } while (pMVar20 != pMVar16);
              goto LAB_00203791;
            }
LAB_0020379c:
            in_R11D = 0;
          }
          else {
            if ((bVar23 & 1) == 0 && bVar14 == 0) {
              Mat::create(top_blob,1,uVar11,1,sVar2,opt->blob_allocator);
              sums.cstep = 0;
              sums.data = (void *)0x0;
              sums.refcount._0_4_ = 0;
              sums.refcount._4_4_ = 0;
              sums.elemsize._0_4_ = 0;
              sums.elemsize._4_4_ = 0;
              sums.elempack = 0;
              sums.allocator = (Allocator *)0x0;
              sums.dims = 0;
              sums.w = 0;
              sums.h = 0;
              sums.d = 0;
              sums.c = 0;
              pMVar25 = (Mat *)0x1;
              Mat::create(&sums,1,uVar11,uVar21,sVar2,opt->workspace_allocator);
              auVar52 = _DAT_00315150;
              auVar54 = _DAT_00315140;
              auVar134 = _DAT_003150d0;
              in_R11D = -100;
              if ((sums.data != (void *)0x0) &&
                 (pMVar25 = (Mat *)(sums.cstep * (long)sums.c), pMVar25 != (Mat *)0x0)) {
                uVar24 = (int)sums.cstep * sums.c;
                if (0 < (int)uVar24) {
                  lVar19 = (ulong)uVar24 - 1;
                  auVar73._8_4_ = (int)lVar19;
                  auVar73._0_8_ = lVar19;
                  auVar73._12_4_ = (int)((ulong)lVar19 >> 0x20);
                  uVar33 = 0;
                  auVar73 = auVar73 ^ _DAT_003150d0;
                  do {
                    auVar178._8_4_ = (int)uVar33;
                    auVar178._0_8_ = uVar33;
                    auVar178._12_4_ = (int)(uVar33 >> 0x20);
                    auVar281 = (auVar178 | auVar52) ^ auVar134;
                    iVar10 = auVar73._4_4_;
                    iVar9 = auVar73._12_4_;
                    if ((bool)(~(auVar281._4_4_ == iVar10 && auVar73._0_4_ < auVar281._0_4_ ||
                                iVar10 < auVar281._4_4_) & 1)) {
                      *(undefined4 *)((long)sums.data + uVar33 * 4) = 0x7f7fffff;
                    }
                    if ((auVar281._12_4_ != iVar9 || auVar281._8_4_ <= auVar73._8_4_) &&
                        auVar281._12_4_ <= iVar9) {
                      *(undefined4 *)((long)sums.data + uVar33 * 4 + 4) = 0x7f7fffff;
                    }
                    auVar281 = (auVar178 | auVar54) ^ auVar134;
                    auVar285._0_4_ = -(uint)(auVar73._0_4_ < auVar281._0_4_);
                    auVar285._4_4_ = -(uint)(iVar10 < auVar281._4_4_);
                    auVar285._8_4_ = -(uint)(auVar73._8_4_ < auVar281._8_4_);
                    auVar285._12_4_ = -(uint)(iVar9 < auVar281._12_4_);
                    iVar10 = -(uint)(auVar281._4_4_ == iVar10);
                    iVar9 = -(uint)(auVar281._12_4_ == iVar9);
                    auVar327._4_4_ = iVar10;
                    auVar327._0_4_ = iVar10;
                    auVar327._8_4_ = iVar9;
                    auVar327._12_4_ = iVar9;
                    auVar179._4_4_ = auVar285._4_4_;
                    auVar179._0_4_ = auVar285._4_4_;
                    auVar179._8_4_ = auVar285._12_4_;
                    auVar179._12_4_ = auVar285._12_4_;
                    auVar180._8_4_ = 0xffffffff;
                    auVar180._0_8_ = 0xffffffffffffffff;
                    auVar180._12_4_ = 0xffffffff;
                    auVar180 = (auVar179 | auVar327 & auVar285) ^ auVar180;
                    if ((auVar180 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      *(undefined4 *)((long)sums.data + uVar33 * 4 + 8) = 0x7f7fffff;
                    }
                    pMVar25 = (Mat *)(ulong)auVar180._8_2_;
                    if ((auVar180 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      *(undefined4 *)((long)sums.data + uVar33 * 4 + 0xc) = 0x7f7fffff;
                    }
                    uVar33 = uVar33 + 4;
                  } while ((uVar24 + 3 & 0xfffffffc) != uVar33);
                }
                if (0 < (int)uVar21) {
                  pvVar29 = bottom_blob->data;
                  sVar2 = bottom_blob->elemsize;
                  pMVar25 = (Mat *)(CONCAT44(sums.elemsize._4_4_,(undefined4)sums.elemsize) *
                                   sums.cstep);
                  sVar3 = bottom_blob->cstep;
                  pMVar20 = (Mat *)0x0;
                  do {
                    if (0 < (int)uVar11) {
                      uVar33 = 0;
                      pvVar32 = pvVar29;
                      do {
                        auVar126 = ZEXT816(0x7f7fffff);
                        if (0 < (int)uVar12) {
                          pMVar30 = (Mat *)0x0;
                          auVar126 = ZEXT816(0x7f7fffff);
                          do {
                            fVar36 = *(float *)((long)pvVar32 + (long)pMVar30 * 4);
                            if (fVar36 <= auVar126._0_4_) {
                              auVar126._0_4_ = fVar36;
                            }
                            pMVar30 = (Mat *)((long)&pMVar30->data + 1);
                          } while (pMVar13 != pMVar30);
                        }
                        *(int *)((long)sums.data + uVar33 * 4 + (long)pMVar25 * (long)pMVar20) =
                             auVar126._0_4_;
                        uVar33 = uVar33 + 1;
                        pvVar32 = (void *)((long)pvVar32 + lVar31 * 4);
                      } while (uVar33 != uVar22);
                    }
                    pMVar20 = (Mat *)((long)&pMVar20->data + 1);
                    pvVar29 = (void *)((long)pvVar29 + sVar2 * sVar3);
                  } while (pMVar20 != pMVar16);
                }
                auVar52 = _DAT_00315150;
                auVar54 = _DAT_00315140;
                auVar134 = _DAT_003150d0;
                uVar12 = top_blob->c * (int)top_blob->cstep;
                if (0 < (int)uVar12) {
                  pvVar29 = top_blob->data;
                  lVar31 = (ulong)uVar12 - 1;
                  auVar74._8_4_ = (int)lVar31;
                  auVar74._0_8_ = lVar31;
                  auVar74._12_4_ = (int)((ulong)lVar31 >> 0x20);
                  uVar33 = 0;
                  auVar74 = auVar74 ^ _DAT_003150d0;
                  do {
                    auVar181._8_4_ = (int)uVar33;
                    auVar181._0_8_ = uVar33;
                    auVar181._12_4_ = (int)(uVar33 >> 0x20);
                    auVar281 = (auVar181 | auVar52) ^ auVar134;
                    iVar10 = auVar74._4_4_;
                    iVar9 = auVar74._12_4_;
                    if ((bool)(~(auVar281._4_4_ == iVar10 && auVar74._0_4_ < auVar281._0_4_ ||
                                iVar10 < auVar281._4_4_) & 1)) {
                      *(undefined4 *)((long)pvVar29 + uVar33 * 4) = 0x7f7fffff;
                    }
                    if ((auVar281._12_4_ != iVar9 || auVar281._8_4_ <= auVar74._8_4_) &&
                        auVar281._12_4_ <= iVar9) {
                      *(undefined4 *)((long)pvVar29 + uVar33 * 4 + 4) = 0x7f7fffff;
                    }
                    auVar281 = (auVar181 | auVar54) ^ auVar134;
                    auVar286._0_4_ = -(uint)(auVar74._0_4_ < auVar281._0_4_);
                    auVar286._4_4_ = -(uint)(iVar10 < auVar281._4_4_);
                    auVar286._8_4_ = -(uint)(auVar74._8_4_ < auVar281._8_4_);
                    auVar286._12_4_ = -(uint)(iVar9 < auVar281._12_4_);
                    iVar10 = -(uint)(auVar281._4_4_ == iVar10);
                    iVar9 = -(uint)(auVar281._12_4_ == iVar9);
                    auVar328._4_4_ = iVar10;
                    auVar328._0_4_ = iVar10;
                    auVar328._8_4_ = iVar9;
                    auVar328._12_4_ = iVar9;
                    auVar182._4_4_ = auVar286._4_4_;
                    auVar182._0_4_ = auVar286._4_4_;
                    auVar182._8_4_ = auVar286._12_4_;
                    auVar182._12_4_ = auVar286._12_4_;
                    auVar183._8_4_ = 0xffffffff;
                    auVar183._0_8_ = 0xffffffffffffffff;
                    auVar183._12_4_ = 0xffffffff;
                    auVar183 = (auVar182 | auVar328 & auVar286) ^ auVar183;
                    if ((auVar183 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      *(undefined4 *)((long)pvVar29 + uVar33 * 4 + 8) = 0x7f7fffff;
                    }
                    pMVar25 = (Mat *)(ulong)auVar183._8_2_;
                    if ((auVar183 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      *(undefined4 *)((long)pvVar29 + uVar33 * 4 + 0xc) = 0x7f7fffff;
                    }
                    uVar33 = uVar33 + 4;
                  } while ((uVar12 + 3 & 0xfffffffc) != uVar33);
                }
                if (0 < (int)uVar21) {
                  pvVar29 = top_blob->data;
                  pMVar25 = (Mat *)0x0;
                  pvVar32 = sums.data;
                  do {
                    if (0 < (int)uVar11) {
                      uVar33 = 0;
                      do {
                        fVar1 = *(float *)((long)pvVar32 + uVar33 * 4);
                        fVar36 = *(float *)((long)pvVar29 + uVar33 * 4);
                        if (fVar36 <= fVar1) {
                          fVar1 = fVar36;
                        }
                        *(float *)((long)pvVar29 + uVar33 * 4) = fVar1;
                        uVar33 = uVar33 + 1;
                      } while (uVar22 != uVar33);
                    }
                    pMVar25 = (Mat *)((long)&pMVar25->data + 1);
                    pvVar32 = (void *)((long)pvVar32 +
                                      CONCAT44(sums.elemsize._4_4_,(undefined4)sums.elemsize) *
                                      sums.cstep);
                  } while (pMVar25 != pMVar16);
                }
                in_R11D = 0;
              }
            }
            else {
              pMVar25 = (Mat *)(ulong)uVar6;
              bVar23 = (byte)iVar10 | bVar8;
              if ((bVar23 & 1) != 0 || bVar14 != 0) {
                if (((bVar17 | bVar8) & 1) == 0 && bVar14 == 0) {
                  Mat::create(top_blob,uVar12,uVar11,1,sVar2,opt->blob_allocator);
                  auVar52 = _DAT_00315150;
                  auVar54 = _DAT_00315140;
                  auVar134 = _DAT_003150d0;
                  uVar12 = top_blob->c * (int)top_blob->cstep;
                  if (0 < (int)uVar12) {
                    pvVar29 = top_blob->data;
                    lVar31 = (ulong)uVar12 - 1;
                    auVar105._8_4_ = (int)lVar31;
                    auVar105._0_8_ = lVar31;
                    auVar105._12_4_ = (int)((ulong)lVar31 >> 0x20);
                    uVar22 = 0;
                    auVar105 = auVar105 ^ _DAT_003150d0;
                    do {
                      auVar256._8_4_ = (int)uVar22;
                      auVar256._0_8_ = uVar22;
                      auVar256._12_4_ = (int)(uVar22 >> 0x20);
                      auVar281 = (auVar256 | auVar52) ^ auVar134;
                      iVar10 = auVar105._4_4_;
                      iVar9 = auVar105._12_4_;
                      if ((bool)(~(auVar281._4_4_ == iVar10 && auVar105._0_4_ < auVar281._0_4_ ||
                                  iVar10 < auVar281._4_4_) & 1)) {
                        *(undefined4 *)((long)pvVar29 + uVar22 * 4) = 0x7f7fffff;
                      }
                      if ((auVar281._12_4_ != iVar9 || auVar281._8_4_ <= auVar105._8_4_) &&
                          auVar281._12_4_ <= iVar9) {
                        *(undefined4 *)((long)pvVar29 + uVar22 * 4 + 4) = 0x7f7fffff;
                      }
                      auVar281 = (auVar256 | auVar54) ^ auVar134;
                      auVar311._0_4_ = -(uint)(auVar105._0_4_ < auVar281._0_4_);
                      auVar311._4_4_ = -(uint)(iVar10 < auVar281._4_4_);
                      auVar311._8_4_ = -(uint)(auVar105._8_4_ < auVar281._8_4_);
                      auVar311._12_4_ = -(uint)(iVar9 < auVar281._12_4_);
                      iVar10 = -(uint)(auVar281._4_4_ == iVar10);
                      iVar9 = -(uint)(auVar281._12_4_ == iVar9);
                      auVar353._4_4_ = iVar10;
                      auVar353._0_4_ = iVar10;
                      auVar353._8_4_ = iVar9;
                      auVar353._12_4_ = iVar9;
                      auVar257._4_4_ = auVar311._4_4_;
                      auVar257._0_4_ = auVar311._4_4_;
                      auVar257._8_4_ = auVar311._12_4_;
                      auVar257._12_4_ = auVar311._12_4_;
                      auVar258._8_4_ = 0xffffffff;
                      auVar258._0_8_ = 0xffffffffffffffff;
                      auVar258._12_4_ = 0xffffffff;
                      auVar258 = (auVar257 | auVar353 & auVar311) ^ auVar258;
                      if ((auVar258 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        *(undefined4 *)((long)pvVar29 + uVar22 * 4 + 8) = 0x7f7fffff;
                      }
                      pMVar13 = (Mat *)(ulong)auVar258._8_2_;
                      if ((auVar258 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        *(undefined4 *)((long)pvVar29 + uVar22 * 4 + 0xc) = 0x7f7fffff;
                      }
                      uVar22 = uVar22 + 4;
                    } while ((uVar12 + 3 & 0xfffffffc) != uVar22);
                  }
                  pMVar25 = pMVar13;
                  if ((int)uVar21 < 1) goto LAB_00203791;
                  pvVar29 = bottom_blob->data;
                  sVar2 = bottom_blob->elemsize;
                  pvVar32 = top_blob->data;
                  sVar3 = bottom_blob->cstep;
                  pMVar25 = (Mat *)(ulong)uVar24;
                  pMVar13 = (Mat *)0x0;
                  uVar26 = false;
                  in_R11D = 0;
                  do {
                    if (0 < (int)uVar24) {
                      pMVar20 = (Mat *)0x0;
                      do {
                        fVar1 = *(float *)((long)pvVar29 + (long)pMVar20 * 4);
                        fVar36 = *(float *)((long)pvVar32 + (long)pMVar20 * 4);
                        if (fVar36 <= fVar1) {
                          fVar1 = fVar36;
                        }
                        *(float *)((long)pvVar32 + (long)pMVar20 * 4) = fVar1;
                        pMVar20 = (Mat *)((long)&pMVar20->data + 1);
                      } while (pMVar25 != pMVar20);
                    }
                    pMVar13 = (Mat *)((long)&pMVar13->data + 1);
                    pvVar29 = (void *)((long)pvVar29 + sVar2 * sVar3);
                  } while (pMVar13 != pMVar16);
                }
                else {
                  uVar26 = true;
                  if (reduce_c == false && (bVar23 & 1) == 0) {
                    pMVar25 = pMVar13;
                    Mat::create(top_blob,uVar12,1,uVar21,sVar2,opt->blob_allocator);
                    auVar52 = _DAT_00315150;
                    auVar54 = _DAT_00315140;
                    auVar134 = _DAT_003150d0;
                    uVar24 = top_blob->c * (int)top_blob->cstep;
                    if (0 < (int)uVar24) {
                      pvVar29 = top_blob->data;
                      lVar31 = (ulong)uVar24 - 1;
                      auVar66._8_4_ = (int)lVar31;
                      auVar66._0_8_ = lVar31;
                      auVar66._12_4_ = (int)((ulong)lVar31 >> 0x20);
                      uVar22 = 0;
                      auVar66 = auVar66 ^ _DAT_003150d0;
                      do {
                        auVar166._8_4_ = (int)uVar22;
                        auVar166._0_8_ = uVar22;
                        auVar166._12_4_ = (int)(uVar22 >> 0x20);
                        auVar281 = (auVar166 | auVar52) ^ auVar134;
                        iVar10 = auVar66._4_4_;
                        iVar9 = auVar66._12_4_;
                        if ((bool)(~(auVar281._4_4_ == iVar10 && auVar66._0_4_ < auVar281._0_4_ ||
                                    iVar10 < auVar281._4_4_) & 1)) {
                          *(undefined4 *)((long)pvVar29 + uVar22 * 4) = 0x7f7fffff;
                        }
                        if ((auVar281._12_4_ != iVar9 || auVar281._8_4_ <= auVar66._8_4_) &&
                            auVar281._12_4_ <= iVar9) {
                          *(undefined4 *)((long)pvVar29 + uVar22 * 4 + 4) = 0x7f7fffff;
                        }
                        auVar281 = (auVar166 | auVar54) ^ auVar134;
                        auVar280._0_4_ = -(uint)(auVar66._0_4_ < auVar281._0_4_);
                        auVar280._4_4_ = -(uint)(iVar10 < auVar281._4_4_);
                        auVar280._8_4_ = -(uint)(auVar66._8_4_ < auVar281._8_4_);
                        auVar280._12_4_ = -(uint)(iVar9 < auVar281._12_4_);
                        iVar10 = -(uint)(auVar281._4_4_ == iVar10);
                        iVar9 = -(uint)(auVar281._12_4_ == iVar9);
                        auVar323._4_4_ = iVar10;
                        auVar323._0_4_ = iVar10;
                        auVar323._8_4_ = iVar9;
                        auVar323._12_4_ = iVar9;
                        auVar167._4_4_ = auVar280._4_4_;
                        auVar167._0_4_ = auVar280._4_4_;
                        auVar167._8_4_ = auVar280._12_4_;
                        auVar167._12_4_ = auVar280._12_4_;
                        auVar168._8_4_ = 0xffffffff;
                        auVar168._0_8_ = 0xffffffffffffffff;
                        auVar168._12_4_ = 0xffffffff;
                        auVar168 = (auVar167 | auVar323 & auVar280) ^ auVar168;
                        if ((auVar168 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                          *(undefined4 *)((long)pvVar29 + uVar22 * 4 + 8) = 0x7f7fffff;
                        }
                        pMVar25 = (Mat *)(ulong)auVar168._8_2_;
                        if ((auVar168 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                          *(undefined4 *)((long)pvVar29 + uVar22 * 4 + 0xc) = 0x7f7fffff;
                        }
                        uVar22 = uVar22 + 4;
                      } while ((uVar24 + 3 & 0xfffffffc) != uVar22);
                    }
                    if ((int)uVar21 < 1) goto LAB_0020379c;
                    pvVar29 = bottom_blob->data;
                    sVar2 = bottom_blob->elemsize;
                    pbVar18 = (bool *)top_blob->data;
                    pMVar25 = (Mat *)(top_blob->elemsize * top_blob->cstep);
                    sVar3 = bottom_blob->cstep;
                    pMVar20 = (Mat *)0x0;
                    do {
                      if (0 < (int)uVar11) {
                        uVar21 = 0;
                        pvVar32 = pvVar29;
                        do {
                          if (0 < (int)uVar12) {
                            pMVar30 = (Mat *)0x0;
                            do {
                              fVar36 = *(float *)((long)pvVar32 + (long)pMVar30 * 4);
                              if (*(float *)(pbVar18 + (long)pMVar30 * 4) <= fVar36) {
                                fVar36 = *(float *)(pbVar18 + (long)pMVar30 * 4);
                              }
                              *(float *)(pbVar18 + (long)pMVar30 * 4) = fVar36;
                              pMVar30 = (Mat *)((long)&pMVar30->data + 1);
                            } while (pMVar13 != pMVar30);
                          }
                          uVar21 = uVar21 + 1;
                          pvVar32 = (void *)((long)pvVar32 + (long)(int)uVar12 * 4);
                        } while (uVar21 != uVar11);
                      }
                      pMVar20 = (Mat *)((long)&pMVar20->data + 1);
                      pvVar29 = (void *)((long)pvVar29 + sVar2 * sVar3);
                      pbVar18 = (bool *)((long)&pMVar25->data + (long)pbVar18);
                      uVar26 = false;
                      in_R11D = 0;
                    } while (pMVar20 != pMVar16);
                  }
                }
                goto joined_r0x00209531;
              }
              Mat::create(top_blob,uVar12,1,1,sVar2,opt->blob_allocator);
              sums.cstep = 0;
              sums.data = (void *)0x0;
              sums.refcount._0_4_ = 0;
              sums.refcount._4_4_ = 0;
              sums.elemsize._0_4_ = 0;
              sums.elemsize._4_4_ = 0;
              sums.elempack = 0;
              sums.allocator = (Allocator *)0x0;
              sums.dims = 0;
              sums.w = 0;
              sums.h = 0;
              sums.d = 0;
              sums.c = 0;
              pMVar25 = (Mat *)(ulong)uVar12;
              Mat::create(&sums,uVar12,1,uVar21,sVar2,opt->workspace_allocator);
              auVar52 = _DAT_00315150;
              auVar54 = _DAT_00315140;
              auVar134 = _DAT_003150d0;
              in_R11D = -100;
              if ((sums.data != (void *)0x0) &&
                 (pMVar25 = (Mat *)(sums.cstep * (long)sums.c), pMVar25 != (Mat *)0x0)) {
                uVar24 = (int)sums.cstep * sums.c;
                if (0 < (int)uVar24) {
                  lVar19 = (ulong)uVar24 - 1;
                  auVar94._8_4_ = (int)lVar19;
                  auVar94._0_8_ = lVar19;
                  auVar94._12_4_ = (int)((ulong)lVar19 >> 0x20);
                  uVar22 = 0;
                  auVar94 = auVar94 ^ _DAT_003150d0;
                  do {
                    auVar223._8_4_ = (int)uVar22;
                    auVar223._0_8_ = uVar22;
                    auVar223._12_4_ = (int)(uVar22 >> 0x20);
                    auVar281 = (auVar223 | auVar52) ^ auVar134;
                    iVar10 = auVar94._4_4_;
                    iVar9 = auVar94._12_4_;
                    if ((bool)(~(auVar281._4_4_ == iVar10 && auVar94._0_4_ < auVar281._0_4_ ||
                                iVar10 < auVar281._4_4_) & 1)) {
                      *(undefined4 *)((long)sums.data + uVar22 * 4) = 0x7f7fffff;
                    }
                    if ((auVar281._12_4_ != iVar9 || auVar281._8_4_ <= auVar94._8_4_) &&
                        auVar281._12_4_ <= iVar9) {
                      *(undefined4 *)((long)sums.data + uVar22 * 4 + 4) = 0x7f7fffff;
                    }
                    auVar281 = (auVar223 | auVar54) ^ auVar134;
                    auVar300._0_4_ = -(uint)(auVar94._0_4_ < auVar281._0_4_);
                    auVar300._4_4_ = -(uint)(iVar10 < auVar281._4_4_);
                    auVar300._8_4_ = -(uint)(auVar94._8_4_ < auVar281._8_4_);
                    auVar300._12_4_ = -(uint)(iVar9 < auVar281._12_4_);
                    iVar10 = -(uint)(auVar281._4_4_ == iVar10);
                    iVar9 = -(uint)(auVar281._12_4_ == iVar9);
                    auVar342._4_4_ = iVar10;
                    auVar342._0_4_ = iVar10;
                    auVar342._8_4_ = iVar9;
                    auVar342._12_4_ = iVar9;
                    auVar224._4_4_ = auVar300._4_4_;
                    auVar224._0_4_ = auVar300._4_4_;
                    auVar224._8_4_ = auVar300._12_4_;
                    auVar224._12_4_ = auVar300._12_4_;
                    auVar225._8_4_ = 0xffffffff;
                    auVar225._0_8_ = 0xffffffffffffffff;
                    auVar225._12_4_ = 0xffffffff;
                    auVar225 = (auVar224 | auVar342 & auVar300) ^ auVar225;
                    if ((auVar225 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      *(undefined4 *)((long)sums.data + uVar22 * 4 + 8) = 0x7f7fffff;
                    }
                    pMVar25 = (Mat *)(ulong)auVar225._8_2_;
                    if ((auVar225 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      *(undefined4 *)((long)sums.data + uVar22 * 4 + 0xc) = 0x7f7fffff;
                    }
                    uVar22 = uVar22 + 4;
                  } while ((uVar24 + 3 & 0xfffffffc) != uVar22);
                }
                if (0 < (int)uVar21) {
                  pvVar29 = bottom_blob->data;
                  sVar2 = bottom_blob->elemsize;
                  pMVar25 = (Mat *)(CONCAT44(sums.elemsize._4_4_,(undefined4)sums.elemsize) *
                                   sums.cstep);
                  sVar3 = bottom_blob->cstep;
                  pMVar20 = (Mat *)0x0;
                  pvVar32 = sums.data;
                  do {
                    if (0 < (int)uVar11) {
                      uVar24 = 0;
                      pvVar28 = pvVar29;
                      do {
                        if (0 < (int)uVar12) {
                          pMVar30 = (Mat *)0x0;
                          do {
                            fVar1 = *(float *)((long)pvVar28 + (long)pMVar30 * 4);
                            fVar36 = *(float *)((long)pvVar32 + (long)pMVar30 * 4);
                            if (fVar36 <= fVar1) {
                              fVar1 = fVar36;
                            }
                            *(float *)((long)pvVar32 + (long)pMVar30 * 4) = fVar1;
                            pMVar30 = (Mat *)((long)&pMVar30->data + 1);
                          } while (pMVar13 != pMVar30);
                        }
                        uVar24 = uVar24 + 1;
                        pvVar28 = (void *)((long)pvVar28 + lVar31 * 4);
                      } while (uVar24 != uVar11);
                    }
                    pMVar20 = (Mat *)((long)&pMVar20->data + 1);
                    pvVar29 = (void *)((long)pvVar29 + sVar2 * sVar3);
                    pvVar32 = (void *)((long)pvVar32 + (long)pMVar25);
                  } while (pMVar20 != pMVar16);
                }
                auVar52 = _DAT_00315150;
                auVar54 = _DAT_00315140;
                auVar134 = _DAT_003150d0;
                uVar11 = top_blob->c * (int)top_blob->cstep;
                if (0 < (int)uVar11) {
                  pvVar29 = top_blob->data;
                  lVar31 = (ulong)uVar11 - 1;
                  auVar95._8_4_ = (int)lVar31;
                  auVar95._0_8_ = lVar31;
                  auVar95._12_4_ = (int)((ulong)lVar31 >> 0x20);
                  uVar22 = 0;
                  auVar95 = auVar95 ^ _DAT_003150d0;
                  do {
                    auVar226._8_4_ = (int)uVar22;
                    auVar226._0_8_ = uVar22;
                    auVar226._12_4_ = (int)(uVar22 >> 0x20);
                    auVar281 = (auVar226 | auVar52) ^ auVar134;
                    iVar10 = auVar95._4_4_;
                    iVar9 = auVar95._12_4_;
                    if ((bool)(~(auVar281._4_4_ == iVar10 && auVar95._0_4_ < auVar281._0_4_ ||
                                iVar10 < auVar281._4_4_) & 1)) {
                      *(undefined4 *)((long)pvVar29 + uVar22 * 4) = 0x7f7fffff;
                    }
                    if ((auVar281._12_4_ != iVar9 || auVar281._8_4_ <= auVar95._8_4_) &&
                        auVar281._12_4_ <= iVar9) {
                      *(undefined4 *)((long)pvVar29 + uVar22 * 4 + 4) = 0x7f7fffff;
                    }
                    auVar281 = (auVar226 | auVar54) ^ auVar134;
                    auVar301._0_4_ = -(uint)(auVar95._0_4_ < auVar281._0_4_);
                    auVar301._4_4_ = -(uint)(iVar10 < auVar281._4_4_);
                    auVar301._8_4_ = -(uint)(auVar95._8_4_ < auVar281._8_4_);
                    auVar301._12_4_ = -(uint)(iVar9 < auVar281._12_4_);
                    iVar10 = -(uint)(auVar281._4_4_ == iVar10);
                    iVar9 = -(uint)(auVar281._12_4_ == iVar9);
                    auVar343._4_4_ = iVar10;
                    auVar343._0_4_ = iVar10;
                    auVar343._8_4_ = iVar9;
                    auVar343._12_4_ = iVar9;
                    auVar227._4_4_ = auVar301._4_4_;
                    auVar227._0_4_ = auVar301._4_4_;
                    auVar227._8_4_ = auVar301._12_4_;
                    auVar227._12_4_ = auVar301._12_4_;
                    auVar228._8_4_ = 0xffffffff;
                    auVar228._0_8_ = 0xffffffffffffffff;
                    auVar228._12_4_ = 0xffffffff;
                    auVar228 = (auVar227 | auVar343 & auVar301) ^ auVar228;
                    if ((auVar228 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      *(undefined4 *)((long)pvVar29 + uVar22 * 4 + 8) = 0x7f7fffff;
                    }
                    pMVar25 = (Mat *)(ulong)auVar228._8_2_;
                    if ((auVar228 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      *(undefined4 *)((long)pvVar29 + uVar22 * 4 + 0xc) = 0x7f7fffff;
                    }
                    uVar22 = uVar22 + 4;
                  } while ((uVar11 + 3 & 0xfffffffc) != uVar22);
                }
                if (0 < (int)uVar21) {
                  pvVar29 = top_blob->data;
                  pMVar25 = (Mat *)0x0;
                  pvVar32 = sums.data;
                  do {
                    if (0 < (int)uVar12) {
                      pMVar20 = (Mat *)0x0;
                      do {
                        fVar1 = *(float *)((long)pvVar32 + (long)pMVar20 * 4);
                        fVar36 = *(float *)((long)pvVar29 + (long)pMVar20 * 4);
                        if (fVar36 <= fVar1) {
                          fVar1 = fVar36;
                        }
                        *(float *)((long)pvVar29 + (long)pMVar20 * 4) = fVar1;
                        pMVar20 = (Mat *)((long)&pMVar20->data + 1);
                      } while (pMVar13 != pMVar20);
                    }
                    pMVar25 = (Mat *)((long)&pMVar25->data + 1);
                    pvVar32 = (void *)((long)pvVar32 +
                                      CONCAT44(sums.elemsize._4_4_,(undefined4)sums.elemsize) *
                                      sums.cstep);
                  } while (pMVar25 != pMVar16);
                }
                in_R11D = 0;
              }
            }
            Mat::~Mat(&sums);
          }
          uVar26 = false;
        }
joined_r0x00209531:
        if (!(bool)uVar26) break;
      }
    }
    in_R11D = 0;
    break;
  case 6:
    fVar35 = this->coeff;
    sVar2 = bottom_blob->elemsize;
    if (this->keepdims == 0) {
      if (iVar10 == 2) {
        uVar12 = bottom_blob->w;
        pMVar13 = (Mat *)(ulong)uVar12;
        uVar11 = bottom_blob->h;
        pMVar16 = (Mat *)(ulong)uVar11;
        auVar50._8_4_ = 0xffffffff;
        auVar50._0_8_ = 0xffffffffffffffff;
        auVar50._12_4_ = 0xffffffff;
        auVar51._0_8_ = SUB168(auVar50 ^ auVar134,0) << 0x3f;
        auVar51._8_8_ = SUB168(auVar50 ^ auVar134,8) << 0x3f;
        iVar9 = movmskpd(iVar9,auVar51);
        if (iVar9 == 0) {
          Mat::create(top_blob,1,sVar2,opt->blob_allocator);
          sums.cstep = 0;
          sums.data = (void *)0x0;
          sums.refcount._0_4_ = 0;
          sums.refcount._4_4_ = 0;
          sums.elemsize._0_4_ = 0;
          sums.elemsize._4_4_ = 0;
          sums.elempack = 0;
          sums.allocator = (Allocator *)0x0;
          sums.dims = 0;
          sums.w = 0;
          sums.h = 0;
          sums.d = 0;
          sums.c = 0;
          pMVar25 = (Mat *)(ulong)uVar11;
          Mat::create(&sums,uVar11,sVar2,opt->workspace_allocator);
          in_R11D = -100;
          if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
            if ((int)uVar11 < 1) {
              fVar36 = 1.0;
            }
            else {
              pvVar29 = bottom_blob->data;
              iVar9 = bottom_blob->w;
              sVar3 = bottom_blob->elemsize;
              pMVar25 = (Mat *)0x0;
              do {
                auVar115 = ZEXT816(0x3f800000);
                if (0 < (int)uVar12) {
                  pMVar20 = (Mat *)0x0;
                  auVar115 = ZEXT816(0x3f800000);
                  do {
                    auVar115._0_4_ = auVar115._0_4_ * *(float *)((long)pvVar29 + (long)pMVar20 * 4);
                    pMVar20 = (Mat *)((long)&pMVar20->data + 1);
                  } while (pMVar13 != pMVar20);
                }
                *(int *)((long)sums.data + (long)pMVar25 * 4) = auVar115._0_4_;
                pMVar25 = (Mat *)((long)&pMVar25->data + 1);
                pvVar29 = (void *)((long)pvVar29 + (long)iVar9 * sVar3);
              } while (pMVar25 != pMVar16);
              fVar36 = 1.0;
              pMVar13 = (Mat *)0x0;
              do {
                fVar36 = fVar36 * *(float *)((long)sums.data + (long)pMVar13 * 4);
                pMVar13 = (Mat *)((long)&pMVar13->data + 1);
              } while (pMVar16 != pMVar13);
            }
            *(float *)top_blob->data = fVar36;
            in_R11D = 0;
          }
          piVar7 = (int *)CONCAT44(sums.refcount._4_4_,sums.refcount._0_4_);
          if (piVar7 != (int *)0x0) {
            LOCK();
            *piVar7 = *piVar7 + -1;
            UNLOCK();
            if (*piVar7 == 0) {
              pMVar25 = (Mat *)sums.data;
              if (sums.allocator == (Allocator *)0x0) {
                if (sums.data != (void *)0x0) {
                  free(sums.data);
                }
              }
              else {
                (*(sums.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          iVar9 = 0;
        }
        else if (((bVar17 | (byte)iVar9 >> 1) & 1) == 0) {
          pMVar25 = pMVar16;
          Mat::create(top_blob,uVar11,sVar2,opt->blob_allocator);
          if (0 < (int)uVar11) {
            iVar9 = bottom_blob->w;
            sVar3 = bottom_blob->elemsize;
            pvVar29 = bottom_blob->data;
            pvVar32 = top_blob->data;
            pMVar25 = (Mat *)0x0;
            do {
              auVar121 = ZEXT816(0x3f800000);
              if (0 < (int)uVar12) {
                pMVar20 = (Mat *)0x0;
                auVar121 = ZEXT816(0x3f800000);
                do {
                  auVar121._0_4_ = auVar121._0_4_ * *(float *)((long)pvVar29 + (long)pMVar20 * 4);
                  pMVar20 = (Mat *)((long)&pMVar20->data + 1);
                } while (pMVar13 != pMVar20);
              }
              *(int *)((long)pvVar32 + (long)pMVar25 * 4) = auVar121._0_4_;
              pMVar25 = (Mat *)((long)&pMVar25->data + 1);
              pvVar29 = (void *)((long)pvVar29 + (long)iVar9 * sVar3);
            } while (pMVar25 != pMVar16);
            goto LAB_00202b6b;
          }
          iVar9 = 0;
          in_R11D = 0;
        }
        else if (((bVar8 | (byte)iVar9) & 1) == 0) {
          pMVar25 = pMVar13;
          Mat::create(top_blob,uVar12,sVar2,opt->blob_allocator);
          auVar281 = _DAT_00315150;
          auVar52 = _DAT_00315140;
          auVar54 = _DAT_003150d0;
          uVar21 = top_blob->c * (int)top_blob->cstep;
          if (0 < (int)uVar21) {
            pvVar29 = top_blob->data;
            lVar31 = (ulong)uVar21 - 1;
            auVar60._8_4_ = (int)lVar31;
            auVar60._0_8_ = lVar31;
            auVar60._12_4_ = (int)((ulong)lVar31 >> 0x20);
            uVar22 = 0;
            auVar60 = auVar60 ^ _DAT_003150d0;
            do {
              auVar160._8_4_ = (int)uVar22;
              auVar160._0_8_ = uVar22;
              auVar160._12_4_ = (int)(uVar22 >> 0x20);
              auVar274 = (auVar160 | auVar281) ^ auVar54;
              iVar9 = auVar60._4_4_;
              iVar271 = auVar60._12_4_;
              if ((bool)(~(auVar274._4_4_ == iVar9 && auVar60._0_4_ < auVar274._0_4_ ||
                          iVar9 < auVar274._4_4_) & 1)) {
                *(undefined4 *)((long)pvVar29 + uVar22 * 4) = 0x3f800000;
              }
              if ((auVar274._12_4_ != iVar271 || auVar274._8_4_ <= auVar60._8_4_) &&
                  auVar274._12_4_ <= iVar271) {
                *(undefined4 *)((long)pvVar29 + uVar22 * 4 + 4) = 0x3f800000;
              }
              auVar274 = (auVar160 | auVar52) ^ auVar54;
              auVar278._0_4_ = -(uint)(auVar60._0_4_ < auVar274._0_4_);
              auVar278._4_4_ = -(uint)(iVar9 < auVar274._4_4_);
              auVar278._8_4_ = -(uint)(auVar60._8_4_ < auVar274._8_4_);
              auVar278._12_4_ = -(uint)(iVar271 < auVar274._12_4_);
              iVar9 = -(uint)(auVar274._4_4_ == iVar9);
              iVar271 = -(uint)(auVar274._12_4_ == iVar271);
              auVar321._4_4_ = iVar9;
              auVar321._0_4_ = iVar9;
              auVar321._8_4_ = iVar271;
              auVar321._12_4_ = iVar271;
              auVar161._4_4_ = auVar278._4_4_;
              auVar161._0_4_ = auVar278._4_4_;
              auVar161._8_4_ = auVar278._12_4_;
              auVar161._12_4_ = auVar278._12_4_;
              auVar162._8_4_ = 0xffffffff;
              auVar162._0_8_ = 0xffffffffffffffff;
              auVar162._12_4_ = 0xffffffff;
              auVar162 = (auVar161 | auVar321 & auVar278) ^ auVar162;
              if ((auVar162 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined4 *)((long)pvVar29 + uVar22 * 4 + 8) = 0x3f800000;
              }
              pMVar25 = (Mat *)(ulong)auVar162._8_2_;
              if ((auVar162 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined4 *)((long)pvVar29 + uVar22 * 4 + 0xc) = 0x3f800000;
              }
              uVar22 = uVar22 + 4;
            } while ((uVar21 + 3 & 0xfffffffc) != uVar22);
          }
          if (0 < (int)uVar11) {
            pvVar29 = bottom_blob->data;
            iVar9 = bottom_blob->w;
            sVar3 = bottom_blob->elemsize;
            pvVar32 = top_blob->data;
            pMVar25 = (Mat *)0x0;
            do {
              if (0 < (int)uVar12) {
                pMVar20 = (Mat *)0x0;
                do {
                  *(float *)((long)pvVar32 + (long)pMVar20 * 4) =
                       *(float *)((long)pvVar29 + (long)pMVar20 * 4) *
                       *(float *)((long)pvVar32 + (long)pMVar20 * 4);
                  pMVar20 = (Mat *)((long)&pMVar20->data + 1);
                } while (pMVar13 != pMVar20);
              }
              pMVar25 = (Mat *)((long)&pMVar25->data + 1);
              pvVar29 = (void *)((long)pvVar29 + (long)iVar9 * sVar3);
            } while (pMVar25 != pMVar16);
          }
LAB_00202b6b:
          iVar9 = 0;
          in_R11D = 0;
        }
        else {
          iVar9 = (int)CONCAT71((uint7)(uint3)((uint)iVar9 >> 8),1);
        }
        if ((char)iVar9 == '\0') break;
      }
      else if (iVar10 == 1) {
        iVar10 = bottom_blob->w;
        pMVar25 = (Mat *)0x1;
        Mat::create(top_blob,1,sVar2,opt->blob_allocator);
        if ((long)iVar10 < 1) goto LAB_0020111d;
        fVar36 = 1.0;
        lVar31 = 0;
        do {
          fVar36 = fVar36 * *(float *)((long)bottom_blob->data + lVar31 * 4);
          lVar31 = lVar31 + 1;
        } while (iVar10 != lVar31);
        goto LAB_00201125;
      }
      if (iVar10 == 3) {
        uVar12 = bottom_blob->w;
        lVar31 = (long)(int)uVar12;
        uVar11 = bottom_blob->h;
        uVar22 = (ulong)uVar11;
        uVar21 = bottom_blob->c;
        pMVar16 = (Mat *)(ulong)uVar21;
        uVar24 = uVar11 * uVar12;
        auVar83._8_4_ = 0xffffffff;
        auVar83._0_8_ = 0xffffffffffffffff;
        auVar83._12_4_ = 0xffffffff;
        auVar84._0_8_ = SUB168(auVar83 ^ auVar134,0) << 0x3f;
        auVar84._8_8_ = SUB168(auVar83 ^ auVar134,8) << 0x3f;
        iVar10 = movmskpd(iVar9,auVar84);
        bVar14 = reduce_c ^ 1;
        pMVar25 = pMVar16;
        if (iVar10 == 0 && bVar14 == 0) {
          Mat::create(top_blob,1,sVar2,opt->blob_allocator);
          sums.cstep = 0;
          sums.data = (void *)0x0;
          sums.refcount._0_4_ = 0;
          sums.refcount._4_4_ = 0;
          sums.elemsize._0_4_ = 0;
          sums.elemsize._4_4_ = 0;
          sums.elempack = 0;
          sums.allocator = (Allocator *)0x0;
          sums.dims = 0;
          sums.w = 0;
          sums.h = 0;
          sums.d = 0;
          sums.c = 0;
          Mat::create(&sums,uVar21,sVar2,opt->workspace_allocator);
          in_R11D = -100;
          if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
            if ((int)uVar21 < 1) {
              fVar36 = 1.0;
            }
            else {
              sVar2 = bottom_blob->elemsize;
              sVar3 = bottom_blob->cstep;
              pvVar29 = bottom_blob->data;
              pMVar25 = (Mat *)(ulong)uVar24;
              pMVar13 = (Mat *)0x0;
              do {
                fVar36 = 1.0;
                if (0 < (int)uVar24) {
                  pMVar20 = (Mat *)0x0;
                  fVar36 = 1.0;
                  do {
                    fVar36 = fVar36 * *(float *)((long)pvVar29 + (long)pMVar20 * 4);
                    pMVar20 = (Mat *)((long)&pMVar20->data + 1);
                  } while (pMVar25 != pMVar20);
                }
                *(float *)((long)sums.data + (long)pMVar13 * 4) = fVar36;
                pMVar13 = (Mat *)((long)&pMVar13->data + 1);
                pvVar29 = (void *)((long)pvVar29 + sVar2 * sVar3);
              } while (pMVar13 != pMVar16);
              fVar36 = 1.0;
              pMVar13 = (Mat *)0x0;
              do {
                fVar36 = fVar36 * *(float *)((long)sums.data + (long)pMVar13 * 4);
                pMVar13 = (Mat *)((long)&pMVar13->data + 1);
              } while (pMVar16 != pMVar13);
            }
            *(float *)top_blob->data = fVar36;
            in_R11D = 0;
          }
          piVar7 = (int *)CONCAT44(sums.refcount._4_4_,sums.refcount._0_4_);
          if (piVar7 != (int *)0x0) {
            LOCK();
            *piVar7 = *piVar7 + -1;
            UNLOCK();
            if (*piVar7 == 0) {
              pMVar25 = (Mat *)sums.data;
              if (sums.allocator == (Allocator *)0x0) {
                if (sums.data != (void *)0x0) {
                  free(sums.data);
                }
              }
              else {
                (*(sums.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          uVar26 = false;
          goto joined_r0x002096c9;
        }
        if (iVar10 == 0 && reduce_c == false) {
          Mat::create(top_blob,uVar21,sVar2,opt->blob_allocator);
          if ((int)uVar21 < 1) goto LAB_002096ba;
          pvVar29 = bottom_blob->data;
          sVar2 = bottom_blob->elemsize;
          sVar3 = bottom_blob->cstep;
          pvVar32 = top_blob->data;
          pMVar25 = (Mat *)(ulong)uVar24;
          pMVar13 = (Mat *)0x0;
          do {
            fVar36 = 1.0;
            if (0 < (int)uVar24) {
              pMVar20 = (Mat *)0x0;
              fVar36 = 1.0;
              do {
                fVar36 = fVar36 * *(float *)((long)pvVar29 + (long)pMVar20 * 4);
                pMVar20 = (Mat *)((long)&pMVar20->data + 1);
              } while (pMVar25 != pMVar20);
            }
            *(float *)((long)pvVar32 + (long)pMVar13 * 4) = fVar36;
            pMVar13 = (Mat *)((long)&pMVar13->data + 1);
            pvVar29 = (void *)((long)pvVar29 + sVar2 * sVar3);
          } while (pMVar13 != pMVar16);
LAB_00205f9b:
          uVar26 = false;
          in_R11D = 0;
        }
        else {
          pMVar13 = (Mat *)(ulong)uVar12;
          bVar23 = (byte)iVar10 >> 1 | bVar17;
          if (reduce_c == false && (bVar23 & 1) == 0) {
            pMVar25 = (Mat *)(ulong)uVar11;
            Mat::create(top_blob,uVar11,uVar21,sVar2,opt->blob_allocator);
            if (0 < (int)uVar21) {
              pvVar29 = bottom_blob->data;
              sVar2 = bottom_blob->elemsize;
              pvVar32 = top_blob->data;
              pMVar25 = (Mat *)((long)top_blob->w * top_blob->elemsize);
              sVar3 = bottom_blob->cstep;
              pMVar20 = (Mat *)0x0;
              do {
                if (0 < (int)uVar11) {
                  uVar33 = 0;
                  pvVar28 = pvVar29;
                  do {
                    auVar130 = ZEXT816(0x3f800000);
                    if (0 < (int)uVar12) {
                      pMVar30 = (Mat *)0x0;
                      auVar130 = ZEXT816(0x3f800000);
                      do {
                        auVar130._0_4_ =
                             auVar130._0_4_ * *(float *)((long)pvVar28 + (long)pMVar30 * 4);
                        pMVar30 = (Mat *)((long)&pMVar30->data + 1);
                      } while (pMVar13 != pMVar30);
                    }
                    *(int *)((long)pvVar32 + uVar33 * 4 + (long)pMVar25 * (long)pMVar20) =
                         auVar130._0_4_;
                    uVar33 = uVar33 + 1;
                    pvVar28 = (void *)((long)pvVar28 + lVar31 * 4);
                  } while (uVar33 != uVar22);
                }
                pMVar20 = (Mat *)((long)&pMVar20->data + 1);
                pvVar29 = (void *)((long)pvVar29 + sVar2 * sVar3);
              } while (pMVar20 != pMVar16);
              goto LAB_00205f9b;
            }
LAB_002096ba:
            in_R11D = 0;
          }
          else {
            if ((bVar23 & 1) != 0 || bVar14 != 0) {
              pMVar25 = (Mat *)(ulong)uVar6;
              bVar23 = (byte)iVar10 | bVar8;
              if ((bVar23 & 1) == 0 && bVar14 == 0) {
                Mat::create(top_blob,uVar12,sVar2,opt->blob_allocator);
                sums.cstep = 0;
                sums.data = (void *)0x0;
                sums.refcount._0_4_ = 0;
                sums.refcount._4_4_ = 0;
                sums.elemsize._0_4_ = 0;
                sums.elemsize._4_4_ = 0;
                sums.elempack = 0;
                sums.allocator = (Allocator *)0x0;
                sums.dims = 0;
                sums.w = 0;
                sums.h = 0;
                sums.d = 0;
                sums.c = 0;
                pMVar25 = (Mat *)(ulong)uVar12;
                Mat::create(&sums,uVar12,1,uVar21,sVar2,opt->workspace_allocator);
                auVar52 = _DAT_00315150;
                auVar54 = _DAT_00315140;
                auVar134 = _DAT_003150d0;
                in_R11D = -100;
                if ((sums.data != (void *)0x0) &&
                   (pMVar25 = (Mat *)(sums.cstep * (long)sums.c), pMVar25 != (Mat *)0x0)) {
                  uVar24 = (int)sums.cstep * sums.c;
                  if (0 < (int)uVar24) {
                    lVar19 = (ulong)uVar24 - 1;
                    auVar102._8_4_ = (int)lVar19;
                    auVar102._0_8_ = lVar19;
                    auVar102._12_4_ = (int)((ulong)lVar19 >> 0x20);
                    uVar22 = 0;
                    auVar102 = auVar102 ^ _DAT_003150d0;
                    do {
                      auVar247._8_4_ = (int)uVar22;
                      auVar247._0_8_ = uVar22;
                      auVar247._12_4_ = (int)(uVar22 >> 0x20);
                      auVar281 = (auVar247 | auVar52) ^ auVar134;
                      iVar10 = auVar102._4_4_;
                      iVar9 = auVar102._12_4_;
                      if ((bool)(~(auVar281._4_4_ == iVar10 && auVar102._0_4_ < auVar281._0_4_ ||
                                  iVar10 < auVar281._4_4_) & 1)) {
                        *(undefined4 *)((long)sums.data + uVar22 * 4) = 0x3f800000;
                      }
                      if ((auVar281._12_4_ != iVar9 || auVar281._8_4_ <= auVar102._8_4_) &&
                          auVar281._12_4_ <= iVar9) {
                        *(undefined4 *)((long)sums.data + uVar22 * 4 + 4) = 0x3f800000;
                      }
                      auVar281 = (auVar247 | auVar54) ^ auVar134;
                      auVar308._0_4_ = -(uint)(auVar102._0_4_ < auVar281._0_4_);
                      auVar308._4_4_ = -(uint)(iVar10 < auVar281._4_4_);
                      auVar308._8_4_ = -(uint)(auVar102._8_4_ < auVar281._8_4_);
                      auVar308._12_4_ = -(uint)(iVar9 < auVar281._12_4_);
                      iVar10 = -(uint)(auVar281._4_4_ == iVar10);
                      iVar9 = -(uint)(auVar281._12_4_ == iVar9);
                      auVar350._4_4_ = iVar10;
                      auVar350._0_4_ = iVar10;
                      auVar350._8_4_ = iVar9;
                      auVar350._12_4_ = iVar9;
                      auVar248._4_4_ = auVar308._4_4_;
                      auVar248._0_4_ = auVar308._4_4_;
                      auVar248._8_4_ = auVar308._12_4_;
                      auVar248._12_4_ = auVar308._12_4_;
                      auVar249._8_4_ = 0xffffffff;
                      auVar249._0_8_ = 0xffffffffffffffff;
                      auVar249._12_4_ = 0xffffffff;
                      auVar249 = (auVar248 | auVar350 & auVar308) ^ auVar249;
                      if ((auVar249 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        *(undefined4 *)((long)sums.data + uVar22 * 4 + 8) = 0x3f800000;
                      }
                      pMVar25 = (Mat *)(ulong)auVar249._8_2_;
                      if ((auVar249 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        *(undefined4 *)((long)sums.data + uVar22 * 4 + 0xc) = 0x3f800000;
                      }
                      uVar22 = uVar22 + 4;
                    } while ((uVar24 + 3 & 0xfffffffc) != uVar22);
                  }
                  if (0 < (int)uVar21) {
                    pvVar29 = bottom_blob->data;
                    sVar2 = bottom_blob->elemsize;
                    pMVar25 = (Mat *)(CONCAT44(sums.elemsize._4_4_,(undefined4)sums.elemsize) *
                                     sums.cstep);
                    sVar3 = bottom_blob->cstep;
                    pMVar20 = (Mat *)0x0;
                    pvVar32 = sums.data;
                    do {
                      if (0 < (int)uVar11) {
                        uVar24 = 0;
                        pvVar28 = pvVar29;
                        do {
                          if (0 < (int)uVar12) {
                            pMVar30 = (Mat *)0x0;
                            do {
                              *(float *)((long)pvVar32 + (long)pMVar30 * 4) =
                                   *(float *)((long)pvVar28 + (long)pMVar30 * 4) *
                                   *(float *)((long)pvVar32 + (long)pMVar30 * 4);
                              pMVar30 = (Mat *)((long)&pMVar30->data + 1);
                            } while (pMVar13 != pMVar30);
                          }
                          uVar24 = uVar24 + 1;
                          pvVar28 = (void *)((long)pvVar28 + lVar31 * 4);
                        } while (uVar24 != uVar11);
                      }
                      pMVar20 = (Mat *)((long)&pMVar20->data + 1);
                      pvVar29 = (void *)((long)pvVar29 + sVar2 * sVar3);
                      pvVar32 = (void *)((long)pvVar32 + (long)pMVar25);
                    } while (pMVar20 != pMVar16);
                  }
                  auVar52 = _DAT_00315150;
                  auVar54 = _DAT_00315140;
                  auVar134 = _DAT_003150d0;
                  uVar11 = top_blob->c * (int)top_blob->cstep;
                  if (0 < (int)uVar11) {
                    pvVar29 = top_blob->data;
                    lVar31 = (ulong)uVar11 - 1;
                    auVar103._8_4_ = (int)lVar31;
                    auVar103._0_8_ = lVar31;
                    auVar103._12_4_ = (int)((ulong)lVar31 >> 0x20);
                    uVar22 = 0;
                    auVar103 = auVar103 ^ _DAT_003150d0;
                    do {
                      auVar250._8_4_ = (int)uVar22;
                      auVar250._0_8_ = uVar22;
                      auVar250._12_4_ = (int)(uVar22 >> 0x20);
                      auVar281 = (auVar250 | auVar52) ^ auVar134;
                      iVar10 = auVar103._4_4_;
                      iVar9 = auVar103._12_4_;
                      if ((bool)(~(auVar281._4_4_ == iVar10 && auVar103._0_4_ < auVar281._0_4_ ||
                                  iVar10 < auVar281._4_4_) & 1)) {
                        *(undefined4 *)((long)pvVar29 + uVar22 * 4) = 0x3f800000;
                      }
                      if ((auVar281._12_4_ != iVar9 || auVar281._8_4_ <= auVar103._8_4_) &&
                          auVar281._12_4_ <= iVar9) {
                        *(undefined4 *)((long)pvVar29 + uVar22 * 4 + 4) = 0x3f800000;
                      }
                      auVar281 = (auVar250 | auVar54) ^ auVar134;
                      auVar309._0_4_ = -(uint)(auVar103._0_4_ < auVar281._0_4_);
                      auVar309._4_4_ = -(uint)(iVar10 < auVar281._4_4_);
                      auVar309._8_4_ = -(uint)(auVar103._8_4_ < auVar281._8_4_);
                      auVar309._12_4_ = -(uint)(iVar9 < auVar281._12_4_);
                      iVar10 = -(uint)(auVar281._4_4_ == iVar10);
                      iVar9 = -(uint)(auVar281._12_4_ == iVar9);
                      auVar351._4_4_ = iVar10;
                      auVar351._0_4_ = iVar10;
                      auVar351._8_4_ = iVar9;
                      auVar351._12_4_ = iVar9;
                      auVar251._4_4_ = auVar309._4_4_;
                      auVar251._0_4_ = auVar309._4_4_;
                      auVar251._8_4_ = auVar309._12_4_;
                      auVar251._12_4_ = auVar309._12_4_;
                      auVar252._8_4_ = 0xffffffff;
                      auVar252._0_8_ = 0xffffffffffffffff;
                      auVar252._12_4_ = 0xffffffff;
                      auVar252 = (auVar251 | auVar351 & auVar309) ^ auVar252;
                      if ((auVar252 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        *(undefined4 *)((long)pvVar29 + uVar22 * 4 + 8) = 0x3f800000;
                      }
                      pMVar25 = (Mat *)(ulong)auVar252._8_2_;
                      if ((auVar252 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        *(undefined4 *)((long)pvVar29 + uVar22 * 4 + 0xc) = 0x3f800000;
                      }
                      uVar22 = uVar22 + 4;
                    } while ((uVar11 + 3 & 0xfffffffc) != uVar22);
                  }
                  if (0 < (int)uVar21) {
                    pvVar29 = top_blob->data;
                    pMVar25 = (Mat *)0x0;
                    pvVar32 = sums.data;
                    do {
                      if (0 < (int)uVar12) {
                        pMVar20 = (Mat *)0x0;
                        do {
                          *(float *)((long)pvVar29 + (long)pMVar20 * 4) =
                               *(float *)((long)pvVar32 + (long)pMVar20 * 4) *
                               *(float *)((long)pvVar29 + (long)pMVar20 * 4);
                          pMVar20 = (Mat *)((long)&pMVar20->data + 1);
                        } while (pMVar13 != pMVar20);
                      }
                      pMVar25 = (Mat *)((long)&pMVar25->data + 1);
                      pvVar32 = (void *)((long)pvVar32 +
                                        CONCAT44(sums.elemsize._4_4_,(undefined4)sums.elemsize) *
                                        sums.cstep);
                    } while (pMVar25 != pMVar16);
                  }
                  in_R11D = 0;
                }
                Mat::~Mat(&sums);
                uVar26 = false;
              }
              else if (((bVar17 | bVar8) & 1) == 0 && bVar14 == 0) {
                Mat::create(top_blob,uVar12,uVar11,sVar2,opt->blob_allocator);
                auVar52 = _DAT_00315150;
                auVar54 = _DAT_00315140;
                auVar134 = _DAT_003150d0;
                uVar12 = top_blob->c * (int)top_blob->cstep;
                if (0 < (int)uVar12) {
                  pvVar29 = top_blob->data;
                  lVar31 = (ulong)uVar12 - 1;
                  auVar109._8_4_ = (int)lVar31;
                  auVar109._0_8_ = lVar31;
                  auVar109._12_4_ = (int)((ulong)lVar31 >> 0x20);
                  uVar22 = 0;
                  auVar109 = auVar109 ^ _DAT_003150d0;
                  do {
                    auVar268._8_4_ = (int)uVar22;
                    auVar268._0_8_ = uVar22;
                    auVar268._12_4_ = (int)(uVar22 >> 0x20);
                    auVar281 = (auVar268 | auVar52) ^ auVar134;
                    iVar10 = auVar109._4_4_;
                    iVar9 = auVar109._12_4_;
                    if ((bool)(~(auVar281._4_4_ == iVar10 && auVar109._0_4_ < auVar281._0_4_ ||
                                iVar10 < auVar281._4_4_) & 1)) {
                      *(undefined4 *)((long)pvVar29 + uVar22 * 4) = 0x3f800000;
                    }
                    if ((auVar281._12_4_ != iVar9 || auVar281._8_4_ <= auVar109._8_4_) &&
                        auVar281._12_4_ <= iVar9) {
                      *(undefined4 *)((long)pvVar29 + uVar22 * 4 + 4) = 0x3f800000;
                    }
                    auVar281 = (auVar268 | auVar54) ^ auVar134;
                    auVar315._0_4_ = -(uint)(auVar109._0_4_ < auVar281._0_4_);
                    auVar315._4_4_ = -(uint)(iVar10 < auVar281._4_4_);
                    auVar315._8_4_ = -(uint)(auVar109._8_4_ < auVar281._8_4_);
                    auVar315._12_4_ = -(uint)(iVar9 < auVar281._12_4_);
                    iVar10 = -(uint)(auVar281._4_4_ == iVar10);
                    iVar9 = -(uint)(auVar281._12_4_ == iVar9);
                    auVar357._4_4_ = iVar10;
                    auVar357._0_4_ = iVar10;
                    auVar357._8_4_ = iVar9;
                    auVar357._12_4_ = iVar9;
                    auVar269._4_4_ = auVar315._4_4_;
                    auVar269._0_4_ = auVar315._4_4_;
                    auVar269._8_4_ = auVar315._12_4_;
                    auVar269._12_4_ = auVar315._12_4_;
                    auVar270._8_4_ = 0xffffffff;
                    auVar270._0_8_ = 0xffffffffffffffff;
                    auVar270._12_4_ = 0xffffffff;
                    auVar270 = (auVar269 | auVar357 & auVar315) ^ auVar270;
                    if ((auVar270 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      *(undefined4 *)((long)pvVar29 + uVar22 * 4 + 8) = 0x3f800000;
                    }
                    pMVar13 = (Mat *)(ulong)auVar270._8_2_;
                    if ((auVar270 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      *(undefined4 *)((long)pvVar29 + uVar22 * 4 + 0xc) = 0x3f800000;
                    }
                    uVar22 = uVar22 + 4;
                  } while ((uVar12 + 3 & 0xfffffffc) != uVar22);
                }
                pMVar25 = pMVar13;
                if ((int)uVar21 < 1) goto LAB_002096ba;
                pvVar29 = bottom_blob->data;
                sVar2 = bottom_blob->elemsize;
                pvVar32 = top_blob->data;
                sVar3 = bottom_blob->cstep;
                pMVar25 = (Mat *)(ulong)uVar24;
                pMVar13 = (Mat *)0x0;
                in_R11D = 0;
                do {
                  if (0 < (int)uVar24) {
                    pMVar20 = (Mat *)0x0;
                    do {
                      *(float *)((long)pvVar32 + (long)pMVar20 * 4) =
                           *(float *)((long)pvVar29 + (long)pMVar20 * 4) *
                           *(float *)((long)pvVar32 + (long)pMVar20 * 4);
                      pMVar20 = (Mat *)((long)&pMVar20->data + 1);
                    } while (pMVar25 != pMVar20);
                  }
                  pMVar13 = (Mat *)((long)&pMVar13->data + 1);
                  pvVar29 = (void *)((long)pvVar29 + sVar2 * sVar3);
                  uVar26 = false;
                } while (pMVar13 != pMVar16);
              }
              else {
                uVar26 = true;
                if (reduce_c == false && (bVar23 & 1) == 0) {
                  pMVar25 = pMVar13;
                  Mat::create(top_blob,uVar12,uVar21,sVar2,opt->blob_allocator);
                  auVar52 = _DAT_00315150;
                  auVar54 = _DAT_00315140;
                  auVar134 = _DAT_003150d0;
                  uVar24 = top_blob->c * (int)top_blob->cstep;
                  if (0 < (int)uVar24) {
                    pvVar29 = top_blob->data;
                    lVar31 = (ulong)uVar24 - 1;
                    auVar85._8_4_ = (int)lVar31;
                    auVar85._0_8_ = lVar31;
                    auVar85._12_4_ = (int)((ulong)lVar31 >> 0x20);
                    uVar22 = 0;
                    auVar85 = auVar85 ^ _DAT_003150d0;
                    do {
                      auVar196._8_4_ = (int)uVar22;
                      auVar196._0_8_ = uVar22;
                      auVar196._12_4_ = (int)(uVar22 >> 0x20);
                      auVar281 = (auVar196 | auVar52) ^ auVar134;
                      iVar10 = auVar85._4_4_;
                      iVar9 = auVar85._12_4_;
                      if ((bool)(~(auVar281._4_4_ == iVar10 && auVar85._0_4_ < auVar281._0_4_ ||
                                  iVar10 < auVar281._4_4_) & 1)) {
                        *(undefined4 *)((long)pvVar29 + uVar22 * 4) = 0x3f800000;
                      }
                      if ((auVar281._12_4_ != iVar9 || auVar281._8_4_ <= auVar85._8_4_) &&
                          auVar281._12_4_ <= iVar9) {
                        *(undefined4 *)((long)pvVar29 + uVar22 * 4 + 4) = 0x3f800000;
                      }
                      auVar281 = (auVar196 | auVar54) ^ auVar134;
                      auVar291._0_4_ = -(uint)(auVar85._0_4_ < auVar281._0_4_);
                      auVar291._4_4_ = -(uint)(iVar10 < auVar281._4_4_);
                      auVar291._8_4_ = -(uint)(auVar85._8_4_ < auVar281._8_4_);
                      auVar291._12_4_ = -(uint)(iVar9 < auVar281._12_4_);
                      iVar10 = -(uint)(auVar281._4_4_ == iVar10);
                      iVar9 = -(uint)(auVar281._12_4_ == iVar9);
                      auVar333._4_4_ = iVar10;
                      auVar333._0_4_ = iVar10;
                      auVar333._8_4_ = iVar9;
                      auVar333._12_4_ = iVar9;
                      auVar197._4_4_ = auVar291._4_4_;
                      auVar197._0_4_ = auVar291._4_4_;
                      auVar197._8_4_ = auVar291._12_4_;
                      auVar197._12_4_ = auVar291._12_4_;
                      auVar198._8_4_ = 0xffffffff;
                      auVar198._0_8_ = 0xffffffffffffffff;
                      auVar198._12_4_ = 0xffffffff;
                      auVar198 = (auVar197 | auVar333 & auVar291) ^ auVar198;
                      if ((auVar198 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        *(undefined4 *)((long)pvVar29 + uVar22 * 4 + 8) = 0x3f800000;
                      }
                      pMVar25 = (Mat *)(ulong)auVar198._8_2_;
                      if ((auVar198 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        *(undefined4 *)((long)pvVar29 + uVar22 * 4 + 0xc) = 0x3f800000;
                      }
                      uVar22 = uVar22 + 4;
                    } while ((uVar24 + 3 & 0xfffffffc) != uVar22);
                  }
                  if ((int)uVar21 < 1) goto LAB_002096ba;
                  pvVar29 = bottom_blob->data;
                  sVar2 = bottom_blob->elemsize;
                  pbVar18 = (bool *)top_blob->data;
                  sVar3 = bottom_blob->cstep;
                  pMVar25 = (Mat *)((long)top_blob->w * top_blob->elemsize);
                  pMVar20 = (Mat *)0x0;
                  do {
                    if (0 < (int)uVar11) {
                      uVar21 = 0;
                      pvVar32 = pvVar29;
                      do {
                        if (0 < (int)uVar12) {
                          pMVar30 = (Mat *)0x0;
                          do {
                            *(float *)(pbVar18 + (long)pMVar30 * 4) =
                                 *(float *)((long)pvVar32 + (long)pMVar30 * 4) *
                                 *(float *)(pbVar18 + (long)pMVar30 * 4);
                            pMVar30 = (Mat *)((long)&pMVar30->data + 1);
                          } while (pMVar13 != pMVar30);
                        }
                        uVar21 = uVar21 + 1;
                        pvVar32 = (void *)((long)pvVar32 + (long)(int)uVar12 * 4);
                      } while (uVar21 != uVar11);
                    }
                    pMVar20 = (Mat *)((long)&pMVar20->data + 1);
                    pvVar29 = (void *)((long)pvVar29 + sVar2 * sVar3);
                    pbVar18 = (bool *)((long)&pMVar25->data + (long)pbVar18);
                    uVar26 = false;
                    in_R11D = 0;
                  } while (pMVar20 != pMVar16);
                }
              }
              goto joined_r0x002096c9;
            }
            Mat::create(top_blob,uVar11,sVar2,opt->blob_allocator);
            sums.cstep = 0;
            sums.data = (void *)0x0;
            sums.refcount._0_4_ = 0;
            sums.refcount._4_4_ = 0;
            sums.elemsize._0_4_ = 0;
            sums.elemsize._4_4_ = 0;
            sums.elempack = 0;
            sums.allocator = (Allocator *)0x0;
            sums.dims = 0;
            sums.w = 0;
            sums.h = 0;
            sums.d = 0;
            sums.c = 0;
            pMVar25 = (Mat *)0x1;
            Mat::create(&sums,1,uVar11,uVar21,sVar2,opt->workspace_allocator);
            auVar52 = _DAT_00315150;
            auVar54 = _DAT_00315140;
            auVar134 = _DAT_003150d0;
            in_R11D = -100;
            if ((sums.data != (void *)0x0) &&
               (pMVar25 = (Mat *)(sums.cstep * (long)sums.c), pMVar25 != (Mat *)0x0)) {
              uVar24 = (int)sums.cstep * sums.c;
              if (0 < (int)uVar24) {
                lVar19 = (ulong)uVar24 - 1;
                auVar90._8_4_ = (int)lVar19;
                auVar90._0_8_ = lVar19;
                auVar90._12_4_ = (int)((ulong)lVar19 >> 0x20);
                uVar33 = 0;
                auVar90 = auVar90 ^ _DAT_003150d0;
                do {
                  auVar211._8_4_ = (int)uVar33;
                  auVar211._0_8_ = uVar33;
                  auVar211._12_4_ = (int)(uVar33 >> 0x20);
                  auVar281 = (auVar211 | auVar52) ^ auVar134;
                  iVar10 = auVar90._4_4_;
                  iVar9 = auVar90._12_4_;
                  if ((bool)(~(auVar281._4_4_ == iVar10 && auVar90._0_4_ < auVar281._0_4_ ||
                              iVar10 < auVar281._4_4_) & 1)) {
                    *(undefined4 *)((long)sums.data + uVar33 * 4) = 0x3f800000;
                  }
                  if ((auVar281._12_4_ != iVar9 || auVar281._8_4_ <= auVar90._8_4_) &&
                      auVar281._12_4_ <= iVar9) {
                    *(undefined4 *)((long)sums.data + uVar33 * 4 + 4) = 0x3f800000;
                  }
                  auVar281 = (auVar211 | auVar54) ^ auVar134;
                  auVar296._0_4_ = -(uint)(auVar90._0_4_ < auVar281._0_4_);
                  auVar296._4_4_ = -(uint)(iVar10 < auVar281._4_4_);
                  auVar296._8_4_ = -(uint)(auVar90._8_4_ < auVar281._8_4_);
                  auVar296._12_4_ = -(uint)(iVar9 < auVar281._12_4_);
                  iVar10 = -(uint)(auVar281._4_4_ == iVar10);
                  iVar9 = -(uint)(auVar281._12_4_ == iVar9);
                  auVar338._4_4_ = iVar10;
                  auVar338._0_4_ = iVar10;
                  auVar338._8_4_ = iVar9;
                  auVar338._12_4_ = iVar9;
                  auVar212._4_4_ = auVar296._4_4_;
                  auVar212._0_4_ = auVar296._4_4_;
                  auVar212._8_4_ = auVar296._12_4_;
                  auVar212._12_4_ = auVar296._12_4_;
                  auVar213._8_4_ = 0xffffffff;
                  auVar213._0_8_ = 0xffffffffffffffff;
                  auVar213._12_4_ = 0xffffffff;
                  auVar213 = (auVar212 | auVar338 & auVar296) ^ auVar213;
                  if ((auVar213 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    *(undefined4 *)((long)sums.data + uVar33 * 4 + 8) = 0x3f800000;
                  }
                  pMVar25 = (Mat *)(ulong)auVar213._8_2_;
                  if ((auVar213 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    *(undefined4 *)((long)sums.data + uVar33 * 4 + 0xc) = 0x3f800000;
                  }
                  uVar33 = uVar33 + 4;
                } while ((uVar24 + 3 & 0xfffffffc) != uVar33);
              }
              if (0 < (int)uVar21) {
                pvVar29 = bottom_blob->data;
                sVar2 = bottom_blob->elemsize;
                pMVar25 = (Mat *)(CONCAT44(sums.elemsize._4_4_,(undefined4)sums.elemsize) *
                                 sums.cstep);
                sVar3 = bottom_blob->cstep;
                pMVar20 = (Mat *)0x0;
                do {
                  if (0 < (int)uVar11) {
                    uVar33 = 0;
                    pvVar32 = pvVar29;
                    do {
                      auVar133 = ZEXT816(0x3f800000);
                      if (0 < (int)uVar12) {
                        pMVar30 = (Mat *)0x0;
                        auVar133 = ZEXT816(0x3f800000);
                        do {
                          auVar133._0_4_ =
                               auVar133._0_4_ * *(float *)((long)pvVar32 + (long)pMVar30 * 4);
                          pMVar30 = (Mat *)((long)&pMVar30->data + 1);
                        } while (pMVar13 != pMVar30);
                      }
                      *(int *)((long)sums.data + uVar33 * 4 + (long)pMVar25 * (long)pMVar20) =
                           auVar133._0_4_;
                      uVar33 = uVar33 + 1;
                      pvVar32 = (void *)((long)pvVar32 + lVar31 * 4);
                    } while (uVar33 != uVar22);
                  }
                  pMVar20 = (Mat *)((long)&pMVar20->data + 1);
                  pvVar29 = (void *)((long)pvVar29 + sVar2 * sVar3);
                } while (pMVar20 != pMVar16);
              }
              auVar52 = _DAT_00315150;
              auVar54 = _DAT_00315140;
              auVar134 = _DAT_003150d0;
              uVar12 = top_blob->c * (int)top_blob->cstep;
              if (0 < (int)uVar12) {
                pvVar29 = top_blob->data;
                lVar31 = (ulong)uVar12 - 1;
                auVar91._8_4_ = (int)lVar31;
                auVar91._0_8_ = lVar31;
                auVar91._12_4_ = (int)((ulong)lVar31 >> 0x20);
                uVar33 = 0;
                auVar91 = auVar91 ^ _DAT_003150d0;
                do {
                  auVar214._8_4_ = (int)uVar33;
                  auVar214._0_8_ = uVar33;
                  auVar214._12_4_ = (int)(uVar33 >> 0x20);
                  auVar281 = (auVar214 | auVar52) ^ auVar134;
                  iVar10 = auVar91._4_4_;
                  iVar9 = auVar91._12_4_;
                  if ((bool)(~(auVar281._4_4_ == iVar10 && auVar91._0_4_ < auVar281._0_4_ ||
                              iVar10 < auVar281._4_4_) & 1)) {
                    *(undefined4 *)((long)pvVar29 + uVar33 * 4) = 0x3f800000;
                  }
                  if ((auVar281._12_4_ != iVar9 || auVar281._8_4_ <= auVar91._8_4_) &&
                      auVar281._12_4_ <= iVar9) {
                    *(undefined4 *)((long)pvVar29 + uVar33 * 4 + 4) = 0x3f800000;
                  }
                  auVar281 = (auVar214 | auVar54) ^ auVar134;
                  auVar297._0_4_ = -(uint)(auVar91._0_4_ < auVar281._0_4_);
                  auVar297._4_4_ = -(uint)(iVar10 < auVar281._4_4_);
                  auVar297._8_4_ = -(uint)(auVar91._8_4_ < auVar281._8_4_);
                  auVar297._12_4_ = -(uint)(iVar9 < auVar281._12_4_);
                  iVar10 = -(uint)(auVar281._4_4_ == iVar10);
                  iVar9 = -(uint)(auVar281._12_4_ == iVar9);
                  auVar339._4_4_ = iVar10;
                  auVar339._0_4_ = iVar10;
                  auVar339._8_4_ = iVar9;
                  auVar339._12_4_ = iVar9;
                  auVar215._4_4_ = auVar297._4_4_;
                  auVar215._0_4_ = auVar297._4_4_;
                  auVar215._8_4_ = auVar297._12_4_;
                  auVar215._12_4_ = auVar297._12_4_;
                  auVar216._8_4_ = 0xffffffff;
                  auVar216._0_8_ = 0xffffffffffffffff;
                  auVar216._12_4_ = 0xffffffff;
                  auVar216 = (auVar215 | auVar339 & auVar297) ^ auVar216;
                  if ((auVar216 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    *(undefined4 *)((long)pvVar29 + uVar33 * 4 + 8) = 0x3f800000;
                  }
                  pMVar25 = (Mat *)(ulong)auVar216._8_2_;
                  if ((auVar216 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    *(undefined4 *)((long)pvVar29 + uVar33 * 4 + 0xc) = 0x3f800000;
                  }
                  uVar33 = uVar33 + 4;
                } while ((uVar12 + 3 & 0xfffffffc) != uVar33);
              }
              if (0 < (int)uVar21) {
                pvVar29 = top_blob->data;
                pMVar25 = (Mat *)0x0;
                pvVar32 = sums.data;
                do {
                  if (0 < (int)uVar11) {
                    uVar33 = 0;
                    do {
                      *(float *)((long)pvVar29 + uVar33 * 4) =
                           *(float *)((long)pvVar32 + uVar33 * 4) *
                           *(float *)((long)pvVar29 + uVar33 * 4);
                      uVar33 = uVar33 + 1;
                    } while (uVar22 != uVar33);
                  }
                  pMVar25 = (Mat *)((long)&pMVar25->data + 1);
                  pvVar32 = (void *)((long)pvVar32 +
                                    CONCAT44(sums.elemsize._4_4_,(undefined4)sums.elemsize) *
                                    sums.cstep);
                } while (pMVar25 != pMVar16);
              }
              in_R11D = 0;
            }
            Mat::~Mat(&sums);
          }
          uVar26 = false;
        }
        goto joined_r0x002096c9;
      }
    }
    else {
      if (iVar10 == 2) {
        uVar12 = bottom_blob->w;
        pMVar13 = (Mat *)(ulong)uVar12;
        uVar11 = bottom_blob->h;
        pMVar16 = (Mat *)(ulong)uVar11;
        auVar43._8_4_ = 0xffffffff;
        auVar43._0_8_ = 0xffffffffffffffff;
        auVar43._12_4_ = 0xffffffff;
        auVar44._0_8_ = SUB168(auVar43 ^ auVar134,0) << 0x3f;
        auVar44._8_8_ = SUB168(auVar43 ^ auVar134,8) << 0x3f;
        iVar9 = movmskpd(iVar9,auVar44);
        if (iVar9 == 0) {
          Mat::create(top_blob,1,1,sVar2,opt->blob_allocator);
          sums.cstep = 0;
          sums.data = (void *)0x0;
          sums.refcount._0_4_ = 0;
          sums.refcount._4_4_ = 0;
          sums.elemsize._0_4_ = 0;
          sums.elemsize._4_4_ = 0;
          sums.elempack = 0;
          sums.allocator = (Allocator *)0x0;
          sums.dims = 0;
          sums.w = 0;
          sums.h = 0;
          sums.d = 0;
          sums.c = 0;
          pMVar25 = (Mat *)(ulong)uVar11;
          Mat::create(&sums,uVar11,sVar2,opt->workspace_allocator);
          in_R11D = -100;
          if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
            if ((int)uVar11 < 1) {
              fVar36 = 1.0;
            }
            else {
              pvVar29 = bottom_blob->data;
              iVar9 = bottom_blob->w;
              sVar3 = bottom_blob->elemsize;
              pMVar25 = (Mat *)0x0;
              do {
                auVar112 = ZEXT816(0x3f800000);
                if (0 < (int)uVar12) {
                  pMVar20 = (Mat *)0x0;
                  auVar112 = ZEXT816(0x3f800000);
                  do {
                    auVar112._0_4_ = auVar112._0_4_ * *(float *)((long)pvVar29 + (long)pMVar20 * 4);
                    pMVar20 = (Mat *)((long)&pMVar20->data + 1);
                  } while (pMVar13 != pMVar20);
                }
                *(int *)((long)sums.data + (long)pMVar25 * 4) = auVar112._0_4_;
                pMVar25 = (Mat *)((long)&pMVar25->data + 1);
                pvVar29 = (void *)((long)pvVar29 + (long)iVar9 * sVar3);
              } while (pMVar25 != pMVar16);
              fVar36 = 1.0;
              pMVar13 = (Mat *)0x0;
              do {
                fVar36 = fVar36 * *(float *)((long)sums.data + (long)pMVar13 * 4);
                pMVar13 = (Mat *)((long)&pMVar13->data + 1);
              } while (pMVar16 != pMVar13);
            }
            *(float *)top_blob->data = fVar36;
            in_R11D = 0;
          }
          piVar7 = (int *)CONCAT44(sums.refcount._4_4_,sums.refcount._0_4_);
          if (piVar7 != (int *)0x0) {
            LOCK();
            *piVar7 = *piVar7 + -1;
            UNLOCK();
            if (*piVar7 == 0) {
              pMVar25 = (Mat *)sums.data;
              if (sums.allocator == (Allocator *)0x0) {
                if (sums.data != (void *)0x0) {
                  free(sums.data);
                }
              }
              else {
                (*(sums.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          iVar9 = 0;
        }
        else if (((bVar17 | (byte)iVar9 >> 1) & 1) == 0) {
          pMVar25 = (Mat *)0x1;
          Mat::create(top_blob,1,uVar11,sVar2,opt->blob_allocator);
          if (0 < (int)uVar11) {
            iVar9 = bottom_blob->w;
            sVar3 = bottom_blob->elemsize;
            pvVar29 = bottom_blob->data;
            pvVar32 = top_blob->data;
            pMVar25 = (Mat *)0x0;
            do {
              auVar118 = ZEXT816(0x3f800000);
              if (0 < (int)uVar12) {
                pMVar20 = (Mat *)0x0;
                auVar118 = ZEXT816(0x3f800000);
                do {
                  auVar118._0_4_ = auVar118._0_4_ * *(float *)((long)pvVar29 + (long)pMVar20 * 4);
                  pMVar20 = (Mat *)((long)&pMVar20->data + 1);
                } while (pMVar13 != pMVar20);
              }
              *(int *)((long)pvVar32 + (long)pMVar25 * 4) = auVar118._0_4_;
              pMVar25 = (Mat *)((long)&pMVar25->data + 1);
              pvVar29 = (void *)((long)pvVar29 + (long)iVar9 * sVar3);
            } while (pMVar25 != pMVar16);
            goto LAB_00202522;
          }
          iVar9 = 0;
          in_R11D = 0;
        }
        else if (((bVar8 | (byte)iVar9) & 1) == 0) {
          pMVar25 = pMVar13;
          Mat::create(top_blob,uVar12,1,sVar2,opt->blob_allocator);
          auVar281 = _DAT_00315150;
          auVar52 = _DAT_00315140;
          auVar54 = _DAT_003150d0;
          uVar21 = top_blob->c * (int)top_blob->cstep;
          if (0 < (int)uVar21) {
            pvVar29 = top_blob->data;
            lVar31 = (ulong)uVar21 - 1;
            auVar57._8_4_ = (int)lVar31;
            auVar57._0_8_ = lVar31;
            auVar57._12_4_ = (int)((ulong)lVar31 >> 0x20);
            uVar22 = 0;
            auVar57 = auVar57 ^ _DAT_003150d0;
            do {
              auVar151._8_4_ = (int)uVar22;
              auVar151._0_8_ = uVar22;
              auVar151._12_4_ = (int)(uVar22 >> 0x20);
              auVar274 = (auVar151 | auVar281) ^ auVar54;
              iVar9 = auVar57._4_4_;
              iVar271 = auVar57._12_4_;
              if ((bool)(~(auVar274._4_4_ == iVar9 && auVar57._0_4_ < auVar274._0_4_ ||
                          iVar9 < auVar274._4_4_) & 1)) {
                *(undefined4 *)((long)pvVar29 + uVar22 * 4) = 0x3f800000;
              }
              if ((auVar274._12_4_ != iVar271 || auVar274._8_4_ <= auVar57._8_4_) &&
                  auVar274._12_4_ <= iVar271) {
                *(undefined4 *)((long)pvVar29 + uVar22 * 4 + 4) = 0x3f800000;
              }
              auVar274 = (auVar151 | auVar52) ^ auVar54;
              auVar275._0_4_ = -(uint)(auVar57._0_4_ < auVar274._0_4_);
              auVar275._4_4_ = -(uint)(iVar9 < auVar274._4_4_);
              auVar275._8_4_ = -(uint)(auVar57._8_4_ < auVar274._8_4_);
              auVar275._12_4_ = -(uint)(iVar271 < auVar274._12_4_);
              iVar9 = -(uint)(auVar274._4_4_ == iVar9);
              iVar271 = -(uint)(auVar274._12_4_ == iVar271);
              auVar318._4_4_ = iVar9;
              auVar318._0_4_ = iVar9;
              auVar318._8_4_ = iVar271;
              auVar318._12_4_ = iVar271;
              auVar152._4_4_ = auVar275._4_4_;
              auVar152._0_4_ = auVar275._4_4_;
              auVar152._8_4_ = auVar275._12_4_;
              auVar152._12_4_ = auVar275._12_4_;
              auVar153._8_4_ = 0xffffffff;
              auVar153._0_8_ = 0xffffffffffffffff;
              auVar153._12_4_ = 0xffffffff;
              auVar153 = (auVar152 | auVar318 & auVar275) ^ auVar153;
              if ((auVar153 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined4 *)((long)pvVar29 + uVar22 * 4 + 8) = 0x3f800000;
              }
              pMVar25 = (Mat *)(ulong)auVar153._8_2_;
              if ((auVar153 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined4 *)((long)pvVar29 + uVar22 * 4 + 0xc) = 0x3f800000;
              }
              uVar22 = uVar22 + 4;
            } while ((uVar21 + 3 & 0xfffffffc) != uVar22);
          }
          if (0 < (int)uVar11) {
            pvVar29 = bottom_blob->data;
            iVar9 = bottom_blob->w;
            sVar3 = bottom_blob->elemsize;
            pvVar32 = top_blob->data;
            pMVar25 = (Mat *)0x0;
            do {
              if (0 < (int)uVar12) {
                pMVar20 = (Mat *)0x0;
                do {
                  *(float *)((long)pvVar32 + (long)pMVar20 * 4) =
                       *(float *)((long)pvVar29 + (long)pMVar20 * 4) *
                       *(float *)((long)pvVar32 + (long)pMVar20 * 4);
                  pMVar20 = (Mat *)((long)&pMVar20->data + 1);
                } while (pMVar13 != pMVar20);
              }
              pMVar25 = (Mat *)((long)&pMVar25->data + 1);
              pvVar29 = (void *)((long)pvVar29 + (long)iVar9 * sVar3);
            } while (pMVar25 != pMVar16);
          }
LAB_00202522:
          iVar9 = 0;
          in_R11D = 0;
        }
        else {
          iVar9 = (int)CONCAT71((uint7)(uint3)((uint)iVar9 >> 8),1);
        }
        if ((char)iVar9 == '\0') break;
      }
      else if (iVar10 == 1) {
        iVar10 = bottom_blob->w;
        pMVar25 = (Mat *)0x1;
        Mat::create(top_blob,1,sVar2,opt->blob_allocator);
        if ((long)iVar10 < 1) {
LAB_0020111d:
          fVar36 = 1.0;
        }
        else {
          fVar36 = 1.0;
          lVar31 = 0;
          do {
            fVar36 = fVar36 * *(float *)((long)bottom_blob->data + lVar31 * 4);
            lVar31 = lVar31 + 1;
          } while (iVar10 != lVar31);
        }
LAB_00201125:
        *(float *)top_blob->data = fVar36;
        in_R11D = 0;
        break;
      }
      if (iVar10 == 3) {
        uVar12 = bottom_blob->w;
        lVar31 = (long)(int)uVar12;
        uVar11 = bottom_blob->h;
        uVar22 = (ulong)uVar11;
        uVar21 = bottom_blob->c;
        pMVar16 = (Mat *)(ulong)uVar21;
        uVar24 = uVar11 * uVar12;
        auVar67._8_4_ = 0xffffffff;
        auVar67._0_8_ = 0xffffffffffffffff;
        auVar67._12_4_ = 0xffffffff;
        auVar68._0_8_ = SUB168(auVar67 ^ auVar134,0) << 0x3f;
        auVar68._8_8_ = SUB168(auVar67 ^ auVar134,8) << 0x3f;
        iVar10 = movmskpd(iVar9,auVar68);
        bVar14 = reduce_c ^ 1;
        if (iVar10 == 0 && bVar14 == 0) {
          Mat::create(top_blob,1,1,1,sVar2,opt->blob_allocator);
          sums.cstep = 0;
          sums.data = (void *)0x0;
          sums.refcount._0_4_ = 0;
          sums.refcount._4_4_ = 0;
          sums.elemsize._0_4_ = 0;
          sums.elemsize._4_4_ = 0;
          sums.elempack = 0;
          sums.allocator = (Allocator *)0x0;
          sums.dims = 0;
          sums.w = 0;
          sums.h = 0;
          sums.d = 0;
          sums.c = 0;
          pMVar25 = pMVar16;
          Mat::create(&sums,uVar21,sVar2,opt->workspace_allocator);
          in_R11D = -100;
          if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
            if ((int)uVar21 < 1) {
              fVar36 = 1.0;
            }
            else {
              sVar2 = bottom_blob->elemsize;
              sVar3 = bottom_blob->cstep;
              pvVar29 = bottom_blob->data;
              pMVar25 = (Mat *)(ulong)uVar24;
              pMVar13 = (Mat *)0x0;
              do {
                fVar36 = 1.0;
                if (0 < (int)uVar24) {
                  pMVar20 = (Mat *)0x0;
                  fVar36 = 1.0;
                  do {
                    fVar36 = fVar36 * *(float *)((long)pvVar29 + (long)pMVar20 * 4);
                    pMVar20 = (Mat *)((long)&pMVar20->data + 1);
                  } while (pMVar25 != pMVar20);
                }
                *(float *)((long)sums.data + (long)pMVar13 * 4) = fVar36;
                pMVar13 = (Mat *)((long)&pMVar13->data + 1);
                pvVar29 = (void *)((long)pvVar29 + sVar2 * sVar3);
              } while (pMVar13 != pMVar16);
              fVar36 = 1.0;
              pMVar13 = (Mat *)0x0;
              do {
                fVar36 = fVar36 * *(float *)((long)sums.data + (long)pMVar13 * 4);
                pMVar13 = (Mat *)((long)&pMVar13->data + 1);
              } while (pMVar16 != pMVar13);
            }
            *(float *)top_blob->data = fVar36;
            in_R11D = 0;
          }
          piVar7 = (int *)CONCAT44(sums.refcount._4_4_,sums.refcount._0_4_);
          if (piVar7 != (int *)0x0) {
            LOCK();
            *piVar7 = *piVar7 + -1;
            UNLOCK();
            if (*piVar7 == 0) {
              pMVar25 = (Mat *)sums.data;
              if (sums.allocator == (Allocator *)0x0) {
                if (sums.data != (void *)0x0) {
                  free(sums.data);
                }
              }
              else {
                (*(sums.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          uVar26 = false;
        }
        else if (iVar10 == 0 && reduce_c == false) {
          pMVar25 = (Mat *)0x1;
          Mat::create(top_blob,1,1,uVar21,sVar2,opt->blob_allocator);
          if ((int)uVar21 < 1) goto LAB_00203c7a;
          pvVar29 = bottom_blob->data;
          sVar2 = bottom_blob->elemsize;
          sVar3 = top_blob->elemsize;
          sVar4 = bottom_blob->cstep;
          sVar5 = top_blob->cstep;
          pMVar25 = (Mat *)top_blob->data;
          pMVar13 = (Mat *)0x0;
          do {
            fVar36 = 1.0;
            if (0 < (int)uVar24) {
              uVar22 = 0;
              fVar36 = 1.0;
              do {
                fVar36 = fVar36 * *(float *)((long)pvVar29 + uVar22 * 4);
                uVar22 = uVar22 + 1;
              } while (uVar24 != uVar22);
            }
            *(float *)((long)&pMVar25->data + sVar3 * sVar5 * (long)pMVar13) = fVar36;
            pMVar13 = (Mat *)((long)&pMVar13->data + 1);
            pvVar29 = (void *)((long)pvVar29 + sVar2 * sVar4);
          } while (pMVar13 != pMVar16);
LAB_00203c6f:
          uVar26 = false;
          in_R11D = 0;
        }
        else {
          pMVar13 = (Mat *)(ulong)uVar12;
          bVar23 = (byte)iVar10 >> 1 | bVar17;
          if (reduce_c == false && (bVar23 & 1) == 0) {
            pMVar25 = (Mat *)0x1;
            Mat::create(top_blob,1,uVar11,uVar21,sVar2,opt->blob_allocator);
            if (0 < (int)uVar21) {
              pvVar29 = bottom_blob->data;
              sVar2 = bottom_blob->elemsize;
              pvVar32 = top_blob->data;
              pMVar25 = (Mat *)(top_blob->elemsize * top_blob->cstep);
              sVar3 = bottom_blob->cstep;
              pMVar20 = (Mat *)0x0;
              do {
                if (0 < (int)uVar11) {
                  uVar33 = 0;
                  pvVar28 = pvVar29;
                  do {
                    auVar124 = ZEXT816(0x3f800000);
                    if (0 < (int)uVar12) {
                      pMVar30 = (Mat *)0x0;
                      auVar124 = ZEXT816(0x3f800000);
                      do {
                        auVar124._0_4_ =
                             auVar124._0_4_ * *(float *)((long)pvVar28 + (long)pMVar30 * 4);
                        pMVar30 = (Mat *)((long)&pMVar30->data + 1);
                      } while (pMVar13 != pMVar30);
                    }
                    *(int *)((long)pvVar32 + uVar33 * 4 + (long)pMVar25 * (long)pMVar20) =
                         auVar124._0_4_;
                    uVar33 = uVar33 + 1;
                    pvVar28 = (void *)((long)pvVar28 + lVar31 * 4);
                  } while (uVar33 != uVar22);
                }
                pMVar20 = (Mat *)((long)&pMVar20->data + 1);
                pvVar29 = (void *)((long)pvVar29 + sVar2 * sVar3);
              } while (pMVar20 != pMVar16);
              goto LAB_00203c6f;
            }
LAB_00203c7a:
            in_R11D = 0;
          }
          else {
            if ((bVar23 & 1) == 0 && bVar14 == 0) {
              Mat::create(top_blob,1,uVar11,1,sVar2,opt->blob_allocator);
              sums.cstep = 0;
              sums.data = (void *)0x0;
              sums.refcount._0_4_ = 0;
              sums.refcount._4_4_ = 0;
              sums.elemsize._0_4_ = 0;
              sums.elemsize._4_4_ = 0;
              sums.elempack = 0;
              sums.allocator = (Allocator *)0x0;
              sums.dims = 0;
              sums.w = 0;
              sums.h = 0;
              sums.d = 0;
              sums.c = 0;
              pMVar25 = (Mat *)0x1;
              Mat::create(&sums,1,uVar11,uVar21,sVar2,opt->workspace_allocator);
              auVar52 = _DAT_00315150;
              auVar54 = _DAT_00315140;
              auVar134 = _DAT_003150d0;
              in_R11D = -100;
              if ((sums.data != (void *)0x0) &&
                 (pMVar25 = (Mat *)(sums.cstep * (long)sums.c), pMVar25 != (Mat *)0x0)) {
                uVar24 = (int)sums.cstep * sums.c;
                if (0 < (int)uVar24) {
                  lVar19 = (ulong)uVar24 - 1;
                  auVar75._8_4_ = (int)lVar19;
                  auVar75._0_8_ = lVar19;
                  auVar75._12_4_ = (int)((ulong)lVar19 >> 0x20);
                  uVar33 = 0;
                  auVar75 = auVar75 ^ _DAT_003150d0;
                  do {
                    auVar184._8_4_ = (int)uVar33;
                    auVar184._0_8_ = uVar33;
                    auVar184._12_4_ = (int)(uVar33 >> 0x20);
                    auVar281 = (auVar184 | auVar52) ^ auVar134;
                    iVar10 = auVar75._4_4_;
                    iVar9 = auVar75._12_4_;
                    if ((bool)(~(auVar281._4_4_ == iVar10 && auVar75._0_4_ < auVar281._0_4_ ||
                                iVar10 < auVar281._4_4_) & 1)) {
                      *(undefined4 *)((long)sums.data + uVar33 * 4) = 0x3f800000;
                    }
                    if ((auVar281._12_4_ != iVar9 || auVar281._8_4_ <= auVar75._8_4_) &&
                        auVar281._12_4_ <= iVar9) {
                      *(undefined4 *)((long)sums.data + uVar33 * 4 + 4) = 0x3f800000;
                    }
                    auVar281 = (auVar184 | auVar54) ^ auVar134;
                    auVar287._0_4_ = -(uint)(auVar75._0_4_ < auVar281._0_4_);
                    auVar287._4_4_ = -(uint)(iVar10 < auVar281._4_4_);
                    auVar287._8_4_ = -(uint)(auVar75._8_4_ < auVar281._8_4_);
                    auVar287._12_4_ = -(uint)(iVar9 < auVar281._12_4_);
                    iVar10 = -(uint)(auVar281._4_4_ == iVar10);
                    iVar9 = -(uint)(auVar281._12_4_ == iVar9);
                    auVar329._4_4_ = iVar10;
                    auVar329._0_4_ = iVar10;
                    auVar329._8_4_ = iVar9;
                    auVar329._12_4_ = iVar9;
                    auVar185._4_4_ = auVar287._4_4_;
                    auVar185._0_4_ = auVar287._4_4_;
                    auVar185._8_4_ = auVar287._12_4_;
                    auVar185._12_4_ = auVar287._12_4_;
                    auVar186._8_4_ = 0xffffffff;
                    auVar186._0_8_ = 0xffffffffffffffff;
                    auVar186._12_4_ = 0xffffffff;
                    auVar186 = (auVar185 | auVar329 & auVar287) ^ auVar186;
                    if ((auVar186 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      *(undefined4 *)((long)sums.data + uVar33 * 4 + 8) = 0x3f800000;
                    }
                    pMVar25 = (Mat *)(ulong)auVar186._8_2_;
                    if ((auVar186 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      *(undefined4 *)((long)sums.data + uVar33 * 4 + 0xc) = 0x3f800000;
                    }
                    uVar33 = uVar33 + 4;
                  } while ((uVar24 + 3 & 0xfffffffc) != uVar33);
                }
                if (0 < (int)uVar21) {
                  pvVar29 = bottom_blob->data;
                  sVar2 = bottom_blob->elemsize;
                  pMVar25 = (Mat *)(CONCAT44(sums.elemsize._4_4_,(undefined4)sums.elemsize) *
                                   sums.cstep);
                  sVar3 = bottom_blob->cstep;
                  pMVar20 = (Mat *)0x0;
                  do {
                    if (0 < (int)uVar11) {
                      uVar33 = 0;
                      pvVar32 = pvVar29;
                      do {
                        auVar127 = ZEXT816(0x3f800000);
                        if (0 < (int)uVar12) {
                          pMVar30 = (Mat *)0x0;
                          auVar127 = ZEXT816(0x3f800000);
                          do {
                            auVar127._0_4_ =
                                 auVar127._0_4_ * *(float *)((long)pvVar32 + (long)pMVar30 * 4);
                            pMVar30 = (Mat *)((long)&pMVar30->data + 1);
                          } while (pMVar13 != pMVar30);
                        }
                        *(int *)((long)sums.data + uVar33 * 4 + (long)pMVar25 * (long)pMVar20) =
                             auVar127._0_4_;
                        uVar33 = uVar33 + 1;
                        pvVar32 = (void *)((long)pvVar32 + lVar31 * 4);
                      } while (uVar33 != uVar22);
                    }
                    pMVar20 = (Mat *)((long)&pMVar20->data + 1);
                    pvVar29 = (void *)((long)pvVar29 + sVar2 * sVar3);
                  } while (pMVar20 != pMVar16);
                }
                auVar52 = _DAT_00315150;
                auVar54 = _DAT_00315140;
                auVar134 = _DAT_003150d0;
                uVar12 = top_blob->c * (int)top_blob->cstep;
                if (0 < (int)uVar12) {
                  pvVar29 = top_blob->data;
                  lVar31 = (ulong)uVar12 - 1;
                  auVar76._8_4_ = (int)lVar31;
                  auVar76._0_8_ = lVar31;
                  auVar76._12_4_ = (int)((ulong)lVar31 >> 0x20);
                  uVar33 = 0;
                  auVar76 = auVar76 ^ _DAT_003150d0;
                  do {
                    auVar187._8_4_ = (int)uVar33;
                    auVar187._0_8_ = uVar33;
                    auVar187._12_4_ = (int)(uVar33 >> 0x20);
                    auVar281 = (auVar187 | auVar52) ^ auVar134;
                    iVar10 = auVar76._4_4_;
                    iVar9 = auVar76._12_4_;
                    if ((bool)(~(auVar281._4_4_ == iVar10 && auVar76._0_4_ < auVar281._0_4_ ||
                                iVar10 < auVar281._4_4_) & 1)) {
                      *(undefined4 *)((long)pvVar29 + uVar33 * 4) = 0x3f800000;
                    }
                    if ((auVar281._12_4_ != iVar9 || auVar281._8_4_ <= auVar76._8_4_) &&
                        auVar281._12_4_ <= iVar9) {
                      *(undefined4 *)((long)pvVar29 + uVar33 * 4 + 4) = 0x3f800000;
                    }
                    auVar281 = (auVar187 | auVar54) ^ auVar134;
                    auVar288._0_4_ = -(uint)(auVar76._0_4_ < auVar281._0_4_);
                    auVar288._4_4_ = -(uint)(iVar10 < auVar281._4_4_);
                    auVar288._8_4_ = -(uint)(auVar76._8_4_ < auVar281._8_4_);
                    auVar288._12_4_ = -(uint)(iVar9 < auVar281._12_4_);
                    iVar10 = -(uint)(auVar281._4_4_ == iVar10);
                    iVar9 = -(uint)(auVar281._12_4_ == iVar9);
                    auVar330._4_4_ = iVar10;
                    auVar330._0_4_ = iVar10;
                    auVar330._8_4_ = iVar9;
                    auVar330._12_4_ = iVar9;
                    auVar188._4_4_ = auVar288._4_4_;
                    auVar188._0_4_ = auVar288._4_4_;
                    auVar188._8_4_ = auVar288._12_4_;
                    auVar188._12_4_ = auVar288._12_4_;
                    auVar189._8_4_ = 0xffffffff;
                    auVar189._0_8_ = 0xffffffffffffffff;
                    auVar189._12_4_ = 0xffffffff;
                    auVar189 = (auVar188 | auVar330 & auVar288) ^ auVar189;
                    if ((auVar189 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      *(undefined4 *)((long)pvVar29 + uVar33 * 4 + 8) = 0x3f800000;
                    }
                    pMVar25 = (Mat *)(ulong)auVar189._8_2_;
                    if ((auVar189 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      *(undefined4 *)((long)pvVar29 + uVar33 * 4 + 0xc) = 0x3f800000;
                    }
                    uVar33 = uVar33 + 4;
                  } while ((uVar12 + 3 & 0xfffffffc) != uVar33);
                }
                if (0 < (int)uVar21) {
                  pvVar29 = top_blob->data;
                  pMVar25 = (Mat *)0x0;
                  pvVar32 = sums.data;
                  do {
                    if (0 < (int)uVar11) {
                      uVar33 = 0;
                      do {
                        *(float *)((long)pvVar29 + uVar33 * 4) =
                             *(float *)((long)pvVar32 + uVar33 * 4) *
                             *(float *)((long)pvVar29 + uVar33 * 4);
                        uVar33 = uVar33 + 1;
                      } while (uVar22 != uVar33);
                    }
                    pMVar25 = (Mat *)((long)&pMVar25->data + 1);
                    pvVar32 = (void *)((long)pvVar32 +
                                      CONCAT44(sums.elemsize._4_4_,(undefined4)sums.elemsize) *
                                      sums.cstep);
                  } while (pMVar25 != pMVar16);
                }
                in_R11D = 0;
              }
            }
            else {
              pMVar25 = (Mat *)(ulong)uVar6;
              bVar23 = (byte)iVar10 | bVar8;
              if ((bVar23 & 1) != 0 || bVar14 != 0) {
                if (((bVar17 | bVar8) & 1) == 0 && bVar14 == 0) {
                  Mat::create(top_blob,uVar12,uVar11,1,sVar2,opt->blob_allocator);
                  auVar52 = _DAT_00315150;
                  auVar54 = _DAT_00315140;
                  auVar134 = _DAT_003150d0;
                  uVar12 = top_blob->c * (int)top_blob->cstep;
                  if (0 < (int)uVar12) {
                    pvVar29 = top_blob->data;
                    lVar31 = (ulong)uVar12 - 1;
                    auVar106._8_4_ = (int)lVar31;
                    auVar106._0_8_ = lVar31;
                    auVar106._12_4_ = (int)((ulong)lVar31 >> 0x20);
                    uVar22 = 0;
                    auVar106 = auVar106 ^ _DAT_003150d0;
                    do {
                      auVar259._8_4_ = (int)uVar22;
                      auVar259._0_8_ = uVar22;
                      auVar259._12_4_ = (int)(uVar22 >> 0x20);
                      auVar281 = (auVar259 | auVar52) ^ auVar134;
                      iVar10 = auVar106._4_4_;
                      iVar9 = auVar106._12_4_;
                      if ((bool)(~(auVar281._4_4_ == iVar10 && auVar106._0_4_ < auVar281._0_4_ ||
                                  iVar10 < auVar281._4_4_) & 1)) {
                        *(undefined4 *)((long)pvVar29 + uVar22 * 4) = 0x3f800000;
                      }
                      if ((auVar281._12_4_ != iVar9 || auVar281._8_4_ <= auVar106._8_4_) &&
                          auVar281._12_4_ <= iVar9) {
                        *(undefined4 *)((long)pvVar29 + uVar22 * 4 + 4) = 0x3f800000;
                      }
                      auVar281 = (auVar259 | auVar54) ^ auVar134;
                      auVar312._0_4_ = -(uint)(auVar106._0_4_ < auVar281._0_4_);
                      auVar312._4_4_ = -(uint)(iVar10 < auVar281._4_4_);
                      auVar312._8_4_ = -(uint)(auVar106._8_4_ < auVar281._8_4_);
                      auVar312._12_4_ = -(uint)(iVar9 < auVar281._12_4_);
                      iVar10 = -(uint)(auVar281._4_4_ == iVar10);
                      iVar9 = -(uint)(auVar281._12_4_ == iVar9);
                      auVar354._4_4_ = iVar10;
                      auVar354._0_4_ = iVar10;
                      auVar354._8_4_ = iVar9;
                      auVar354._12_4_ = iVar9;
                      auVar260._4_4_ = auVar312._4_4_;
                      auVar260._0_4_ = auVar312._4_4_;
                      auVar260._8_4_ = auVar312._12_4_;
                      auVar260._12_4_ = auVar312._12_4_;
                      auVar261._8_4_ = 0xffffffff;
                      auVar261._0_8_ = 0xffffffffffffffff;
                      auVar261._12_4_ = 0xffffffff;
                      auVar261 = (auVar260 | auVar354 & auVar312) ^ auVar261;
                      if ((auVar261 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        *(undefined4 *)((long)pvVar29 + uVar22 * 4 + 8) = 0x3f800000;
                      }
                      pMVar13 = (Mat *)(ulong)auVar261._8_2_;
                      if ((auVar261 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        *(undefined4 *)((long)pvVar29 + uVar22 * 4 + 0xc) = 0x3f800000;
                      }
                      uVar22 = uVar22 + 4;
                    } while ((uVar12 + 3 & 0xfffffffc) != uVar22);
                  }
                  pMVar25 = pMVar13;
                  if ((int)uVar21 < 1) goto LAB_00203c6f;
                  pvVar29 = bottom_blob->data;
                  sVar2 = bottom_blob->elemsize;
                  pvVar32 = top_blob->data;
                  sVar3 = bottom_blob->cstep;
                  pMVar25 = (Mat *)(ulong)uVar24;
                  pMVar13 = (Mat *)0x0;
                  uVar26 = false;
                  in_R11D = 0;
                  do {
                    if (0 < (int)uVar24) {
                      pMVar20 = (Mat *)0x0;
                      do {
                        *(float *)((long)pvVar32 + (long)pMVar20 * 4) =
                             *(float *)((long)pvVar29 + (long)pMVar20 * 4) *
                             *(float *)((long)pvVar32 + (long)pMVar20 * 4);
                        pMVar20 = (Mat *)((long)&pMVar20->data + 1);
                      } while (pMVar25 != pMVar20);
                    }
                    pMVar13 = (Mat *)((long)&pMVar13->data + 1);
                    pvVar29 = (void *)((long)pvVar29 + sVar2 * sVar3);
                  } while (pMVar13 != pMVar16);
                }
                else {
                  uVar26 = true;
                  if (reduce_c == false && (bVar23 & 1) == 0) {
                    pMVar25 = pMVar13;
                    Mat::create(top_blob,uVar12,1,uVar21,sVar2,opt->blob_allocator);
                    auVar52 = _DAT_00315150;
                    auVar54 = _DAT_00315140;
                    auVar134 = _DAT_003150d0;
                    uVar24 = top_blob->c * (int)top_blob->cstep;
                    if (0 < (int)uVar24) {
                      pvVar29 = top_blob->data;
                      lVar31 = (ulong)uVar24 - 1;
                      auVar69._8_4_ = (int)lVar31;
                      auVar69._0_8_ = lVar31;
                      auVar69._12_4_ = (int)((ulong)lVar31 >> 0x20);
                      uVar22 = 0;
                      auVar69 = auVar69 ^ _DAT_003150d0;
                      do {
                        auVar169._8_4_ = (int)uVar22;
                        auVar169._0_8_ = uVar22;
                        auVar169._12_4_ = (int)(uVar22 >> 0x20);
                        auVar281 = (auVar169 | auVar52) ^ auVar134;
                        iVar10 = auVar69._4_4_;
                        iVar9 = auVar69._12_4_;
                        if ((bool)(~(auVar281._4_4_ == iVar10 && auVar69._0_4_ < auVar281._0_4_ ||
                                    iVar10 < auVar281._4_4_) & 1)) {
                          *(undefined4 *)((long)pvVar29 + uVar22 * 4) = 0x3f800000;
                        }
                        if ((auVar281._12_4_ != iVar9 || auVar281._8_4_ <= auVar69._8_4_) &&
                            auVar281._12_4_ <= iVar9) {
                          *(undefined4 *)((long)pvVar29 + uVar22 * 4 + 4) = 0x3f800000;
                        }
                        auVar281 = (auVar169 | auVar54) ^ auVar134;
                        auVar282._0_4_ = -(uint)(auVar69._0_4_ < auVar281._0_4_);
                        auVar282._4_4_ = -(uint)(iVar10 < auVar281._4_4_);
                        auVar282._8_4_ = -(uint)(auVar69._8_4_ < auVar281._8_4_);
                        auVar282._12_4_ = -(uint)(iVar9 < auVar281._12_4_);
                        iVar10 = -(uint)(auVar281._4_4_ == iVar10);
                        iVar9 = -(uint)(auVar281._12_4_ == iVar9);
                        auVar324._4_4_ = iVar10;
                        auVar324._0_4_ = iVar10;
                        auVar324._8_4_ = iVar9;
                        auVar324._12_4_ = iVar9;
                        auVar170._4_4_ = auVar282._4_4_;
                        auVar170._0_4_ = auVar282._4_4_;
                        auVar170._8_4_ = auVar282._12_4_;
                        auVar170._12_4_ = auVar282._12_4_;
                        auVar171._8_4_ = 0xffffffff;
                        auVar171._0_8_ = 0xffffffffffffffff;
                        auVar171._12_4_ = 0xffffffff;
                        auVar171 = (auVar170 | auVar324 & auVar282) ^ auVar171;
                        if ((auVar171 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                          *(undefined4 *)((long)pvVar29 + uVar22 * 4 + 8) = 0x3f800000;
                        }
                        pMVar25 = (Mat *)(ulong)auVar171._8_2_;
                        if ((auVar171 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                          *(undefined4 *)((long)pvVar29 + uVar22 * 4 + 0xc) = 0x3f800000;
                        }
                        uVar22 = uVar22 + 4;
                      } while ((uVar24 + 3 & 0xfffffffc) != uVar22);
                    }
                    if ((int)uVar21 < 1) goto LAB_00203c7a;
                    pvVar29 = bottom_blob->data;
                    sVar2 = bottom_blob->elemsize;
                    pbVar18 = (bool *)top_blob->data;
                    pMVar25 = (Mat *)(top_blob->elemsize * top_blob->cstep);
                    sVar3 = bottom_blob->cstep;
                    pMVar20 = (Mat *)0x0;
                    do {
                      if (0 < (int)uVar11) {
                        uVar21 = 0;
                        pvVar32 = pvVar29;
                        do {
                          if (0 < (int)uVar12) {
                            pMVar30 = (Mat *)0x0;
                            do {
                              *(float *)(pbVar18 + (long)pMVar30 * 4) =
                                   *(float *)((long)pvVar32 + (long)pMVar30 * 4) *
                                   *(float *)(pbVar18 + (long)pMVar30 * 4);
                              pMVar30 = (Mat *)((long)&pMVar30->data + 1);
                            } while (pMVar13 != pMVar30);
                          }
                          uVar21 = uVar21 + 1;
                          pvVar32 = (void *)((long)pvVar32 + (long)(int)uVar12 * 4);
                        } while (uVar21 != uVar11);
                      }
                      pMVar20 = (Mat *)((long)&pMVar20->data + 1);
                      pvVar29 = (void *)((long)pvVar29 + sVar2 * sVar3);
                      pbVar18 = (bool *)((long)&pMVar25->data + (long)pbVar18);
                      uVar26 = false;
                      in_R11D = 0;
                    } while (pMVar20 != pMVar16);
                  }
                }
                goto joined_r0x002096c9;
              }
              Mat::create(top_blob,uVar12,1,1,sVar2,opt->blob_allocator);
              sums.cstep = 0;
              sums.data = (void *)0x0;
              sums.refcount._0_4_ = 0;
              sums.refcount._4_4_ = 0;
              sums.elemsize._0_4_ = 0;
              sums.elemsize._4_4_ = 0;
              sums.elempack = 0;
              sums.allocator = (Allocator *)0x0;
              sums.dims = 0;
              sums.w = 0;
              sums.h = 0;
              sums.d = 0;
              sums.c = 0;
              pMVar25 = (Mat *)(ulong)uVar12;
              Mat::create(&sums,uVar12,1,uVar21,sVar2,opt->workspace_allocator);
              auVar52 = _DAT_00315150;
              auVar54 = _DAT_00315140;
              auVar134 = _DAT_003150d0;
              in_R11D = -100;
              if ((sums.data != (void *)0x0) &&
                 (pMVar25 = (Mat *)(sums.cstep * (long)sums.c), pMVar25 != (Mat *)0x0)) {
                uVar24 = (int)sums.cstep * sums.c;
                if (0 < (int)uVar24) {
                  lVar19 = (ulong)uVar24 - 1;
                  auVar96._8_4_ = (int)lVar19;
                  auVar96._0_8_ = lVar19;
                  auVar96._12_4_ = (int)((ulong)lVar19 >> 0x20);
                  uVar22 = 0;
                  auVar96 = auVar96 ^ _DAT_003150d0;
                  do {
                    auVar229._8_4_ = (int)uVar22;
                    auVar229._0_8_ = uVar22;
                    auVar229._12_4_ = (int)(uVar22 >> 0x20);
                    auVar281 = (auVar229 | auVar52) ^ auVar134;
                    iVar10 = auVar96._4_4_;
                    iVar9 = auVar96._12_4_;
                    if ((bool)(~(auVar281._4_4_ == iVar10 && auVar96._0_4_ < auVar281._0_4_ ||
                                iVar10 < auVar281._4_4_) & 1)) {
                      *(undefined4 *)((long)sums.data + uVar22 * 4) = 0x3f800000;
                    }
                    if ((auVar281._12_4_ != iVar9 || auVar281._8_4_ <= auVar96._8_4_) &&
                        auVar281._12_4_ <= iVar9) {
                      *(undefined4 *)((long)sums.data + uVar22 * 4 + 4) = 0x3f800000;
                    }
                    auVar281 = (auVar229 | auVar54) ^ auVar134;
                    auVar302._0_4_ = -(uint)(auVar96._0_4_ < auVar281._0_4_);
                    auVar302._4_4_ = -(uint)(iVar10 < auVar281._4_4_);
                    auVar302._8_4_ = -(uint)(auVar96._8_4_ < auVar281._8_4_);
                    auVar302._12_4_ = -(uint)(iVar9 < auVar281._12_4_);
                    iVar10 = -(uint)(auVar281._4_4_ == iVar10);
                    iVar9 = -(uint)(auVar281._12_4_ == iVar9);
                    auVar344._4_4_ = iVar10;
                    auVar344._0_4_ = iVar10;
                    auVar344._8_4_ = iVar9;
                    auVar344._12_4_ = iVar9;
                    auVar230._4_4_ = auVar302._4_4_;
                    auVar230._0_4_ = auVar302._4_4_;
                    auVar230._8_4_ = auVar302._12_4_;
                    auVar230._12_4_ = auVar302._12_4_;
                    auVar231._8_4_ = 0xffffffff;
                    auVar231._0_8_ = 0xffffffffffffffff;
                    auVar231._12_4_ = 0xffffffff;
                    auVar231 = (auVar230 | auVar344 & auVar302) ^ auVar231;
                    if ((auVar231 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      *(undefined4 *)((long)sums.data + uVar22 * 4 + 8) = 0x3f800000;
                    }
                    pMVar25 = (Mat *)(ulong)auVar231._8_2_;
                    if ((auVar231 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      *(undefined4 *)((long)sums.data + uVar22 * 4 + 0xc) = 0x3f800000;
                    }
                    uVar22 = uVar22 + 4;
                  } while ((uVar24 + 3 & 0xfffffffc) != uVar22);
                }
                if (0 < (int)uVar21) {
                  pvVar29 = bottom_blob->data;
                  sVar2 = bottom_blob->elemsize;
                  pMVar25 = (Mat *)(CONCAT44(sums.elemsize._4_4_,(undefined4)sums.elemsize) *
                                   sums.cstep);
                  sVar3 = bottom_blob->cstep;
                  pMVar20 = (Mat *)0x0;
                  pvVar32 = sums.data;
                  do {
                    if (0 < (int)uVar11) {
                      uVar24 = 0;
                      pvVar28 = pvVar29;
                      do {
                        if (0 < (int)uVar12) {
                          pMVar30 = (Mat *)0x0;
                          do {
                            *(float *)((long)pvVar32 + (long)pMVar30 * 4) =
                                 *(float *)((long)pvVar28 + (long)pMVar30 * 4) *
                                 *(float *)((long)pvVar32 + (long)pMVar30 * 4);
                            pMVar30 = (Mat *)((long)&pMVar30->data + 1);
                          } while (pMVar13 != pMVar30);
                        }
                        uVar24 = uVar24 + 1;
                        pvVar28 = (void *)((long)pvVar28 + lVar31 * 4);
                      } while (uVar24 != uVar11);
                    }
                    pMVar20 = (Mat *)((long)&pMVar20->data + 1);
                    pvVar29 = (void *)((long)pvVar29 + sVar2 * sVar3);
                    pvVar32 = (void *)((long)pvVar32 + (long)pMVar25);
                  } while (pMVar20 != pMVar16);
                }
                auVar52 = _DAT_00315150;
                auVar54 = _DAT_00315140;
                auVar134 = _DAT_003150d0;
                uVar11 = top_blob->c * (int)top_blob->cstep;
                if (0 < (int)uVar11) {
                  pvVar29 = top_blob->data;
                  lVar31 = (ulong)uVar11 - 1;
                  auVar97._8_4_ = (int)lVar31;
                  auVar97._0_8_ = lVar31;
                  auVar97._12_4_ = (int)((ulong)lVar31 >> 0x20);
                  uVar22 = 0;
                  auVar97 = auVar97 ^ _DAT_003150d0;
                  do {
                    auVar232._8_4_ = (int)uVar22;
                    auVar232._0_8_ = uVar22;
                    auVar232._12_4_ = (int)(uVar22 >> 0x20);
                    auVar281 = (auVar232 | auVar52) ^ auVar134;
                    iVar10 = auVar97._4_4_;
                    iVar9 = auVar97._12_4_;
                    if ((bool)(~(auVar281._4_4_ == iVar10 && auVar97._0_4_ < auVar281._0_4_ ||
                                iVar10 < auVar281._4_4_) & 1)) {
                      *(undefined4 *)((long)pvVar29 + uVar22 * 4) = 0x3f800000;
                    }
                    if ((auVar281._12_4_ != iVar9 || auVar281._8_4_ <= auVar97._8_4_) &&
                        auVar281._12_4_ <= iVar9) {
                      *(undefined4 *)((long)pvVar29 + uVar22 * 4 + 4) = 0x3f800000;
                    }
                    auVar281 = (auVar232 | auVar54) ^ auVar134;
                    auVar303._0_4_ = -(uint)(auVar97._0_4_ < auVar281._0_4_);
                    auVar303._4_4_ = -(uint)(iVar10 < auVar281._4_4_);
                    auVar303._8_4_ = -(uint)(auVar97._8_4_ < auVar281._8_4_);
                    auVar303._12_4_ = -(uint)(iVar9 < auVar281._12_4_);
                    iVar10 = -(uint)(auVar281._4_4_ == iVar10);
                    iVar9 = -(uint)(auVar281._12_4_ == iVar9);
                    auVar345._4_4_ = iVar10;
                    auVar345._0_4_ = iVar10;
                    auVar345._8_4_ = iVar9;
                    auVar345._12_4_ = iVar9;
                    auVar233._4_4_ = auVar303._4_4_;
                    auVar233._0_4_ = auVar303._4_4_;
                    auVar233._8_4_ = auVar303._12_4_;
                    auVar233._12_4_ = auVar303._12_4_;
                    auVar234._8_4_ = 0xffffffff;
                    auVar234._0_8_ = 0xffffffffffffffff;
                    auVar234._12_4_ = 0xffffffff;
                    auVar234 = (auVar233 | auVar345 & auVar303) ^ auVar234;
                    if ((auVar234 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      *(undefined4 *)((long)pvVar29 + uVar22 * 4 + 8) = 0x3f800000;
                    }
                    pMVar25 = (Mat *)(ulong)auVar234._8_2_;
                    if ((auVar234 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      *(undefined4 *)((long)pvVar29 + uVar22 * 4 + 0xc) = 0x3f800000;
                    }
                    uVar22 = uVar22 + 4;
                  } while ((uVar11 + 3 & 0xfffffffc) != uVar22);
                }
                if (0 < (int)uVar21) {
                  pvVar29 = top_blob->data;
                  pMVar25 = (Mat *)0x0;
                  pvVar32 = sums.data;
                  do {
                    if (0 < (int)uVar12) {
                      pMVar20 = (Mat *)0x0;
                      do {
                        *(float *)((long)pvVar29 + (long)pMVar20 * 4) =
                             *(float *)((long)pvVar32 + (long)pMVar20 * 4) *
                             *(float *)((long)pvVar29 + (long)pMVar20 * 4);
                        pMVar20 = (Mat *)((long)&pMVar20->data + 1);
                      } while (pMVar13 != pMVar20);
                    }
                    pMVar25 = (Mat *)((long)&pMVar25->data + 1);
                    pvVar32 = (void *)((long)pvVar32 +
                                      CONCAT44(sums.elemsize._4_4_,(undefined4)sums.elemsize) *
                                      sums.cstep);
                  } while (pMVar25 != pMVar16);
                }
                in_R11D = 0;
              }
            }
            Mat::~Mat(&sums);
          }
          uVar26 = false;
        }
joined_r0x002096c9:
        if (!(bool)uVar26) break;
      }
    }
    in_R11D = 0;
    break;
  case 7:
    uVar26 = (undefined1)this->keepdims;
    auVar138._0_8_ = lVar19 << 0x3f;
    auVar138._8_8_ = lVar31 << 0x3f;
    uVar15 = movmskpd(0x318990,auVar138);
    bVar8 = (byte)uVar15;
    fVar35 = 1.0;
LAB_00200a3c:
    iVar10 = reduction<ncnn::reduction_op_asum<float>,ncnn::reduction_op_add<float>,ncnn::post_process_identity<float>>
                       (bottom_blob,top_blob,fVar35,(bool)(bVar8 >> 1),(bool)(bVar8 & 1),reduce_c,
                        (bool)uVar26,in_XMM1._0_4_,(int)opt,in_stack_ffffffffffffff10);
    return iVar10;
  case 8:
    if (this->keepdims == 0) {
      auVar143._0_8_ = lVar19 << 0x3f;
      auVar143._8_8_ = lVar31 << 0x3f;
      uVar15 = movmskpd(0x318990,auVar143);
      iVar10 = reduction_op<ncnn::reduction_op_sumsq<float>,ncnn::reduction_op_add<float>>
                         (bottom_blob,top_blob,in_XMM0_Da,(bool)((byte)uVar15 >> 1),
                          (bool)((byte)uVar15 & 1),reduce_c,opt);
    }
    else {
      auVar140._0_8_ = lVar19 << 0x3f;
      auVar140._8_8_ = lVar31 << 0x3f;
      uVar15 = movmskpd(0x318990,auVar140);
      iVar10 = reduction_op_keepdims<ncnn::reduction_op_sumsq<float>,ncnn::reduction_op_add<float>>
                         (bottom_blob,top_blob,in_XMM0_Da,(bool)((byte)uVar15 >> 1),
                          (bool)((byte)uVar15 & 1),reduce_c,opt);
    }
    if (iVar10 != 0) {
      return -100;
    }
    iVar10 = top_blob->dims;
    if (iVar10 != 3) {
      if (iVar10 == 2) {
        uVar12 = top_blob->h * top_blob->w;
        if (0 < (int)uVar12) {
          pvVar29 = top_blob->data;
          uVar22 = 0;
          do {
            *(float *)((long)pvVar29 + uVar22 * 4) = SQRT(*(float *)((long)pvVar29 + uVar22 * 4));
            uVar22 = uVar22 + 1;
          } while (uVar12 != uVar22);
          return 0;
        }
        return 0;
      }
      if (iVar10 != 1) {
        return 0;
      }
      iVar10 = top_blob->w;
      if (0 < (long)iVar10) {
        pvVar29 = top_blob->data;
        lVar31 = 0;
        do {
          *(float *)((long)pvVar29 + lVar31 * 4) = SQRT(*(float *)((long)pvVar29 + lVar31 * 4));
          lVar31 = lVar31 + 1;
        } while (iVar10 != lVar31);
        return 0;
      }
      return 0;
    }
    uVar12 = top_blob->c;
    uVar11 = top_blob->h * top_blob->w;
    if ((ulong)uVar12 != 1) {
      if (0 < (int)uVar12) {
        pvVar29 = top_blob->data;
        sVar2 = top_blob->elemsize;
        sVar3 = top_blob->cstep;
        uVar22 = 0;
        do {
          if (0 < (int)uVar11) {
            uVar33 = 0;
            do {
              *(float *)((long)pvVar29 + uVar33 * 4) = SQRT(*(float *)((long)pvVar29 + uVar33 * 4));
              uVar33 = uVar33 + 1;
            } while (uVar11 != uVar33);
          }
          uVar22 = uVar22 + 1;
          pvVar29 = (void *)((long)pvVar29 + sVar2 * sVar3);
        } while (uVar22 != uVar12);
        return 0;
      }
      return 0;
    }
    if (0 < (int)uVar11) {
      pvVar29 = top_blob->data;
      uVar22 = 0;
      do {
        *(float *)((long)pvVar29 + uVar22 * 4) = SQRT(*(float *)((long)pvVar29 + uVar22 * 4));
        uVar22 = uVar22 + 1;
      } while (uVar11 != uVar22);
      return 0;
    }
    return 0;
  case 9:
    if (this->keepdims == 0) {
      auVar141._0_8_ = lVar19 << 0x3f;
      auVar141._8_8_ = lVar31 << 0x3f;
      uVar15 = movmskpd(0x318990,auVar141);
      pMVar25 = top_blob;
      in_R10D = reduction_op<ncnn::reduction_op_add<float>,ncnn::reduction_op_add<float>>
                          (bottom_blob,top_blob,in_XMM0_Da,(bool)((byte)uVar15 >> 1),
                           (bool)((byte)uVar15 & 1),reduce_c,opt);
      in_XMM0_Da = extraout_XMM0_Da_00;
    }
    else {
      auVar136._0_8_ = lVar19 << 0x3f;
      auVar136._8_8_ = lVar31 << 0x3f;
      uVar15 = movmskpd(0x318990,auVar136);
      pMVar25 = top_blob;
      in_R10D = reduction_op_keepdims<ncnn::reduction_op_add<float>,ncnn::reduction_op_add<float>>
                          (bottom_blob,top_blob,in_XMM0_Da,(bool)((byte)uVar15 >> 1),
                           (bool)((byte)uVar15 & 1),reduce_c,opt);
      in_XMM0_Da = extraout_XMM0_Da;
    }
    goto joined_r0x0020804f;
  case 10:
    sVar2 = bottom_blob->elemsize;
    if (this->keepdims == 0) {
      if (iVar10 == 2) {
        uVar12 = bottom_blob->w;
        pMVar13 = (Mat *)(ulong)uVar12;
        uVar11 = bottom_blob->h;
        pMVar16 = (Mat *)(ulong)uVar11;
        auVar52._8_4_ = 0xffffffff;
        auVar52._0_8_ = 0xffffffffffffffff;
        auVar52._12_4_ = 0xffffffff;
        auVar54._0_8_ = SUB168(auVar52 ^ auVar134,0) << 0x3f;
        auVar54._8_8_ = SUB168(auVar52 ^ auVar134,8) << 0x3f;
        iVar9 = movmskpd(iVar9,auVar54);
        if (iVar9 == 0) {
          Mat::create(top_blob,1,sVar2,opt->blob_allocator);
          sums.cstep = 0;
          sums.data = (void *)0x0;
          sums.refcount._0_4_ = 0;
          sums.refcount._4_4_ = 0;
          sums.elemsize._0_4_ = 0;
          sums.elemsize._4_4_ = 0;
          sums.elempack = 0;
          sums.allocator = (Allocator *)0x0;
          sums.dims = 0;
          sums.w = 0;
          sums.h = 0;
          sums.d = 0;
          sums.c = 0;
          pMVar25 = (Mat *)(ulong)uVar11;
          Mat::create(&sums,uVar11,sVar2,opt->workspace_allocator);
          pvVar29 = sums.data;
          in_R10D = -100;
          auVar54 = extraout_XMM0_00;
          if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
            if ((int)uVar11 < 1) {
              auVar54 = ZEXT816(0);
            }
            else {
              pvVar32 = bottom_blob->data;
              iVar9 = bottom_blob->w;
              sVar3 = bottom_blob->elemsize;
              pMVar20 = (Mat *)0x0;
              do {
                fVar35 = 0.0;
                if (0 < (int)uVar12) {
                  pMVar30 = (Mat *)0x0;
                  do {
                    fVar36 = expf(*(float *)((long)pvVar32 + (long)pMVar30 * 4));
                    fVar35 = fVar35 + fVar36;
                    pMVar30 = (Mat *)((long)&pMVar30->data + 1);
                  } while (pMVar13 != pMVar30);
                }
                *(float *)((long)pvVar29 + (long)pMVar20 * 4) = fVar35;
                pMVar20 = (Mat *)((long)&pMVar20->data + 1);
                pvVar32 = (void *)((long)pvVar32 + (long)iVar9 * sVar3);
              } while (pMVar20 != pMVar16);
              auVar54 = ZEXT816(0);
              pMVar13 = (Mat *)0x0;
              do {
                auVar54._0_4_ = auVar54._0_4_ + *(float *)((long)pvVar29 + (long)pMVar13 * 4);
                pMVar13 = (Mat *)((long)&pMVar13->data + 1);
              } while (pMVar16 != pMVar13);
            }
            *(int *)top_blob->data = auVar54._0_4_;
            in_R10D = 0;
          }
          piVar7 = (int *)CONCAT44(sums.refcount._4_4_,sums.refcount._0_4_);
          if (piVar7 != (int *)0x0) {
            LOCK();
            *piVar7 = *piVar7 + -1;
            UNLOCK();
            if (*piVar7 == 0) {
              pMVar25 = (Mat *)sums.data;
              if (sums.allocator == (Allocator *)0x0) {
                if (sums.data != (void *)0x0) {
                  free(sums.data);
                  auVar54 = extraout_XMM0_16;
                }
              }
              else {
                (*(sums.allocator)->_vptr_Allocator[3])();
                auVar54 = extraout_XMM0_15;
              }
            }
          }
          iVar9 = 0;
        }
        else if (((bVar17 | (byte)iVar9 >> 1) & 1) == 0) {
          pMVar25 = pMVar16;
          Mat::create(top_blob,uVar11,sVar2,opt->blob_allocator);
          if (0 < (int)uVar11) {
            pvVar29 = bottom_blob->data;
            iVar9 = bottom_blob->w;
            sVar3 = bottom_blob->elemsize;
            pvVar32 = top_blob->data;
            pMVar20 = (Mat *)0x0;
            do {
              auVar54 = ZEXT816(0);
              if (0 < (int)uVar12) {
                pMVar30 = (Mat *)0x0;
                do {
                  fVar35 = expf(*(float *)((long)pvVar29 + (long)pMVar30 * 4));
                  auVar54 = ZEXT416((uint)(auVar54._0_4_ + fVar35));
                  pMVar30 = (Mat *)((long)&pMVar30->data + 1);
                } while (pMVar13 != pMVar30);
              }
              *(int *)((long)pvVar32 + (long)pMVar20 * 4) = auVar54._0_4_;
              pMVar20 = (Mat *)((long)&pMVar20->data + 1);
              pvVar29 = (void *)((long)pvVar29 + (long)iVar9 * sVar3);
            } while (pMVar20 != pMVar16);
            goto LAB_00202c4b;
          }
          iVar9 = 0;
          in_R10D = 0;
          auVar54 = extraout_XMM0_02;
        }
        else if (((bVar8 | (byte)iVar9) & 1) == 0) {
          pMVar25 = pMVar13;
          Mat::create(top_blob,uVar12,sVar2,opt->blob_allocator);
          uVar21 = top_blob->c * (int)top_blob->cstep;
          auVar54 = extraout_XMM0_05;
          if (0 < (int)uVar21) {
            pMVar25 = (Mat *)0x0;
            memset(top_blob->data,0,(ulong)uVar21 << 2);
            auVar54 = extraout_XMM0_06;
          }
          if (0 < (int)uVar11) {
            pvVar29 = bottom_blob->data;
            iVar9 = bottom_blob->w;
            sVar3 = bottom_blob->elemsize;
            pvVar32 = top_blob->data;
            pMVar20 = (Mat *)0x0;
            do {
              if (0 < (int)uVar12) {
                pMVar30 = (Mat *)0x0;
                do {
                  fVar35 = expf(*(float *)((long)pvVar29 + (long)pMVar30 * 4));
                  auVar54._0_4_ = fVar35 + *(float *)((long)pvVar32 + (long)pMVar30 * 4);
                  auVar54._4_12_ = extraout_var_00;
                  *(float *)((long)pvVar32 + (long)pMVar30 * 4) = auVar54._0_4_;
                  pMVar30 = (Mat *)((long)&pMVar30->data + 1);
                } while (pMVar13 != pMVar30);
              }
              pMVar20 = (Mat *)((long)&pMVar20->data + 1);
              pvVar29 = (void *)((long)pvVar29 + (long)iVar9 * sVar3);
            } while (pMVar20 != pMVar16);
          }
LAB_00202c4b:
          in_R10D = 0;
          iVar9 = 0;
        }
        else {
          iVar9 = (int)CONCAT71((uint7)(uint3)((uint)iVar9 >> 8),1);
        }
        in_XMM0_Da = auVar54._0_4_;
        if ((char)iVar9 == '\0') goto joined_r0x0020804f;
      }
      else if (iVar10 == 1) {
        iVar10 = bottom_blob->w;
        pMVar25 = (Mat *)0x1;
        Mat::create(top_blob,1,sVar2,opt->blob_allocator);
        if ((long)iVar10 < 1) goto LAB_0020118e;
        pvVar29 = bottom_blob->data;
        in_XMM0_Da = 0.0;
        lVar31 = 0;
        do {
          fVar35 = expf(*(float *)((long)pvVar29 + lVar31 * 4));
          in_XMM0_Da = in_XMM0_Da + fVar35;
          lVar31 = lVar31 + 1;
        } while (iVar10 != lVar31);
        goto LAB_00201192;
      }
      if (iVar10 != 3) goto LAB_00208044;
      uVar12 = bottom_blob->w;
      pMVar16 = (Mat *)(long)(int)uVar12;
      uVar11 = bottom_blob->h;
      uVar22 = (ulong)uVar11;
      uVar21 = bottom_blob->c;
      pMVar13 = (Mat *)(ulong)uVar21;
      uVar24 = uVar11 * uVar12;
      auVar274._8_4_ = 0xffffffff;
      auVar274._0_8_ = 0xffffffffffffffff;
      auVar274._12_4_ = 0xffffffff;
      auVar281._0_8_ = SUB168(auVar274 ^ auVar134,0) << 0x3f;
      auVar281._8_8_ = SUB168(auVar274 ^ auVar134,8) << 0x3f;
      iVar10 = movmskpd(iVar9,auVar281);
      bVar14 = reduce_c ^ 1;
      pMVar25 = pMVar13;
      if (iVar10 != 0 || bVar14 != 0) {
        if (iVar10 != 0 || reduce_c != false) {
          pMVar20 = (Mat *)(ulong)uVar12;
          bVar23 = (byte)iVar10 >> 1 | bVar17;
          if (reduce_c != false || (bVar23 & 1) != 0) {
            if ((bVar23 & 1) != 0 || bVar14 != 0) {
              pMVar25 = (Mat *)(ulong)uVar6;
              bVar23 = (byte)iVar10 | bVar8;
              if ((bVar23 & 1) == 0 && bVar14 == 0) {
                Mat::create(top_blob,uVar12,sVar2,opt->blob_allocator);
                sums.cstep = 0;
                sums.data = (void *)0x0;
                sums.refcount._0_4_ = 0;
                sums.refcount._4_4_ = 0;
                sums.elemsize._0_4_ = 0;
                sums.elemsize._4_4_ = 0;
                sums.elempack = 0;
                sums.allocator = (Allocator *)0x0;
                sums.dims = 0;
                sums.w = 0;
                sums.h = 0;
                sums.d = 0;
                sums.c = 0;
                pMVar25 = pMVar16;
                Mat::create(&sums,uVar12,1,uVar21,sVar2,opt->workspace_allocator);
                in_R10D = -100;
                if ((sums.data != (void *)0x0) && (sums.cstep * (long)sums.c != 0)) {
                  uVar24 = (int)sums.cstep * sums.c;
                  if (0 < (int)uVar24) {
                    pMVar25 = (Mat *)0x0;
                    memset(sums.data,0,(ulong)uVar24 << 2);
                  }
                  if (0 < (int)uVar21) {
                    local_c8 = (Mat *)bottom_blob->data;
                    sVar2 = bottom_blob->elemsize;
                    lVar31 = CONCAT44(sums.elemsize._4_4_,(undefined4)sums.elemsize) * sums.cstep;
                    sVar3 = bottom_blob->cstep;
                    local_e0 = (Mat *)0x0;
                    pvVar29 = sums.data;
                    do {
                      if (0 < (int)uVar11) {
                        uVar24 = 0;
                        pMVar30 = local_c8;
                        do {
                          if (0 < (int)uVar12) {
                            pMVar34 = (Mat *)0x0;
                            do {
                              fVar35 = expf(*(float *)((long)pMVar30 + (long)pMVar34 * 4));
                              *(float *)((long)pvVar29 + (long)pMVar34 * 4) =
                                   fVar35 + *(float *)((long)pvVar29 + (long)pMVar34 * 4);
                              pMVar34 = (Mat *)((long)&pMVar34->data + 1);
                            } while (pMVar20 != pMVar34);
                          }
                          uVar24 = uVar24 + 1;
                          pMVar30 = (Mat *)((long)pMVar30 + (long)pMVar16 * 4);
                        } while (uVar24 != uVar11);
                      }
                      local_e0 = (Mat *)((long)&local_e0->data + 1);
                      local_c8 = (Mat *)((long)local_c8 + sVar2 * sVar3);
                      pvVar29 = (void *)((long)pvVar29 + lVar31);
                    } while (local_e0 != pMVar13);
                  }
                  uVar11 = top_blob->c * (int)top_blob->cstep;
                  if (0 < (int)uVar11) {
                    pMVar25 = (Mat *)0x0;
                    memset(top_blob->data,0,(ulong)uVar11 << 2);
                  }
                  if (0 < (int)uVar21) {
                    pvVar29 = top_blob->data;
                    pMVar25 = (Mat *)0x0;
                    pvVar32 = sums.data;
                    do {
                      if (0 < (int)uVar12) {
                        pMVar16 = (Mat *)0x0;
                        do {
                          *(float *)((long)pvVar29 + (long)pMVar16 * 4) =
                               *(float *)((long)pvVar32 + (long)pMVar16 * 4) +
                               *(float *)((long)pvVar29 + (long)pMVar16 * 4);
                          pMVar16 = (Mat *)((long)&pMVar16->data + 1);
                        } while (pMVar20 != pMVar16);
                      }
                      pMVar25 = (Mat *)((long)&pMVar25->data + 1);
                      pvVar32 = (void *)((long)pvVar32 +
                                        CONCAT44(sums.elemsize._4_4_,(undefined4)sums.elemsize) *
                                        sums.cstep);
                    } while (pMVar25 != pMVar13);
                  }
                  in_R10D = 0;
                }
                Mat::~Mat(&sums);
                bVar27 = false;
                auVar281 = extraout_XMM0_25;
              }
              else if (((bVar17 | bVar8) & 1) == 0 && bVar14 == 0) {
                Mat::create(top_blob,uVar12,uVar11,sVar2,opt->blob_allocator);
                uVar12 = top_blob->c * (int)top_blob->cstep;
                pMVar25 = pMVar20;
                auVar281 = extraout_XMM0_28;
                if (0 < (int)uVar12) {
                  pMVar25 = (Mat *)0x0;
                  memset(top_blob->data,0,(ulong)uVar12 << 2);
                  auVar281 = extraout_XMM0_29;
                }
                if ((int)uVar21 < 1) goto LAB_0020643d;
                pvVar29 = bottom_blob->data;
                sVar2 = bottom_blob->elemsize;
                pvVar32 = top_blob->data;
                sVar3 = bottom_blob->cstep;
                pMVar16 = (Mat *)0x0;
                do {
                  if (0 < (int)uVar24) {
                    uVar22 = 0;
                    do {
                      fVar35 = expf(*(float *)((long)pvVar29 + uVar22 * 4));
                      auVar281._0_4_ = fVar35 + *(float *)((long)pvVar32 + uVar22 * 4);
                      auVar281._4_12_ = extraout_var_04;
                      *(float *)((long)pvVar32 + uVar22 * 4) = auVar281._0_4_;
                      uVar22 = uVar22 + 1;
                    } while (uVar24 != uVar22);
                  }
                  pMVar16 = (Mat *)((long)&pMVar16->data + 1);
                  pvVar29 = (void *)((long)pvVar29 + sVar2 * sVar3);
                  bVar27 = false;
                  in_R10D = 0;
                } while (pMVar16 != pMVar13);
              }
              else {
                bVar27 = true;
                if (reduce_c == false && (bVar23 & 1) == 0) {
                  pMVar25 = (Mat *)(ulong)uVar12;
                  Mat::create(top_blob,uVar12,uVar21,sVar2,opt->blob_allocator);
                  uVar24 = top_blob->c * (int)top_blob->cstep;
                  auVar281 = extraout_XMM0_17;
                  if (0 < (int)uVar24) {
                    pMVar25 = (Mat *)0x0;
                    memset(top_blob->data,0,(ulong)uVar24 << 2);
                    auVar281 = extraout_XMM0_18;
                  }
                  if ((int)uVar21 < 1) goto LAB_0020643d;
                  local_b8 = bottom_blob->data;
                  sVar2 = bottom_blob->elemsize;
                  pvVar29 = top_blob->data;
                  iVar10 = top_blob->w;
                  sVar3 = bottom_blob->cstep;
                  sVar4 = top_blob->elemsize;
                  local_e0 = (Mat *)0x0;
                  do {
                    if (0 < (int)uVar11) {
                      uVar21 = 0;
                      pvVar32 = local_b8;
                      do {
                        if (0 < (int)uVar12) {
                          pMVar25 = (Mat *)0x0;
                          do {
                            fVar35 = expf(*(float *)((long)pvVar32 + (long)pMVar25 * 4));
                            auVar281._0_4_ = fVar35 + *(float *)((long)pvVar29 + (long)pMVar25 * 4);
                            auVar281._4_12_ = extraout_var_02;
                            *(float *)((long)pvVar29 + (long)pMVar25 * 4) = auVar281._0_4_;
                            pMVar25 = (Mat *)((long)&pMVar25->data + 1);
                          } while (pMVar20 != pMVar25);
                        }
                        uVar21 = uVar21 + 1;
                        pvVar32 = (void *)((long)pvVar32 + (long)(int)uVar12 * 4);
                      } while (uVar21 != uVar11);
                    }
                    pMVar25 = (Mat *)((long)&local_e0->data + 1);
                    local_b8 = (void *)((long)local_b8 + sVar2 * sVar3);
                    pvVar29 = (void *)((long)pvVar29 + (long)iVar10 * sVar4);
                    bVar27 = false;
                    in_R10D = 0;
                    local_e0 = pMVar25;
                  } while (pMVar25 != pMVar13);
                }
              }
              goto LAB_00208040;
            }
            Mat::create(top_blob,uVar11,sVar2,opt->blob_allocator);
            sums.cstep = 0;
            sums.data = (void *)0x0;
            sums.refcount._0_4_ = 0;
            sums.refcount._4_4_ = 0;
            sums.elemsize._0_4_ = 0;
            sums.elemsize._4_4_ = 0;
            sums.elempack = 0;
            sums.allocator = (Allocator *)0x0;
            sums.dims = 0;
            sums.w = 0;
            sums.h = 0;
            sums.d = 0;
            sums.c = 0;
            Mat::create(&sums,1,uVar11,uVar21,sVar2,opt->workspace_allocator);
            pMVar25 = (Mat *)0xffffff9c;
            if ((sums.data != (void *)0x0) && (sums.cstep * (long)sums.c != 0)) {
              uVar24 = (int)sums.cstep * sums.c;
              if (0 < (int)uVar24) {
                memset(sums.data,0,(ulong)uVar24 << 2);
              }
              pvVar29 = sums.data;
              if (0 < (int)uVar21) {
                local_c0 = bottom_blob->data;
                sVar2 = bottom_blob->elemsize;
                lVar31 = CONCAT44(sums.elemsize._4_4_,(undefined4)sums.elemsize) * sums.cstep;
                sVar3 = bottom_blob->cstep;
                local_c8 = (Mat *)0x0;
                do {
                  if (0 < (int)uVar11) {
                    uVar33 = 0;
                    pvVar32 = local_c0;
                    do {
                      if ((int)uVar12 < 1) {
                        fVar35 = 0.0;
                      }
                      else {
                        fVar35 = 0.0;
                        pMVar25 = (Mat *)0x0;
                        do {
                          fVar36 = expf(*(float *)((long)pvVar32 + (long)pMVar25 * 4));
                          fVar35 = fVar35 + fVar36;
                          pMVar25 = (Mat *)((long)&pMVar25->data + 1);
                        } while (pMVar20 != pMVar25);
                      }
                      *(float *)((long)pvVar29 + uVar33 * 4 + lVar31 * (long)local_c8) = fVar35;
                      uVar33 = uVar33 + 1;
                      pvVar32 = (void *)((long)pvVar32 + (long)pMVar16 * 4);
                    } while (uVar33 != uVar22);
                  }
                  local_c8 = (Mat *)((long)&local_c8->data + 1);
                  local_c0 = (void *)((long)local_c0 + sVar2 * sVar3);
                } while (local_c8 != pMVar13);
              }
              uVar12 = top_blob->c * (int)top_blob->cstep;
              if (0 < (int)uVar12) {
                memset(top_blob->data,0,(ulong)uVar12 << 2);
              }
              if (0 < (int)uVar21) {
                pvVar29 = top_blob->data;
                pMVar25 = (Mat *)0x0;
                pvVar32 = sums.data;
                do {
                  if (0 < (int)uVar11) {
                    uVar33 = 0;
                    do {
                      *(float *)((long)pvVar29 + uVar33 * 4) =
                           *(float *)((long)pvVar32 + uVar33 * 4) +
                           *(float *)((long)pvVar29 + uVar33 * 4);
                      uVar33 = uVar33 + 1;
                    } while (uVar22 != uVar33);
                  }
                  pMVar25 = (Mat *)((long)&pMVar25->data + 1);
                  pvVar32 = (void *)((long)pvVar32 +
                                    CONCAT44(sums.elemsize._4_4_,(undefined4)sums.elemsize) *
                                    sums.cstep);
                } while (pMVar25 != pMVar13);
              }
              pMVar25 = (Mat *)0x0;
            }
            goto LAB_0020802f;
          }
          pMVar25 = (Mat *)(ulong)uVar11;
          Mat::create(top_blob,uVar11,uVar21,sVar2,opt->blob_allocator);
          auVar281 = extraout_XMM0_21;
          if (0 < (int)uVar21) {
            local_c0 = bottom_blob->data;
            sVar2 = bottom_blob->elemsize;
            iVar10 = top_blob->w;
            sVar3 = top_blob->elemsize;
            sVar4 = bottom_blob->cstep;
            pvVar29 = top_blob->data;
            local_c8 = (Mat *)0x0;
            do {
              if (0 < (int)uVar11) {
                uVar33 = 0;
                pvVar32 = local_c0;
                do {
                  if ((int)uVar12 < 1) {
                    auVar281 = ZEXT816(0);
                  }
                  else {
                    auVar281 = ZEXT816(0);
                    pMVar30 = (Mat *)0x0;
                    do {
                      fVar35 = expf(*(float *)((long)pvVar32 + (long)pMVar30 * 4));
                      auVar281 = ZEXT416((uint)(auVar281._0_4_ + fVar35));
                      pMVar30 = (Mat *)((long)&pMVar30->data + 1);
                    } while (pMVar20 != pMVar30);
                  }
                  *(int *)((long)pvVar29 + uVar33 * 4 + (long)iVar10 * sVar3 * (long)local_c8) =
                       auVar281._0_4_;
                  uVar33 = uVar33 + 1;
                  pvVar32 = (void *)((long)pvVar32 + (long)pMVar16 * 4);
                } while (uVar33 != uVar22);
              }
              local_c8 = (Mat *)((long)&local_c8->data + 1);
              local_c0 = (void *)((long)local_c0 + sVar2 * sVar4);
            } while (local_c8 != pMVar13);
          }
        }
        else {
          Mat::create(top_blob,uVar21,sVar2,opt->blob_allocator);
          auVar281 = extraout_XMM0_20;
          if (0 < (int)uVar21) {
            pvVar29 = bottom_blob->data;
            sVar2 = bottom_blob->elemsize;
            pvVar32 = top_blob->data;
            sVar3 = bottom_blob->cstep;
            pMVar16 = (Mat *)0x0;
            do {
              if ((int)uVar24 < 1) {
                auVar281 = ZEXT816(0);
              }
              else {
                auVar281 = ZEXT816(0);
                uVar22 = 0;
                do {
                  fVar35 = expf(*(float *)((long)pvVar29 + uVar22 * 4));
                  auVar281 = ZEXT416((uint)(auVar281._0_4_ + fVar35));
                  uVar22 = uVar22 + 1;
                } while (uVar24 != uVar22);
              }
              *(int *)((long)pvVar32 + (long)pMVar16 * 4) = auVar281._0_4_;
              pMVar16 = (Mat *)((long)&pMVar16->data + 1);
              pvVar29 = (void *)((long)pvVar29 + sVar2 * sVar3);
            } while (pMVar16 != pMVar13);
          }
        }
        goto LAB_0020643d;
      }
      Mat::create(top_blob,1,sVar2,opt->blob_allocator);
      sums.cstep = 0;
      sums.data = (void *)0x0;
      sums.refcount._0_4_ = 0;
      sums.refcount._4_4_ = 0;
      sums.elemsize._0_4_ = 0;
      sums.elemsize._4_4_ = 0;
      sums.elempack = 0;
      sums.allocator = (Allocator *)0x0;
      sums.dims = 0;
      sums.w = 0;
      sums.h = 0;
      sums.d = 0;
      sums.c = 0;
      Mat::create(&sums,uVar21,sVar2,opt->workspace_allocator);
      pvVar29 = sums.data;
      in_R10D = -100;
      auVar281 = extraout_XMM0_19;
      if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
        if ((int)uVar21 < 1) {
          auVar281 = ZEXT816(0);
        }
        else {
          pvVar32 = bottom_blob->data;
          sVar2 = bottom_blob->elemsize;
          sVar3 = bottom_blob->cstep;
          pMVar16 = (Mat *)0x0;
          do {
            if ((int)uVar24 < 1) {
              fVar35 = 0.0;
            }
            else {
              fVar35 = 0.0;
              uVar22 = 0;
              do {
                fVar36 = expf(*(float *)((long)pvVar32 + uVar22 * 4));
                fVar35 = fVar35 + fVar36;
                uVar22 = uVar22 + 1;
              } while (uVar24 != uVar22);
            }
            *(float *)((long)pvVar29 + (long)pMVar16 * 4) = fVar35;
            pMVar16 = (Mat *)((long)&pMVar16->data + 1);
            pvVar32 = (void *)((long)pvVar32 + sVar2 * sVar3);
          } while (pMVar16 != pMVar13);
          auVar281 = ZEXT816(0);
          pMVar16 = (Mat *)0x0;
          do {
            auVar281._0_4_ = auVar281._0_4_ + *(float *)((long)pvVar29 + (long)pMVar16 * 4);
            pMVar16 = (Mat *)((long)&pMVar16->data + 1);
          } while (pMVar13 != pMVar16);
        }
        *(int *)top_blob->data = auVar281._0_4_;
        in_R10D = 0;
      }
      piVar7 = (int *)CONCAT44(sums.refcount._4_4_,sums.refcount._0_4_);
      if (piVar7 != (int *)0x0) {
        LOCK();
        *piVar7 = *piVar7 + -1;
        UNLOCK();
        if (*piVar7 == 0) {
          pMVar25 = (Mat *)sums.data;
          if (sums.allocator == (Allocator *)0x0) goto joined_r0x002072de;
          (*(sums.allocator)->_vptr_Allocator[3])();
          auVar281 = extraout_XMM0_22;
        }
      }
LAB_0020803e:
      bVar27 = false;
LAB_00208040:
      in_XMM0_Da = auVar281._0_4_;
      if (!bVar27) goto joined_r0x0020804f;
    }
    else {
      if (iVar10 == 2) {
        uVar12 = bottom_blob->w;
        pMVar16 = (Mat *)(ulong)uVar12;
        uVar11 = bottom_blob->h;
        uVar22 = (ulong)uVar11;
        auVar45._8_4_ = 0xffffffff;
        auVar45._0_8_ = 0xffffffffffffffff;
        auVar45._12_4_ = 0xffffffff;
        auVar53._0_8_ = SUB168(auVar45 ^ auVar134,0) << 0x3f;
        auVar53._8_8_ = SUB168(auVar45 ^ auVar134,8) << 0x3f;
        iVar9 = movmskpd(iVar9,auVar53);
        if (iVar9 == 0) {
          Mat::create(top_blob,1,1,sVar2,opt->blob_allocator);
          sums.cstep = 0;
          sums.data = (void *)0x0;
          sums.refcount._0_4_ = 0;
          sums.refcount._4_4_ = 0;
          sums.elemsize._0_4_ = 0;
          sums.elemsize._4_4_ = 0;
          sums.elempack = 0;
          sums.allocator = (Allocator *)0x0;
          sums.dims = 0;
          sums.w = 0;
          sums.h = 0;
          sums.d = 0;
          sums.c = 0;
          pMVar25 = (Mat *)(ulong)uVar11;
          Mat::create(&sums,uVar11,sVar2,opt->workspace_allocator);
          pvVar29 = sums.data;
          in_R10D = -100;
          auVar53 = extraout_XMM0;
          if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
            if ((int)uVar11 < 1) {
              auVar53 = ZEXT816(0);
            }
            else {
              pvVar32 = bottom_blob->data;
              iVar9 = bottom_blob->w;
              sVar3 = bottom_blob->elemsize;
              uVar33 = 0;
              do {
                fVar35 = 0.0;
                if (0 < (int)uVar12) {
                  pMVar13 = (Mat *)0x0;
                  do {
                    fVar36 = expf(*(float *)((long)pvVar32 + (long)pMVar13 * 4));
                    fVar35 = fVar35 + fVar36;
                    pMVar13 = (Mat *)((long)&pMVar13->data + 1);
                  } while (pMVar16 != pMVar13);
                }
                *(float *)((long)pvVar29 + uVar33 * 4) = fVar35;
                uVar33 = uVar33 + 1;
                pvVar32 = (void *)((long)pvVar32 + (long)iVar9 * sVar3);
              } while (uVar33 != uVar22);
              auVar53 = ZEXT816(0);
              uVar33 = 0;
              do {
                auVar53._0_4_ = auVar53._0_4_ + *(float *)((long)pvVar29 + uVar33 * 4);
                uVar33 = uVar33 + 1;
              } while (uVar22 != uVar33);
            }
            *(int *)top_blob->data = auVar53._0_4_;
            in_R10D = 0;
          }
          piVar7 = (int *)CONCAT44(sums.refcount._4_4_,sums.refcount._0_4_);
          if (piVar7 != (int *)0x0) {
            LOCK();
            *piVar7 = *piVar7 + -1;
            UNLOCK();
            if (*piVar7 == 0) {
              pMVar25 = (Mat *)sums.data;
              if (sums.allocator == (Allocator *)0x0) {
                if (sums.data != (void *)0x0) {
                  free(sums.data);
                  auVar53 = extraout_XMM0_08;
                }
              }
              else {
                (*(sums.allocator)->_vptr_Allocator[3])();
                auVar53 = extraout_XMM0_07;
              }
            }
          }
          iVar9 = 0;
        }
        else if (((bVar17 | (byte)iVar9 >> 1) & 1) == 0) {
          pMVar25 = (Mat *)0x1;
          Mat::create(top_blob,1,uVar11,sVar2,opt->blob_allocator);
          if (0 < (int)uVar11) {
            pvVar29 = bottom_blob->data;
            iVar9 = bottom_blob->w;
            sVar3 = bottom_blob->elemsize;
            pvVar32 = top_blob->data;
            uVar33 = 0;
            do {
              auVar53 = ZEXT816(0);
              if (0 < (int)uVar12) {
                pMVar13 = (Mat *)0x0;
                do {
                  fVar35 = expf(*(float *)((long)pvVar29 + (long)pMVar13 * 4));
                  auVar53 = ZEXT416((uint)(auVar53._0_4_ + fVar35));
                  pMVar13 = (Mat *)((long)&pMVar13->data + 1);
                } while (pMVar16 != pMVar13);
              }
              *(int *)((long)pvVar32 + uVar33 * 4) = auVar53._0_4_;
              uVar33 = uVar33 + 1;
              pvVar29 = (void *)((long)pvVar29 + (long)iVar9 * sVar3);
            } while (uVar33 != uVar22);
            goto LAB_00202607;
          }
          iVar9 = 0;
          in_R10D = 0;
          auVar53 = extraout_XMM0_01;
        }
        else if (((bVar8 | (byte)iVar9) & 1) == 0) {
          pMVar25 = pMVar16;
          Mat::create(top_blob,uVar12,1,sVar2,opt->blob_allocator);
          uVar21 = top_blob->c * (int)top_blob->cstep;
          auVar53 = extraout_XMM0_03;
          if (0 < (int)uVar21) {
            pMVar25 = (Mat *)0x0;
            memset(top_blob->data,0,(ulong)uVar21 << 2);
            auVar53 = extraout_XMM0_04;
          }
          if (0 < (int)uVar11) {
            pvVar29 = bottom_blob->data;
            iVar9 = bottom_blob->w;
            sVar3 = bottom_blob->elemsize;
            pvVar32 = top_blob->data;
            uVar33 = 0;
            do {
              if (0 < (int)uVar12) {
                pMVar13 = (Mat *)0x0;
                do {
                  fVar35 = expf(*(float *)((long)pvVar29 + (long)pMVar13 * 4));
                  auVar53._0_4_ = fVar35 + *(float *)((long)pvVar32 + (long)pMVar13 * 4);
                  auVar53._4_12_ = extraout_var;
                  *(float *)((long)pvVar32 + (long)pMVar13 * 4) = auVar53._0_4_;
                  pMVar13 = (Mat *)((long)&pMVar13->data + 1);
                } while (pMVar16 != pMVar13);
              }
              uVar33 = uVar33 + 1;
              pvVar29 = (void *)((long)pvVar29 + (long)iVar9 * sVar3);
            } while (uVar33 != uVar22);
          }
LAB_00202607:
          in_R10D = 0;
          iVar9 = 0;
        }
        else {
          iVar9 = (int)CONCAT71((uint7)(uint3)((uint)iVar9 >> 8),1);
        }
        in_XMM0_Da = auVar53._0_4_;
        if ((char)iVar9 == '\0') goto joined_r0x0020804f;
      }
      else if (iVar10 == 1) {
        iVar10 = bottom_blob->w;
        pMVar25 = (Mat *)0x1;
        Mat::create(top_blob,1,sVar2,opt->blob_allocator);
        if ((long)iVar10 < 1) {
LAB_0020118e:
          in_XMM0_Da = 0.0;
        }
        else {
          pvVar29 = bottom_blob->data;
          in_XMM0_Da = 0.0;
          lVar31 = 0;
          do {
            fVar35 = expf(*(float *)((long)pvVar29 + lVar31 * 4));
            in_XMM0_Da = in_XMM0_Da + fVar35;
            lVar31 = lVar31 + 1;
          } while (iVar10 != lVar31);
        }
LAB_00201192:
        *(float *)top_blob->data = in_XMM0_Da;
        goto LAB_00208044;
      }
      if (iVar10 == 3) {
        uVar12 = bottom_blob->w;
        lVar31 = (long)(int)uVar12;
        uVar11 = bottom_blob->h;
        uVar22 = (ulong)uVar11;
        uVar21 = bottom_blob->c;
        pMVar16 = (Mat *)(ulong)uVar21;
        uVar24 = uVar11 * uVar12;
        auVar70._8_4_ = 0xffffffff;
        auVar70._0_8_ = 0xffffffffffffffff;
        auVar70._12_4_ = 0xffffffff;
        auVar281._0_8_ = SUB168(auVar70 ^ auVar134,0) << 0x3f;
        auVar281._8_8_ = SUB168(auVar70 ^ auVar134,8) << 0x3f;
        iVar10 = movmskpd(iVar9,auVar281);
        bVar14 = reduce_c ^ 1;
        if (iVar10 == 0 && bVar14 == 0) {
          Mat::create(top_blob,1,1,1,sVar2,opt->blob_allocator);
          sums.cstep = 0;
          sums.data = (void *)0x0;
          sums.refcount._0_4_ = 0;
          sums.refcount._4_4_ = 0;
          sums.elemsize._0_4_ = 0;
          sums.elemsize._4_4_ = 0;
          sums.elempack = 0;
          sums.allocator = (Allocator *)0x0;
          sums.dims = 0;
          sums.w = 0;
          sums.h = 0;
          sums.d = 0;
          sums.c = 0;
          pMVar25 = pMVar16;
          Mat::create(&sums,uVar21,sVar2,opt->workspace_allocator);
          pvVar29 = sums.data;
          in_R10D = -100;
          auVar281 = extraout_XMM0_11;
          if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
            if ((int)uVar21 < 1) {
              auVar281 = ZEXT816(0);
            }
            else {
              pvVar32 = bottom_blob->data;
              sVar2 = bottom_blob->elemsize;
              sVar3 = bottom_blob->cstep;
              pMVar13 = (Mat *)0x0;
              do {
                if ((int)uVar24 < 1) {
                  fVar35 = 0.0;
                }
                else {
                  fVar35 = 0.0;
                  uVar22 = 0;
                  do {
                    fVar36 = expf(*(float *)((long)pvVar32 + uVar22 * 4));
                    fVar35 = fVar35 + fVar36;
                    uVar22 = uVar22 + 1;
                  } while (uVar24 != uVar22);
                }
                *(float *)((long)pvVar29 + (long)pMVar13 * 4) = fVar35;
                pMVar13 = (Mat *)((long)&pMVar13->data + 1);
                pvVar32 = (void *)((long)pvVar32 + sVar2 * sVar3);
              } while (pMVar13 != pMVar16);
              auVar281 = ZEXT816(0);
              pMVar13 = (Mat *)0x0;
              do {
                auVar281._0_4_ = auVar281._0_4_ + *(float *)((long)pvVar29 + (long)pMVar13 * 4);
                pMVar13 = (Mat *)((long)&pMVar13->data + 1);
              } while (pMVar16 != pMVar13);
            }
            *(int *)top_blob->data = auVar281._0_4_;
            in_R10D = 0;
          }
          piVar7 = (int *)CONCAT44(sums.refcount._4_4_,sums.refcount._0_4_);
          if (piVar7 != (int *)0x0) {
            LOCK();
            *piVar7 = *piVar7 + -1;
            UNLOCK();
            if (*piVar7 == 0) {
              pMVar25 = (Mat *)sums.data;
              if (sums.allocator == (Allocator *)0x0) {
joined_r0x002072de:
                sums.data = pMVar25;
                if (pMVar25 != (Mat *)0x0) {
                  free(pMVar25);
                  auVar281 = extraout_XMM0_23;
                }
              }
              else {
                (*(sums.allocator)->_vptr_Allocator[3])();
                auVar281 = extraout_XMM0_14;
              }
            }
          }
          goto LAB_0020803e;
        }
        if (iVar10 == 0 && reduce_c == false) {
          pMVar25 = (Mat *)0x1;
          Mat::create(top_blob,1,1,uVar21,sVar2,opt->blob_allocator);
          auVar281 = extraout_XMM0_12;
          if (0 < (int)uVar21) {
            pvVar29 = bottom_blob->data;
            sVar2 = bottom_blob->elemsize;
            pvVar32 = top_blob->data;
            sVar3 = top_blob->elemsize;
            sVar4 = bottom_blob->cstep;
            sVar5 = top_blob->cstep;
            pMVar13 = (Mat *)0x0;
            do {
              if ((int)uVar24 < 1) {
                auVar281 = ZEXT816(0);
              }
              else {
                auVar281 = ZEXT816(0);
                uVar22 = 0;
                do {
                  fVar35 = expf(*(float *)((long)pvVar29 + uVar22 * 4));
                  auVar281 = ZEXT416((uint)(auVar281._0_4_ + fVar35));
                  uVar22 = uVar22 + 1;
                } while (uVar24 != uVar22);
              }
              *(int *)((long)pvVar32 + sVar3 * sVar5 * (long)pMVar13) = auVar281._0_4_;
              pMVar13 = (Mat *)((long)&pMVar13->data + 1);
              pvVar29 = (void *)((long)pvVar29 + sVar2 * sVar4);
            } while (pMVar13 != pMVar16);
          }
        }
        else {
          pMVar13 = (Mat *)(ulong)uVar12;
          bVar23 = (byte)iVar10 >> 1 | bVar17;
          if (reduce_c != false || (bVar23 & 1) != 0) {
            if ((bVar23 & 1) == 0 && bVar14 == 0) {
              Mat::create(top_blob,1,uVar11,1,sVar2,opt->blob_allocator);
              sums.cstep = 0;
              sums.data = (void *)0x0;
              sums.refcount._0_4_ = 0;
              sums.refcount._4_4_ = 0;
              sums.elemsize._0_4_ = 0;
              sums.elemsize._4_4_ = 0;
              sums.elempack = 0;
              sums.allocator = (Allocator *)0x0;
              sums.dims = 0;
              sums.w = 0;
              sums.h = 0;
              sums.d = 0;
              sums.c = 0;
              Mat::create(&sums,1,uVar11,uVar21,sVar2,opt->workspace_allocator);
              pMVar25 = (Mat *)0xffffff9c;
              if ((sums.data != (void *)0x0) && (sums.cstep * (long)sums.c != 0)) {
                uVar24 = (int)sums.cstep * sums.c;
                if (0 < (int)uVar24) {
                  memset(sums.data,0,(ulong)uVar24 << 2);
                }
                pvVar29 = sums.data;
                if (0 < (int)uVar21) {
                  local_c0 = bottom_blob->data;
                  sVar2 = bottom_blob->elemsize;
                  lVar19 = CONCAT44(sums.elemsize._4_4_,(undefined4)sums.elemsize) * sums.cstep;
                  sVar3 = bottom_blob->cstep;
                  local_c8 = (Mat *)0x0;
                  do {
                    if (0 < (int)uVar11) {
                      uVar33 = 0;
                      pvVar32 = local_c0;
                      do {
                        if ((int)uVar12 < 1) {
                          fVar35 = 0.0;
                        }
                        else {
                          fVar35 = 0.0;
                          pMVar25 = (Mat *)0x0;
                          do {
                            fVar36 = expf(*(float *)((long)pvVar32 + (long)pMVar25 * 4));
                            fVar35 = fVar35 + fVar36;
                            pMVar25 = (Mat *)((long)&pMVar25->data + 1);
                          } while (pMVar13 != pMVar25);
                        }
                        *(float *)((long)pvVar29 + uVar33 * 4 + lVar19 * (long)local_c8) = fVar35;
                        uVar33 = uVar33 + 1;
                        pvVar32 = (void *)((long)pvVar32 + lVar31 * 4);
                      } while (uVar33 != uVar22);
                    }
                    local_c8 = (Mat *)((long)&local_c8->data + 1);
                    local_c0 = (void *)((long)local_c0 + sVar2 * sVar3);
                  } while (local_c8 != pMVar16);
                }
                uVar12 = top_blob->c * (int)top_blob->cstep;
                if (0 < (int)uVar12) {
                  memset(top_blob->data,0,(ulong)uVar12 << 2);
                }
                if (0 < (int)uVar21) {
                  pvVar29 = top_blob->data;
                  pMVar25 = (Mat *)0x0;
                  pvVar32 = sums.data;
                  do {
                    if (0 < (int)uVar11) {
                      uVar33 = 0;
                      do {
                        *(float *)((long)pvVar29 + uVar33 * 4) =
                             *(float *)((long)pvVar32 + uVar33 * 4) +
                             *(float *)((long)pvVar29 + uVar33 * 4);
                        uVar33 = uVar33 + 1;
                      } while (uVar22 != uVar33);
                    }
                    pMVar25 = (Mat *)((long)&pMVar25->data + 1);
                    pvVar32 = (void *)((long)pvVar32 +
                                      CONCAT44(sums.elemsize._4_4_,(undefined4)sums.elemsize) *
                                      sums.cstep);
                  } while (pMVar25 != pMVar16);
                }
                pMVar25 = (Mat *)0x0;
              }
LAB_0020802f:
              in_R10D = (int)pMVar25;
              Mat::~Mat(&sums);
              auVar281 = extraout_XMM0_24;
              goto LAB_0020803e;
            }
            pMVar25 = (Mat *)(ulong)uVar6;
            bVar23 = (byte)iVar10 | bVar8;
            if ((bVar23 & 1) == 0 && bVar14 == 0) {
              Mat::create(top_blob,uVar12,1,1,sVar2,opt->blob_allocator);
              sums.cstep = 0;
              sums.data = (void *)0x0;
              sums.refcount._0_4_ = 0;
              sums.refcount._4_4_ = 0;
              sums.elemsize._0_4_ = 0;
              sums.elemsize._4_4_ = 0;
              sums.elempack = 0;
              sums.allocator = (Allocator *)0x0;
              sums.dims = 0;
              sums.w = 0;
              sums.h = 0;
              sums.d = 0;
              sums.c = 0;
              Mat::create(&sums,uVar12,1,uVar21,sVar2,opt->workspace_allocator);
              pMVar25 = (Mat *)0xffffff9c;
              if ((sums.data != (void *)0x0) && (sums.cstep * (long)sums.c != 0)) {
                uVar24 = (int)sums.cstep * sums.c;
                if (0 < (int)uVar24) {
                  memset(sums.data,0,(ulong)uVar24 << 2);
                }
                if (0 < (int)uVar21) {
                  local_c8 = (Mat *)bottom_blob->data;
                  sVar2 = bottom_blob->elemsize;
                  lVar19 = CONCAT44(sums.elemsize._4_4_,(undefined4)sums.elemsize) * sums.cstep;
                  sVar3 = bottom_blob->cstep;
                  local_e0 = (Mat *)0x0;
                  pvVar29 = sums.data;
                  do {
                    if (0 < (int)uVar11) {
                      uVar24 = 0;
                      pMVar25 = local_c8;
                      do {
                        if (0 < (int)uVar12) {
                          pMVar20 = (Mat *)0x0;
                          do {
                            fVar35 = expf(*(float *)((long)pMVar25 + (long)pMVar20 * 4));
                            *(float *)((long)pvVar29 + (long)pMVar20 * 4) =
                                 fVar35 + *(float *)((long)pvVar29 + (long)pMVar20 * 4);
                            pMVar20 = (Mat *)((long)&pMVar20->data + 1);
                          } while (pMVar13 != pMVar20);
                        }
                        uVar24 = uVar24 + 1;
                        pMVar25 = (Mat *)((long)pMVar25 + lVar31 * 4);
                      } while (uVar24 != uVar11);
                    }
                    local_e0 = (Mat *)((long)&local_e0->data + 1);
                    local_c8 = (Mat *)((long)local_c8 + sVar2 * sVar3);
                    pvVar29 = (void *)((long)pvVar29 + lVar19);
                  } while (local_e0 != pMVar16);
                }
                uVar11 = top_blob->c * (int)top_blob->cstep;
                if (0 < (int)uVar11) {
                  memset(top_blob->data,0,(ulong)uVar11 << 2);
                }
                if (0 < (int)uVar21) {
                  pvVar29 = top_blob->data;
                  pMVar25 = (Mat *)0x0;
                  pvVar32 = sums.data;
                  do {
                    if (0 < (int)uVar12) {
                      pMVar20 = (Mat *)0x0;
                      do {
                        *(float *)((long)pvVar29 + (long)pMVar20 * 4) =
                             *(float *)((long)pvVar32 + (long)pMVar20 * 4) +
                             *(float *)((long)pvVar29 + (long)pMVar20 * 4);
                        pMVar20 = (Mat *)((long)&pMVar20->data + 1);
                      } while (pMVar13 != pMVar20);
                    }
                    pMVar25 = (Mat *)((long)&pMVar25->data + 1);
                    pvVar32 = (void *)((long)pvVar32 +
                                      CONCAT44(sums.elemsize._4_4_,(undefined4)sums.elemsize) *
                                      sums.cstep);
                  } while (pMVar25 != pMVar16);
                }
                pMVar25 = (Mat *)0x0;
              }
              goto LAB_0020802f;
            }
            if (((bVar17 | bVar8) & 1) == 0 && bVar14 == 0) {
              Mat::create(top_blob,uVar12,uVar11,1,sVar2,opt->blob_allocator);
              uVar12 = top_blob->c * (int)top_blob->cstep;
              pMVar25 = pMVar13;
              auVar281 = extraout_XMM0_26;
              if (0 < (int)uVar12) {
                pMVar25 = (Mat *)0x0;
                memset(top_blob->data,0,(ulong)uVar12 << 2);
                auVar281 = extraout_XMM0_27;
              }
              if ((int)uVar21 < 1) goto LAB_0020643d;
              pvVar29 = bottom_blob->data;
              sVar2 = bottom_blob->elemsize;
              pvVar32 = top_blob->data;
              sVar3 = bottom_blob->cstep;
              pMVar13 = (Mat *)0x0;
              do {
                if (0 < (int)uVar24) {
                  uVar22 = 0;
                  do {
                    fVar35 = expf(*(float *)((long)pvVar29 + uVar22 * 4));
                    auVar281._0_4_ = fVar35 + *(float *)((long)pvVar32 + uVar22 * 4);
                    auVar281._4_12_ = extraout_var_03;
                    *(float *)((long)pvVar32 + uVar22 * 4) = auVar281._0_4_;
                    uVar22 = uVar22 + 1;
                  } while (uVar24 != uVar22);
                }
                pMVar13 = (Mat *)((long)&pMVar13->data + 1);
                pvVar29 = (void *)((long)pvVar29 + sVar2 * sVar3);
                bVar27 = false;
                in_R10D = 0;
              } while (pMVar13 != pMVar16);
            }
            else {
              bVar27 = true;
              if (reduce_c == false && (bVar23 & 1) == 0) {
                pMVar25 = (Mat *)(ulong)uVar12;
                Mat::create(top_blob,uVar12,1,uVar21,sVar2,opt->blob_allocator);
                uVar24 = top_blob->c * (int)top_blob->cstep;
                auVar281 = extraout_XMM0_09;
                if (0 < (int)uVar24) {
                  pMVar25 = (Mat *)0x0;
                  memset(top_blob->data,0,(ulong)uVar24 << 2);
                  auVar281 = extraout_XMM0_10;
                }
                if ((int)uVar21 < 1) goto LAB_0020643d;
                local_b8 = bottom_blob->data;
                sVar2 = bottom_blob->elemsize;
                pvVar29 = top_blob->data;
                sVar3 = top_blob->elemsize;
                sVar4 = top_blob->cstep;
                sVar5 = bottom_blob->cstep;
                local_e0 = (Mat *)0x0;
                do {
                  if (0 < (int)uVar11) {
                    uVar21 = 0;
                    pvVar32 = local_b8;
                    do {
                      if (0 < (int)uVar12) {
                        pMVar25 = (Mat *)0x0;
                        do {
                          fVar35 = expf(*(float *)((long)pvVar32 + (long)pMVar25 * 4));
                          auVar281._0_4_ = fVar35 + *(float *)((long)pvVar29 + (long)pMVar25 * 4);
                          auVar281._4_12_ = extraout_var_01;
                          *(float *)((long)pvVar29 + (long)pMVar25 * 4) = auVar281._0_4_;
                          pMVar25 = (Mat *)((long)&pMVar25->data + 1);
                        } while (pMVar13 != pMVar25);
                      }
                      uVar21 = uVar21 + 1;
                      pvVar32 = (void *)((long)pvVar32 + (long)(int)uVar12 * 4);
                    } while (uVar21 != uVar11);
                  }
                  pMVar25 = (Mat *)((long)&local_e0->data + 1);
                  local_b8 = (void *)((long)local_b8 + sVar2 * sVar5);
                  pvVar29 = (void *)((long)pvVar29 + sVar3 * sVar4);
                  bVar27 = false;
                  in_R10D = 0;
                  local_e0 = pMVar25;
                } while (pMVar25 != pMVar16);
              }
            }
            goto LAB_00208040;
          }
          pMVar25 = (Mat *)0x1;
          Mat::create(top_blob,1,uVar11,uVar21,sVar2,opt->blob_allocator);
          auVar281 = extraout_XMM0_13;
          if (0 < (int)uVar21) {
            local_c0 = bottom_blob->data;
            sVar2 = bottom_blob->elemsize;
            sVar3 = top_blob->elemsize;
            sVar4 = top_blob->cstep;
            sVar5 = bottom_blob->cstep;
            pvVar29 = top_blob->data;
            local_c8 = (Mat *)0x0;
            do {
              if (0 < (int)uVar11) {
                uVar33 = 0;
                pvVar32 = local_c0;
                do {
                  if ((int)uVar12 < 1) {
                    auVar281 = ZEXT816(0);
                  }
                  else {
                    auVar281 = ZEXT816(0);
                    pMVar20 = (Mat *)0x0;
                    do {
                      fVar35 = expf(*(float *)((long)pvVar32 + (long)pMVar20 * 4));
                      auVar281 = ZEXT416((uint)(auVar281._0_4_ + fVar35));
                      pMVar20 = (Mat *)((long)&pMVar20->data + 1);
                    } while (pMVar13 != pMVar20);
                  }
                  *(int *)((long)pvVar29 + uVar33 * 4 + sVar3 * sVar4 * (long)local_c8) =
                       auVar281._0_4_;
                  uVar33 = uVar33 + 1;
                  pvVar32 = (void *)((long)pvVar32 + lVar31 * 4);
                } while (uVar33 != uVar22);
              }
              local_c8 = (Mat *)((long)&local_c8->data + 1);
              local_c0 = (void *)((long)local_c0 + sVar2 * sVar5);
            } while (local_c8 != pMVar16);
          }
        }
LAB_0020643d:
        bVar27 = false;
        in_R10D = 0;
        goto LAB_00208040;
      }
    }
LAB_00208044:
    in_R10D = 0;
joined_r0x0020804f:
    if (in_R10D == 0) {
      reduction_post_process<ncnn::post_process_log<float>>(top_blob,in_XMM0_Da,(Option *)pMVar25);
      return 0;
    }
    return -100;
  }
  if (in_R11D != 0) {
    return -100;
  }
joined_r0x00207e45:
  if (1.1920929e-07 < ABS(fVar35 + -1.0)) {
LAB_00207e52:
    reduction_post_process<ncnn::post_process_identity<float>>(top_blob,fVar35,(Option *)pMVar25);
  }
  return 0;
}

Assistant:

int Reduction::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int dims = bottom_blob.dims;
    int axes_flag[3] = {0};
    bool reduce_w = false;
    bool reduce_h = false;
    bool reduce_c = false;

    if (reduce_all)
    {
        reduce_w = true;
        reduce_h = true;
        reduce_c = true;
    }
    else
    {
        const int* axes_ptr = axes;
        int reduced_axes_num = axes.w;

        for (int i = 0; i < reduced_axes_num; i++)
        {
            int axis = axes_ptr[i];
            // handle negative axis
            if (axis < 0)
                axis += dims + 1;
            axes_flag[axis - 1] = 1;
        }

        if (dims == 1)
        {
            reduce_w = true;
        }
        else if (dims == 2)
        {
            if (axes_flag[0] == 1) reduce_h = true;
            if (axes_flag[1] == 1) reduce_w = true;
        }
        else if (dims == 3)
        {
            if (axes_flag[0] == 1) reduce_c = true;
            if (axes_flag[1] == 1) reduce_h = true;
            if (axes_flag[2] == 1) reduce_w = true;
        }
    }

    if (operation == ReductionOp_SUM)
        return reduction<reduction_op_add<float>, reduction_op_add<float>, post_process_identity<float> >(bottom_blob, top_blob, 0.f, reduce_w, reduce_h, reduce_c, false, coeff, keepdims, opt);

    if (operation == ReductionOp_ASUM)
        return reduction<reduction_op_asum<float>, reduction_op_add<float>, post_process_identity<float> >(bottom_blob, top_blob, 0.f, reduce_w, reduce_h, reduce_c, false, coeff, keepdims, opt);

    if (operation == ReductionOp_SUMSQ)
        return reduction<reduction_op_sumsq<float>, reduction_op_add<float>, post_process_identity<float> >(bottom_blob, top_blob, 0.f, reduce_w, reduce_h, reduce_c, false, coeff, keepdims, opt);

    if (operation == ReductionOp_MEAN)
    {
        int scale = 1;
        int dims = bottom_blob.dims;
        if (dims == 1)
        {
            scale = bottom_blob.w;
        }
        else if (dims == 2)
        {
            if (reduce_w) scale *= bottom_blob.w;
            if (reduce_h) scale *= bottom_blob.h;
        }
        else if (dims == 3)
        {
            if (reduce_w) scale *= bottom_blob.w;
            if (reduce_h) scale *= bottom_blob.h;
            if (reduce_c) scale *= bottom_blob.c;
        }

        float coeff_mean = coeff / scale;
        return reduction<reduction_op_add<float>, reduction_op_add<float>, post_process_identity<float> >(bottom_blob, top_blob, 0.f, reduce_w, reduce_h, reduce_c, true, coeff_mean, keepdims, opt);
    }

    if (operation == ReductionOp_MAX)
        return reduction<reduction_op_max<float>, reduction_op_max<float>, post_process_identity<float> >(bottom_blob, top_blob, -FLT_MAX, reduce_w, reduce_h, reduce_c, false, coeff, keepdims, opt);

    if (operation == ReductionOp_MIN)
        return reduction<reduction_op_min<float>, reduction_op_min<float>, post_process_identity<float> >(bottom_blob, top_blob, FLT_MAX, reduce_w, reduce_h, reduce_c, false, coeff, keepdims, opt);

    if (operation == ReductionOp_PROD)
        return reduction<reduction_op_mul<float>, reduction_op_mul<float>, post_process_identity<float> >(bottom_blob, top_blob, 1.f, reduce_w, reduce_h, reduce_c, false, coeff, keepdims, opt);

    if (operation == ReductionOp_L1)
        return reduction<reduction_op_asum<float>, reduction_op_add<float>, post_process_identity<float> >(bottom_blob, top_blob, 0.f, reduce_w, reduce_h, reduce_c, false, 1.f, keepdims, opt);

    if (operation == ReductionOp_L2)
        return reduction<reduction_op_sumsq<float>, reduction_op_add<float>, post_process_sqrt<float> >(bottom_blob, top_blob, 0.f, reduce_w, reduce_h, reduce_c, true, 1.f, keepdims, opt);

    if (operation == ReductionOp_LogSum)
        return reduction<reduction_op_add<float>, reduction_op_add<float>, post_process_log<float> >(bottom_blob, top_blob, 0.f, reduce_w, reduce_h, reduce_c, true, 1.f, keepdims, opt);

    if (operation == ReductionOp_LogSumExp)
        return reduction<reduction_op_sumsexp<float>, reduction_op_add<float>, post_process_log<float> >(bottom_blob, top_blob, 0.f, reduce_w, reduce_h, reduce_c, true, 1.f, keepdims, opt);

    return 0;
}